

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O0

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *weight_hr,Mat *hidden_state,Mat *cell_state,Option *opt)

{
  void *pvVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  void *pvVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  long lVar118;
  float *pfVar119;
  long *in_RCX;
  int in_EDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  long *in_R9;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  long *in_stack_00000008;
  int i_2;
  float H_1;
  float *tmp_hidden_ptr_1;
  float *hr;
  int q_4;
  int remain_num_output_start;
  float H;
  float cell2;
  float G;
  float O;
  float F;
  float I;
  float *gates_data_3;
  int q_3;
  __m128 _H;
  __m128 _cell2;
  __m128 _G;
  __m128 _O;
  __m128 _F;
  __m128 _I;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _IFOG_4x4_3;
  __m128 _IFOG_4x4_2;
  __m128 _IFOG_4x4_1;
  __m128 _IFOG_4x4_0;
  float *gates_data_2;
  int q_2;
  int qq_1;
  float *tmp_hidden_ptr;
  float *hidden_ptr;
  float *cell_ptr;
  float *output_data;
  float *gates_data_1;
  __m128 _weight_hc_IFOG_1;
  __m128 _h_cont_1;
  __m128 _weight_hc_IFOG3_1;
  __m128 _weight_hc_IFOG2_1;
  __m128 _weight_hc_IFOG1_1;
  __m128 _weight_hc_IFOG0_1;
  __m128 _h_cont3_1;
  __m128 _h_cont2_1;
  __m128 _h_cont1_1;
  __m128 _h_cont0_1;
  float *hidden_ptr_2;
  __m128 _weight_xc_IFOG_1;
  __m128 _xi_1;
  __m128 _weight_xc_IFOG3_1;
  __m128 _weight_xc_IFOG2_1;
  __m128 _weight_xc_IFOG1_1;
  __m128 _weight_xc_IFOG0_1;
  __m128 _xi3_1;
  __m128 _xi2_1;
  __m128 _xi1_1;
  __m128 _xi0_1;
  int i_1;
  float *x_1;
  __m128 _sum3_1;
  __m128 _sum2_1;
  __m128 _sum1_1;
  __m128 _IFOG_1;
  float *weight_hc_IFOG_1;
  float *weight_xc_IFOG_1;
  float *bias_c_IFOG_1;
  int q_1;
  float *gates_data;
  __m256 _weight_hc_IFOG;
  __m256 _h_cont;
  __m256 _weight_hc_IFOG3;
  __m256 _weight_hc_IFOG2;
  __m256 _weight_hc_IFOG1;
  __m256 _weight_hc_IFOG0;
  __m256 _h_cont3;
  __m256 _h_cont2;
  __m256 _h_cont1;
  __m256 _h_cont0;
  float *hidden_ptr_1;
  __m256 _weight_xc_IFOG;
  __m256 _xi;
  __m256 _weight_xc_IFOG3;
  __m256 _weight_xc_IFOG2;
  __m256 _weight_xc_IFOG1;
  __m256 _weight_xc_IFOG0;
  __m256 _xi3;
  __m256 _xi2;
  __m256 _xi1;
  __m256 _xi0;
  int i;
  float *x;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _IFOG;
  float *weight_hc_IFOG;
  float *weight_xc_IFOG;
  float *bias_c_IFOG;
  int q;
  int qq;
  int remain_hidden_size_start;
  int nn_hidden_size;
  int ti;
  int t;
  Mat tmp_hidden_state;
  Mat gates;
  int hidden_size;
  int num_output;
  int T;
  int size;
  __m128 one_4;
  __m128 one_2;
  __m128 one;
  __m128 two_1;
  __m128 one_9;
  __m128 one_10;
  __m128 two;
  __m128 one_6;
  __m128 one_7;
  v4sf pow2n_3;
  v4sf y_3;
  v4sf mask_3;
  v4sf one_8;
  v4si emm0_3;
  v4sf fx_3;
  v4sf tmp_3;
  v4sf pow2n_4;
  v4sf y_4;
  v4sf mask_4;
  v4sf one_11;
  v4si emm0_4;
  v4sf fx_4;
  v4sf tmp_4;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one_1;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_3;
  v4si emm0_1;
  v4sf fx_1;
  v4sf tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_5;
  v4si emm0_2;
  v4sf fx_2;
  v4sf tmp_2;
  Allocator *in_stack_ffffffffffffbab0;
  void **ppvVar124;
  size_t in_stack_ffffffffffffbab8;
  undefined8 in_stack_ffffffffffffbac0;
  undefined4 in_stack_ffffffffffffbac8;
  undefined4 in_stack_ffffffffffffbacc;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 local_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 local_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 local_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 local_4270;
  undefined8 uStack_4268;
  int local_3aa4;
  bool local_3a59;
  int local_3a58;
  float local_3a54;
  int local_3a40;
  int local_3a14;
  int local_391c;
  undefined8 local_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 local_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 local_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 local_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 local_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  float *local_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 local_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 local_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 local_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 local_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 local_37b0;
  undefined8 uStack_37a8;
  int local_379c;
  float *local_3798;
  undefined8 local_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 local_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 *local_3748;
  undefined8 *local_3740;
  undefined8 *local_3738;
  int local_372c;
  undefined1 (*local_3728) [32];
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  float *local_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  int local_346c;
  float *local_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 *local_33c8;
  undefined8 *local_33c0;
  undefined8 *local_33b8;
  int local_33b0;
  int local_33ac;
  int local_33a8;
  int local_33a4;
  int local_33a0;
  int local_339c;
  void *local_3398;
  int *local_3390;
  undefined8 local_3388;
  undefined4 local_3380;
  long *local_3378;
  undefined4 local_3370;
  undefined4 local_336c;
  undefined4 local_3368;
  undefined4 local_3364;
  int local_3360;
  long local_3358;
  undefined4 local_3350;
  void *local_3340;
  int *local_3338;
  long local_3330;
  undefined4 local_3328;
  long *local_3320;
  undefined4 local_3318;
  int local_3314;
  undefined4 local_3310;
  undefined4 local_330c;
  int local_3308;
  long local_3300;
  int local_32f8;
  int local_32f4;
  int local_32f0;
  int local_32ec;
  long *local_32e8;
  long *local_32e0;
  long *local_32d8;
  int local_32cc;
  long *local_32c8;
  long *local_32c0;
  int local_32b4;
  void **local_32b0;
  void **local_32a8;
  void **local_3298;
  int local_3284;
  int local_3274;
  int local_3264;
  int local_3254;
  int local_3244;
  int local_3234;
  int local_3224;
  int local_3214;
  void **local_3210;
  int local_3204;
  void **local_3200;
  int local_31f4;
  long *local_31f0;
  int local_31e4;
  void **local_31e0;
  int local_31d4;
  void **local_31d0;
  int local_31b8;
  undefined4 local_31b4;
  void **local_31b0;
  int local_3198;
  undefined4 local_3194;
  void **local_3190;
  void **local_3188;
  void **local_3180;
  size_t local_3178;
  undefined8 local_3170;
  int local_3168;
  undefined4 local_3164;
  void **local_3160;
  void *local_3158;
  void *local_3148;
  void **local_3138;
  void **local_3130;
  undefined8 *local_3118;
  undefined8 *local_3110;
  undefined8 *local_3108;
  undefined8 *local_3100;
  undefined8 *local_30f8;
  undefined8 *local_30f0;
  undefined8 *local_30e8;
  undefined8 *local_30e0;
  undefined8 *local_30d8;
  undefined8 *local_30d0;
  undefined8 *local_30c8;
  undefined1 local_30c0 [32];
  undefined1 local_30a0 [32];
  undefined1 local_3080 [32];
  float local_3060;
  float fStack_305c;
  float fStack_3058;
  float fStack_3054;
  float fStack_3050;
  float fStack_304c;
  float fStack_3048;
  float fStack_3044;
  float local_302c;
  float *local_3028;
  float local_3020;
  float fStack_301c;
  float fStack_3018;
  float fStack_3014;
  float fStack_3010;
  float fStack_300c;
  float fStack_3008;
  float fStack_3004;
  float local_2fec;
  float *local_2fe8;
  float local_2fe0;
  float fStack_2fdc;
  float fStack_2fd8;
  float fStack_2fd4;
  float fStack_2fd0;
  float fStack_2fcc;
  float fStack_2fc8;
  float fStack_2fc4;
  float local_2fac;
  float *local_2fa8;
  float local_2fa0;
  float fStack_2f9c;
  float fStack_2f98;
  float fStack_2f94;
  float fStack_2f90;
  float fStack_2f8c;
  float fStack_2f88;
  float fStack_2f84;
  float local_2f6c;
  float *local_2f68;
  float local_2f60;
  float fStack_2f5c;
  float fStack_2f58;
  float fStack_2f54;
  float fStack_2f50;
  float fStack_2f4c;
  float fStack_2f48;
  float fStack_2f44;
  float local_2f2c;
  float *local_2f28;
  float local_2f20;
  float fStack_2f1c;
  float fStack_2f18;
  float fStack_2f14;
  float fStack_2f10;
  float fStack_2f0c;
  float fStack_2f08;
  float fStack_2f04;
  float local_2eec;
  float *local_2ee8;
  float local_2ee0;
  float fStack_2edc;
  float fStack_2ed8;
  float fStack_2ed4;
  float fStack_2ed0;
  float fStack_2ecc;
  float fStack_2ec8;
  float fStack_2ec4;
  float local_2eac;
  float *local_2ea8;
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float fStack_2e88;
  float fStack_2e84;
  float local_2e6c;
  float *local_2e68;
  float local_2e60;
  float fStack_2e5c;
  float fStack_2e58;
  float fStack_2e54;
  float fStack_2e50;
  float fStack_2e4c;
  float fStack_2e48;
  float fStack_2e44;
  float local_2e2c;
  float *local_2e28;
  float local_2e20;
  float fStack_2e1c;
  float fStack_2e18;
  float fStack_2e14;
  float fStack_2e10;
  float fStack_2e0c;
  float fStack_2e08;
  float fStack_2e04;
  float local_2df4;
  float *local_2df0;
  undefined8 *local_2de8;
  undefined8 *local_2de0;
  undefined8 *local_2dd8;
  undefined8 *local_2dd0;
  undefined8 *local_2dc8;
  undefined8 *local_2dc0;
  undefined8 *local_2db8;
  undefined8 *local_2db0;
  undefined8 *local_2da8;
  undefined8 *local_2da0;
  undefined8 *local_2d98;
  undefined8 *local_2d90;
  undefined8 *local_2d88;
  undefined8 *local_2d80;
  undefined8 *local_2d78;
  undefined8 *local_2d70;
  undefined8 *local_2d68;
  undefined8 *local_2d60;
  undefined8 *local_2d58;
  undefined8 *local_2d50;
  undefined8 *local_2d48;
  undefined8 *local_2d40;
  undefined8 *local_2d38;
  undefined8 *local_2d30;
  undefined8 *local_2d28;
  undefined8 *local_2d20;
  undefined8 *local_2d18;
  undefined8 *local_2d10;
  undefined8 *local_2d08;
  undefined8 *local_2d00;
  void **local_2cf8;
  Mat *local_2cf0;
  Mat *local_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  float local_2cc0;
  float fStack_2cbc;
  float fStack_2cb8;
  float fStack_2cb4;
  float fStack_2cb0;
  float fStack_2cac;
  float fStack_2ca8;
  float fStack_2ca4;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  float local_2c80;
  float fStack_2c7c;
  float fStack_2c78;
  float fStack_2c74;
  float fStack_2c70;
  float fStack_2c6c;
  float fStack_2c68;
  float fStack_2c64;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  float local_2c40;
  float fStack_2c3c;
  float fStack_2c38;
  float fStack_2c34;
  float fStack_2c30;
  float fStack_2c2c;
  float fStack_2c28;
  float fStack_2c24;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  float local_2bc0;
  float fStack_2bbc;
  float fStack_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  float fStack_2ba4;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  float local_2b80;
  float fStack_2b7c;
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float fStack_2b64;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  float local_2b40;
  float fStack_2b3c;
  float fStack_2b38;
  float fStack_2b34;
  float fStack_2b30;
  float fStack_2b2c;
  float fStack_2b28;
  float fStack_2b24;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  float local_2b00;
  float fStack_2afc;
  float fStack_2af8;
  float fStack_2af4;
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  float fStack_2ae4;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  float local_2ac0;
  float fStack_2abc;
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  float fStack_2aa4;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  float local_2a80;
  float fStack_2a7c;
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  float fStack_2a64;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined1 local_2a40 [32];
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined1 (*local_2968) [32];
  undefined8 *local_2960;
  undefined1 (*local_2958) [16];
  undefined1 (*local_2950) [16];
  undefined1 (*local_2948) [16];
  undefined1 (*local_2940) [16];
  undefined8 *local_2938;
  undefined8 *local_2930;
  undefined8 *local_2928;
  undefined8 *local_2920;
  undefined8 *local_2918;
  undefined8 *local_2910;
  undefined8 *local_2908;
  undefined8 *local_2900;
  undefined8 *local_28f8;
  undefined8 *local_28f0;
  undefined8 *local_28e8;
  undefined1 local_28e0 [16];
  undefined1 local_28d0 [16];
  undefined1 local_28c0 [16];
  float local_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  float local_289c;
  float *local_2898;
  float local_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  float local_287c;
  float *local_2878;
  float local_2870;
  float fStack_286c;
  float fStack_2868;
  float fStack_2864;
  float local_285c;
  float *local_2858;
  float local_2850;
  float fStack_284c;
  float fStack_2848;
  float fStack_2844;
  float local_283c;
  float *local_2838;
  float local_2830;
  float fStack_282c;
  float fStack_2828;
  float fStack_2824;
  float local_281c;
  float *local_2818;
  float local_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  float local_27fc;
  float *local_27f8;
  float local_27f0;
  float fStack_27ec;
  float fStack_27e8;
  float fStack_27e4;
  float local_27dc;
  float *local_27d8;
  float local_27d0;
  float fStack_27cc;
  float fStack_27c8;
  float fStack_27c4;
  float local_27bc;
  float *local_27b8;
  float local_27b0;
  float fStack_27ac;
  float fStack_27a8;
  float fStack_27a4;
  float local_279c;
  float *local_2798;
  float local_2790;
  float fStack_278c;
  float fStack_2788;
  float fStack_2784;
  float local_277c;
  float *local_2778;
  undefined8 *local_2770;
  undefined8 *local_2768;
  undefined8 *local_2760;
  undefined8 *local_2758;
  undefined8 *local_2750;
  undefined8 *local_2748;
  undefined8 *local_2740;
  undefined8 *local_2738;
  undefined8 *local_2730;
  undefined8 *local_2728;
  undefined8 *local_2720;
  undefined8 *local_2718;
  undefined8 *local_2710;
  undefined8 *local_2708;
  undefined8 *local_2700;
  undefined8 *local_26f8;
  undefined8 *local_26f0;
  undefined8 *local_26e8;
  undefined8 *local_26e0;
  undefined8 *local_26d8;
  undefined8 *local_26d0;
  undefined8 *local_26c8;
  undefined8 *local_26c0;
  undefined8 *local_26b8;
  undefined8 *local_26b0;
  undefined8 *local_26a8;
  undefined8 *local_26a0;
  undefined8 *local_2698;
  undefined8 *local_2690;
  undefined8 *local_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  float local_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  float local_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined8 local_2640;
  undefined8 uStack_2638;
  float local_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  undefined8 local_2620;
  undefined8 uStack_2618;
  float local_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  float local_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  float local_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  float local_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  float local_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  undefined8 local_2580;
  undefined8 uStack_2578;
  float local_2570;
  float fStack_256c;
  float fStack_2568;
  float fStack_2564;
  undefined8 local_2560;
  undefined8 uStack_2558;
  float local_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 local_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined1 local_2510 [16];
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 local_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined1 (*local_24a8) [16];
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined1 (*local_2488) [16];
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 *local_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 *local_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined1 (*local_2430) [16];
  void **local_2428;
  Mat *local_2420;
  Mat *local_2418;
  undefined8 local_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 local_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 local_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 local_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 local_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 local_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 local_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 local_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined1 local_22f0 [16];
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 local_22b0;
  undefined8 uStack_22a8;
  undefined1 local_22a0 [16];
  undefined8 local_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 local_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined1 local_2250 [16];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 local_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 local_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 local_21f0;
  undefined8 uStack_21e8;
  float local_21e0;
  float fStack_21dc;
  float fStack_21d8;
  float fStack_21d4;
  undefined1 local_21d0 [16];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 local_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 local_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 local_2170;
  undefined8 uStack_2168;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  undefined1 local_2150 [16];
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 local_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined1 local_2110 [8];
  float fStack_2108;
  float fStack_2104;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 local_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined1 local_20d0 [8];
  float fStack_20c8;
  float fStack_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 local_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 local_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 local_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 local_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 local_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 local_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 local_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 local_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined1 local_1f50 [8];
  float fStack_1f48;
  float fStack_1f44;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 local_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 local_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  float local_1ee0;
  float fStack_1edc;
  float fStack_1ed8;
  float fStack_1ed4;
  float fStack_1ed0;
  float fStack_1ecc;
  float fStack_1ec8;
  float fStack_1ec4;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  float local_1ea0;
  float fStack_1e9c;
  float fStack_1e98;
  float fStack_1e94;
  float fStack_1e90;
  float fStack_1e8c;
  float fStack_1e88;
  float fStack_1e84;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  float local_1e20;
  float fStack_1e1c;
  float fStack_1e18;
  float fStack_1e14;
  float fStack_1e10;
  float fStack_1e0c;
  float fStack_1e08;
  float fStack_1e04;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  float fStack_1dd0;
  float fStack_1dcc;
  float fStack_1dc8;
  float fStack_1dc4;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  float local_1da0;
  float fStack_1d9c;
  float fStack_1d98;
  float fStack_1d94;
  float fStack_1d90;
  float fStack_1d8c;
  float fStack_1d88;
  float fStack_1d84;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  float local_1d60;
  float fStack_1d5c;
  float fStack_1d58;
  float fStack_1d54;
  float fStack_1d50;
  float fStack_1d4c;
  float fStack_1d48;
  float fStack_1d44;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  float local_1d20;
  float fStack_1d1c;
  float fStack_1d18;
  float fStack_1d14;
  float fStack_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  float local_1ce0;
  float fStack_1cdc;
  float fStack_1cd8;
  float fStack_1cd4;
  float fStack_1cd0;
  float fStack_1ccc;
  float fStack_1cc8;
  float fStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  undefined4 local_1c70;
  undefined4 uStack_1c6c;
  undefined4 uStack_1c68;
  undefined4 uStack_1c64;
  undefined4 local_1c54;
  undefined4 local_1c50;
  undefined4 uStack_1c4c;
  undefined4 uStack_1c48;
  undefined4 uStack_1c44;
  undefined4 local_1c34;
  undefined4 local_1c30;
  undefined4 uStack_1c2c;
  undefined4 uStack_1c28;
  undefined4 uStack_1c24;
  undefined4 local_1c14;
  undefined4 local_1c10;
  undefined4 uStack_1c0c;
  undefined4 uStack_1c08;
  undefined4 uStack_1c04;
  undefined4 local_1bf4;
  undefined4 local_1bf0;
  undefined4 uStack_1bec;
  undefined4 uStack_1be8;
  undefined4 uStack_1be4;
  undefined4 local_1bd4;
  undefined4 local_1bd0;
  undefined4 uStack_1bcc;
  undefined4 uStack_1bc8;
  undefined4 uStack_1bc4;
  undefined4 local_1bb4;
  undefined4 local_1bb0;
  undefined4 uStack_1bac;
  undefined4 uStack_1ba8;
  undefined4 uStack_1ba4;
  undefined4 local_1b94;
  undefined4 local_1b90;
  undefined4 uStack_1b8c;
  undefined4 uStack_1b88;
  undefined4 uStack_1b84;
  undefined4 local_1b74;
  undefined4 local_1b70;
  undefined4 uStack_1b6c;
  undefined4 uStack_1b68;
  undefined4 uStack_1b64;
  undefined4 local_1b54;
  float local_1b50;
  float fStack_1b4c;
  float fStack_1b48;
  float fStack_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  float local_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  float local_1b10;
  float fStack_1b0c;
  float fStack_1b08;
  float fStack_1b04;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  float local_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  float local_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 local_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined1 local_1a90 [16];
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined1 local_1a70 [16];
  undefined1 local_1a60 [8];
  undefined8 uStack_1a58;
  undefined8 local_1a50;
  undefined8 uStack_1a48;
  undefined1 local_1a40 [16];
  undefined1 local_1a30 [16];
  undefined1 *local_1a20;
  undefined8 *local_1a18;
  undefined8 *local_1a10;
  float *local_1a08;
  undefined1 *local_1a00;
  undefined8 *local_19f8;
  float *local_19f0;
  undefined1 *local_19e8;
  undefined8 *local_19e0;
  float *local_19d8;
  undefined1 *local_19d0;
  undefined8 *local_19c8;
  float *local_19c0;
  undefined1 *local_19b8;
  undefined8 *local_19b0;
  float *local_19a8;
  undefined1 *local_19a0;
  undefined8 *local_1998;
  float local_1990 [2];
  float afStack_1988 [2];
  float local_1980;
  float fStack_197c;
  float fStack_1978;
  float fStack_1974;
  float local_1970 [2];
  float afStack_1968 [2];
  float local_1960;
  float fStack_195c;
  float fStack_1958;
  float fStack_1954;
  float local_1950 [2];
  float afStack_1948 [2];
  float local_1940;
  float fStack_193c;
  float fStack_1938;
  float fStack_1934;
  float local_1930 [2];
  float afStack_1928 [2];
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float local_1910 [2];
  float afStack_1908 [2];
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  undefined8 local_18f0;
  undefined8 uStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  undefined8 local_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 local_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 local_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 local_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 local_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 local_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 local_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 local_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined1 local_1750 [16];
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined1 local_1730 [16];
  undefined1 local_1720 [8];
  undefined8 uStack_1718;
  undefined8 local_1710;
  undefined8 uStack_1708;
  undefined1 local_1700 [16];
  undefined1 local_16f0 [16];
  undefined1 *local_16e0;
  undefined8 *local_16d8;
  undefined8 *local_16d0;
  float *local_16c8;
  undefined1 *local_16c0;
  undefined8 *local_16b8;
  float *local_16b0;
  undefined1 *local_16a8;
  undefined8 *local_16a0;
  float *local_1698;
  undefined1 *local_1690;
  undefined8 *local_1688;
  float *local_1680;
  undefined1 *local_1678;
  undefined8 *local_1670;
  float *local_1668;
  undefined1 *local_1660;
  undefined8 *local_1658;
  float local_1650 [2];
  float afStack_1648 [2];
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float local_1630 [2];
  float afStack_1628 [2];
  float local_1620;
  float fStack_161c;
  float fStack_1618;
  float fStack_1614;
  float local_1610 [2];
  float afStack_1608 [2];
  float local_1600;
  float fStack_15fc;
  float fStack_15f8;
  float fStack_15f4;
  float local_15f0 [2];
  float afStack_15e8 [2];
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float local_15d0 [2];
  float afStack_15c8 [2];
  float local_15c0;
  float fStack_15bc;
  float fStack_15b8;
  float fStack_15b4;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 local_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 local_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined1 local_1410 [16];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [8];
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined1 *local_13a0;
  undefined8 *local_1398;
  undefined8 *local_1390;
  float *local_1388;
  undefined1 *local_1380;
  undefined8 *local_1378;
  float *local_1370;
  undefined1 *local_1368;
  undefined8 *local_1360;
  float *local_1358;
  undefined1 *local_1350;
  undefined8 *local_1348;
  float *local_1340;
  undefined1 *local_1338;
  undefined8 *local_1330;
  float *local_1328;
  undefined1 *local_1320;
  undefined8 *local_1318;
  float local_1310 [2];
  float afStack_1308 [2];
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float local_12f0 [2];
  float afStack_12e8 [2];
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float local_12d0 [2];
  float afStack_12c8 [2];
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float local_12b0 [2];
  float afStack_12a8 [2];
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float local_1290 [2];
  float afStack_1288 [2];
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  undefined8 local_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 local_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 local_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 local_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 local_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 local_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 local_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 local_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined1 local_10d0 [16];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined1 local_10b0 [16];
  undefined1 local_10a0 [8];
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined8 uStack_1088;
  undefined1 local_1080 [16];
  undefined1 local_1070 [16];
  undefined1 *local_1060;
  undefined8 *local_1058;
  undefined8 *local_1050;
  float *local_1048;
  undefined1 *local_1040;
  undefined8 *local_1038;
  float *local_1030;
  undefined1 *local_1028;
  undefined8 *local_1020;
  float *local_1018;
  undefined1 *local_1010;
  undefined8 *local_1008;
  float *local_1000;
  undefined1 *local_ff8;
  undefined8 *local_ff0;
  float *local_fe8;
  undefined1 *local_fe0;
  undefined8 *local_fd8;
  float local_fd0 [2];
  float afStack_fc8 [2];
  float local_fc0;
  float fStack_fbc;
  float fStack_fb8;
  float fStack_fb4;
  float local_fb0 [2];
  float afStack_fa8 [2];
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float local_f90 [2];
  float afStack_f88 [2];
  float local_f80;
  float fStack_f7c;
  float fStack_f78;
  float fStack_f74;
  float local_f70 [2];
  float afStack_f68 [2];
  float local_f60;
  float fStack_f5c;
  float fStack_f58;
  float fStack_f54;
  float local_f50 [2];
  float afStack_f48 [2];
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  undefined8 local_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  undefined8 local_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 local_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 local_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 local_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 local_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined1 local_d90 [16];
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined1 local_d70 [16];
  undefined1 local_d60 [8];
  undefined8 uStack_d58;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined1 local_d40 [16];
  undefined1 local_d30 [16];
  undefined1 *local_d20;
  undefined8 *local_d18;
  undefined8 *local_d10;
  float *local_d08;
  undefined1 *local_d00;
  undefined8 *local_cf8;
  float *local_cf0;
  undefined1 *local_ce8;
  undefined8 *local_ce0;
  float *local_cd8;
  undefined1 *local_cd0;
  undefined8 *local_cc8;
  float *local_cc0;
  undefined1 *local_cb8;
  undefined8 *local_cb0;
  float *local_ca8;
  undefined1 *local_ca0;
  undefined8 *local_c98;
  float local_c90 [2];
  float afStack_c88 [2];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float local_c70 [2];
  float afStack_c68 [2];
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float local_c50 [2];
  float afStack_c48 [2];
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float local_c30 [2];
  float afStack_c28 [2];
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float local_c10 [2];
  float afStack_c08 [2];
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  ulong uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  ulong uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  ulong uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  ulong uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  ulong uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 *local_578;
  float *local_570;
  undefined1 *local_568;
  float local_560 [2];
  float afStack_558 [2];
  undefined8 local_550;
  undefined8 uStack_548;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 *local_518;
  float *local_510;
  undefined1 *local_508;
  float local_500 [2];
  float afStack_4f8 [2];
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 *local_4b8;
  float *local_4b0;
  undefined1 *local_4a8;
  float local_4a0 [2];
  float afStack_498 [2];
  undefined8 local_490;
  undefined8 uStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined1 *local_458;
  float *local_450;
  undefined1 *local_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 *local_3f8;
  float *local_3f0;
  undefined1 *local_3e8;
  float local_3e0 [2];
  float afStack_3d8 [2];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined1 *local_398;
  float *local_390;
  undefined1 *local_388;
  float local_380 [2];
  float afStack_378 [2];
  undefined8 local_370;
  undefined8 uStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined1 *local_338;
  float *local_330;
  undefined1 *local_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2d8;
  float *local_2d0;
  undefined1 *local_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined1 *local_278;
  float *local_270;
  undefined1 *local_268;
  float local_260 [2];
  float afStack_258 [2];
  undefined8 local_250;
  undefined8 uStack_248;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 *local_218;
  float *local_210;
  undefined1 *local_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined4 local_f4;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined4 local_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_32ec = *(int *)((long)in_RDI + 0x2c);
  local_32f0 = (int)in_RDI[6];
  local_32f4 = *(int *)((long)in_RSI + 0x2c);
  local_32f8 = hidden_state->w;
  local_3178 = cell_state->elemsize;
  local_3160 = &local_3340;
  local_3164 = 4;
  local_3170 = 4;
  local_3340 = (void *)0x0;
  local_3338 = (int *)0x0;
  local_3330 = 0;
  local_3328 = 0;
  local_3320 = (long *)0x0;
  local_3318 = 0;
  local_3314 = 0;
  local_3310 = 0;
  local_330c = 0;
  local_3308 = 0;
  local_3300 = 0;
  local_32e8 = in_R9;
  local_32e0 = in_R8;
  local_32d8 = in_RCX;
  local_32cc = in_EDX;
  local_32c8 = in_RSI;
  local_32c0 = in_RDI;
  local_3168 = local_32f8;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffbacc,in_stack_ffffffffffffbac8),
              (int)((ulong)in_stack_ffffffffffffbac0 >> 0x20),(int)in_stack_ffffffffffffbac0,
              in_stack_ffffffffffffbab8,in_stack_ffffffffffffbab0);
  local_3180 = &local_3340;
  if (local_3340 != (void *)0x0) {
    local_3138 = local_3180;
  }
  local_3a59 = local_3340 == (void *)0x0 || local_3300 * local_3308 == 0;
  if (local_3a59) {
    local_32b4 = -100;
    local_3350 = 1;
    goto LAB_00fd692a;
  }
  local_32b0 = &local_3398;
  local_3398 = (void *)0x0;
  local_3390 = (int *)0x0;
  local_3388 = 0;
  local_3380 = 0;
  local_3378 = (long *)0x0;
  local_3370 = 0;
  local_336c = 0;
  local_3368 = 0;
  local_3364 = 0;
  local_3360 = 0;
  local_3358 = 0;
  if (local_32f4 == local_32f8) {
LAB_00fd0192:
    for (local_339c = 0; pvVar105 = local_3398, local_339c < local_32f0; local_339c = local_339c + 1
        ) {
      if (local_32cc == 0) {
        local_3aa4 = local_339c;
      }
      else {
        local_3aa4 = (local_32f0 + -1) - local_339c;
      }
      local_33a0 = local_3aa4;
      local_372c = (local_32f8 >> 1) << 1;
      for (local_33ac = 0; local_33ac < local_32f8 >> 1; local_33ac = local_33ac + 1) {
        local_33b0 = local_33ac << 1;
        local_33b8 = (undefined8 *)(*local_32e0 + (long)(local_33ac << 3) * 4);
        local_3224 = local_33b0 / 2;
        local_33c0 = (undefined8 *)
                     (*local_32d8 +
                     (long)*(int *)((long)local_32d8 + 0x2c) * (long)local_3224 * local_32d8[2]);
        local_3234 = local_33b0 / 2;
        local_33c8 = (undefined8 *)
                     (*local_32e8 +
                     (long)*(int *)((long)local_32e8 + 0x2c) * (long)local_3234 * local_32e8[2]);
        local_3400 = *local_33b8;
        uStack_33f8 = local_33b8[1];
        uStack_33f0 = local_33b8[2];
        uStack_33e8 = local_33b8[3];
        local_3080._8_8_ = SUB328(ZEXT832(0),4);
        local_3420 = 0;
        uStack_3418 = local_3080._8_8_;
        uStack_3410 = 0;
        uStack_3408 = 0;
        local_30a0._8_8_ = SUB328(ZEXT832(0),4);
        local_3440 = 0;
        uStack_3438 = local_30a0._8_8_;
        uStack_3430 = 0;
        uStack_3428 = 0;
        local_30c0._8_8_ = SUB328(ZEXT832(0),4);
        local_3460 = 0;
        uStack_3458 = local_30c0._8_8_;
        uStack_3450 = 0;
        uStack_3448 = 0;
        local_3244 = local_3aa4;
        local_3468 = (float *)(*local_32c0 +
                              (long)*(int *)((long)local_32c0 + 0x2c) * (long)local_3aa4 *
                              local_32c0[2]);
        for (local_346c = 0; local_346c + 3 < local_32ec; local_346c = local_346c + 4) {
          local_2df0 = local_3468;
          local_2e20 = *local_3468;
          local_34a0 = CONCAT44(local_2e20,local_2e20);
          uStack_3498 = CONCAT44(local_2e20,local_2e20);
          uStack_3490 = CONCAT44(local_2e20,local_2e20);
          uStack_3488 = CONCAT44(local_2e20,local_2e20);
          local_2e28 = local_3468 + 1;
          local_2e60 = *local_2e28;
          local_34c0 = CONCAT44(local_2e60,local_2e60);
          uStack_34b8 = CONCAT44(local_2e60,local_2e60);
          uStack_34b0 = CONCAT44(local_2e60,local_2e60);
          uStack_34a8 = CONCAT44(local_2e60,local_2e60);
          local_2e68 = local_3468 + 2;
          local_2ea0 = *local_2e68;
          local_34e0 = CONCAT44(local_2ea0,local_2ea0);
          uStack_34d8 = CONCAT44(local_2ea0,local_2ea0);
          uStack_34d0 = CONCAT44(local_2ea0,local_2ea0);
          uStack_34c8 = CONCAT44(local_2ea0,local_2ea0);
          local_2ea8 = local_3468 + 3;
          local_2ee0 = *local_2ea8;
          local_3500 = CONCAT44(local_2ee0,local_2ee0);
          uStack_34f8 = CONCAT44(local_2ee0,local_2ee0);
          uStack_34f0 = CONCAT44(local_2ee0,local_2ee0);
          uStack_34e8 = CONCAT44(local_2ee0,local_2ee0);
          local_30d0 = local_33c0;
          uVar9 = *local_33c0;
          uVar10 = local_33c0[1];
          uVar11 = local_33c0[2];
          uVar12 = local_33c0[3];
          local_30d8 = local_33c0 + 4;
          uVar13 = *local_30d8;
          uVar14 = local_33c0[5];
          uVar15 = local_33c0[6];
          uVar16 = local_33c0[7];
          local_30e0 = local_33c0 + 8;
          uVar17 = *local_30e0;
          uVar18 = local_33c0[9];
          uVar19 = local_33c0[10];
          uVar20 = local_33c0[0xb];
          local_30e8 = local_33c0 + 0xc;
          uVar21 = *local_30e8;
          uVar22 = local_33c0[0xd];
          uVar23 = local_33c0[0xe];
          uVar24 = local_33c0[0xf];
          local_2d00 = &local_3520;
          local_2d08 = &local_34a0;
          local_2d10 = &local_3400;
          local_3520._0_4_ = (float)uVar9;
          local_1ee0 = (float)local_3520;
          local_3520._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_1edc = local_3520._4_4_;
          uStack_3518._0_4_ = (float)uVar10;
          fStack_1ed8 = (float)uStack_3518;
          uStack_3518._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_1ed4 = uStack_3518._4_4_;
          uStack_3510._0_4_ = (float)uVar11;
          fStack_1ed0 = (float)uStack_3510;
          uStack_3510._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_1ecc = uStack_3510._4_4_;
          uStack_3508._0_4_ = (float)uVar12;
          fStack_1ec8 = (float)uStack_3508;
          uStack_3508._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_2ca4 = uStack_3508._4_4_;
          local_2cc0 = (float)local_3520 * local_2e20;
          fStack_2cbc = local_3520._4_4_ * local_2e20;
          fStack_2cb8 = (float)uStack_3518 * local_2e20;
          fStack_2cb4 = uStack_3518._4_4_ * local_2e20;
          fStack_2cb0 = (float)uStack_3510 * local_2e20;
          fStack_2cac = uStack_3510._4_4_ * local_2e20;
          fStack_2ca8 = (float)uStack_3508 * local_2e20;
          uVar25 = local_3400;
          uVar26 = uStack_33f8;
          uVar27 = uStack_33f0;
          uVar28 = uStack_33e8;
          local_2ce0._0_4_ = (float)local_3400;
          local_2ce0._4_4_ = (float)((ulong)local_3400 >> 0x20);
          uStack_2cd8._0_4_ = (float)uStack_33f8;
          uStack_2cd8._4_4_ = (float)((ulong)uStack_33f8 >> 0x20);
          uStack_2cd0._0_4_ = (float)uStack_33f0;
          uStack_2cd0._4_4_ = (float)((ulong)uStack_33f0 >> 0x20);
          uStack_2cc8._0_4_ = (float)uStack_33e8;
          uStack_2cc8._4_4_ = (float)((ulong)uStack_33e8 >> 0x20);
          local_3400 = CONCAT44(fStack_2cbc + local_2ce0._4_4_,local_2cc0 + (float)local_2ce0);
          uStack_33f8 = CONCAT44(fStack_2cb4 + uStack_2cd8._4_4_,fStack_2cb8 + (float)uStack_2cd8);
          uStack_33f0 = CONCAT44(fStack_2cac + uStack_2cd0._4_4_,fStack_2cb0 + (float)uStack_2cd0);
          uStack_33e8 = CONCAT44(uStack_3508._4_4_ + uStack_2cc8._4_4_,
                                 fStack_2ca8 + (float)uStack_2cc8);
          local_2d18 = &local_3540;
          local_2d20 = &local_34c0;
          local_2d28 = &local_3420;
          local_3540._0_4_ = (float)uVar13;
          local_1ea0 = (float)local_3540;
          local_3540._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_1e9c = local_3540._4_4_;
          uStack_3538._0_4_ = (float)uVar14;
          fStack_1e98 = (float)uStack_3538;
          uStack_3538._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_1e94 = uStack_3538._4_4_;
          uStack_3530._0_4_ = (float)uVar15;
          fStack_1e90 = (float)uStack_3530;
          uStack_3530._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_1e8c = uStack_3530._4_4_;
          uStack_3528._0_4_ = (float)uVar16;
          fStack_1e88 = (float)uStack_3528;
          uStack_3528._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_2c64 = uStack_3528._4_4_;
          local_2c80 = (float)local_3540 * local_2e60;
          fStack_2c7c = local_3540._4_4_ * local_2e60;
          fStack_2c78 = (float)uStack_3538 * local_2e60;
          fStack_2c74 = uStack_3538._4_4_ * local_2e60;
          fStack_2c70 = (float)uStack_3530 * local_2e60;
          fStack_2c6c = uStack_3530._4_4_ * local_2e60;
          fStack_2c68 = (float)uStack_3528 * local_2e60;
          uVar29 = local_3420;
          uVar30 = uStack_3418;
          uVar31 = uStack_3410;
          uVar32 = uStack_3408;
          local_2ca0._0_4_ = (float)local_3420;
          local_2ca0._4_4_ = (float)((ulong)local_3420 >> 0x20);
          uStack_2c98._0_4_ = (float)uStack_3418;
          uStack_2c98._4_4_ = (float)((ulong)uStack_3418 >> 0x20);
          uStack_2c90._0_4_ = (float)uStack_3410;
          uStack_2c90._4_4_ = (float)((ulong)uStack_3410 >> 0x20);
          uStack_2c88._0_4_ = (float)uStack_3408;
          uStack_2c88._4_4_ = (float)((ulong)uStack_3408 >> 0x20);
          local_3420 = CONCAT44(fStack_2c7c + local_2ca0._4_4_,local_2c80 + (float)local_2ca0);
          uStack_3418 = CONCAT44(fStack_2c74 + uStack_2c98._4_4_,fStack_2c78 + (float)uStack_2c98);
          uStack_3410 = CONCAT44(fStack_2c6c + uStack_2c90._4_4_,fStack_2c70 + (float)uStack_2c90);
          uStack_3408 = CONCAT44(uStack_3528._4_4_ + uStack_2c88._4_4_,
                                 fStack_2c68 + (float)uStack_2c88);
          local_2d30 = &local_3560;
          local_2d38 = &local_34e0;
          local_2d40 = &local_3440;
          local_3560._0_4_ = (float)uVar17;
          local_1e60 = (float)local_3560;
          local_3560._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_1e5c = local_3560._4_4_;
          uStack_3558._0_4_ = (float)uVar18;
          fStack_1e58 = (float)uStack_3558;
          uStack_3558._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_1e54 = uStack_3558._4_4_;
          uStack_3550._0_4_ = (float)uVar19;
          fStack_1e50 = (float)uStack_3550;
          uStack_3550._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_1e4c = uStack_3550._4_4_;
          uStack_3548._0_4_ = (float)uVar20;
          fStack_1e48 = (float)uStack_3548;
          uStack_3548._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_2c24 = uStack_3548._4_4_;
          local_2c40 = (float)local_3560 * local_2ea0;
          fStack_2c3c = local_3560._4_4_ * local_2ea0;
          fStack_2c38 = (float)uStack_3558 * local_2ea0;
          fStack_2c34 = uStack_3558._4_4_ * local_2ea0;
          fStack_2c30 = (float)uStack_3550 * local_2ea0;
          fStack_2c2c = uStack_3550._4_4_ * local_2ea0;
          fStack_2c28 = (float)uStack_3548 * local_2ea0;
          uVar33 = local_3440;
          uVar34 = uStack_3438;
          uVar35 = uStack_3430;
          uVar36 = uStack_3428;
          local_2c60._0_4_ = (float)local_3440;
          local_2c60._4_4_ = (float)((ulong)local_3440 >> 0x20);
          uStack_2c58._0_4_ = (float)uStack_3438;
          uStack_2c58._4_4_ = (float)((ulong)uStack_3438 >> 0x20);
          uStack_2c50._0_4_ = (float)uStack_3430;
          uStack_2c50._4_4_ = (float)((ulong)uStack_3430 >> 0x20);
          uStack_2c48._0_4_ = (float)uStack_3428;
          uStack_2c48._4_4_ = (float)((ulong)uStack_3428 >> 0x20);
          local_3440 = CONCAT44(fStack_2c3c + local_2c60._4_4_,local_2c40 + (float)local_2c60);
          uStack_3438 = CONCAT44(fStack_2c34 + uStack_2c58._4_4_,fStack_2c38 + (float)uStack_2c58);
          uStack_3430 = CONCAT44(fStack_2c2c + uStack_2c50._4_4_,fStack_2c30 + (float)uStack_2c50);
          uStack_3428 = CONCAT44(uStack_3548._4_4_ + uStack_2c48._4_4_,
                                 fStack_2c28 + (float)uStack_2c48);
          local_2d48 = &local_3580;
          local_2d50 = &local_3500;
          local_2d58 = &local_3460;
          local_3580._0_4_ = (float)uVar21;
          local_1e20 = (float)local_3580;
          local_3580._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_1e1c = local_3580._4_4_;
          uStack_3578._0_4_ = (float)uVar22;
          fStack_1e18 = (float)uStack_3578;
          uStack_3578._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_1e14 = uStack_3578._4_4_;
          uStack_3570._0_4_ = (float)uVar23;
          fStack_1e10 = (float)uStack_3570;
          uStack_3570._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_1e0c = uStack_3570._4_4_;
          uStack_3568._0_4_ = (float)uVar24;
          fStack_1e08 = (float)uStack_3568;
          uStack_3568._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_2be4 = uStack_3568._4_4_;
          local_2c00 = (float)local_3580 * local_2ee0;
          fStack_2bfc = local_3580._4_4_ * local_2ee0;
          fStack_2bf8 = (float)uStack_3578 * local_2ee0;
          fStack_2bf4 = uStack_3578._4_4_ * local_2ee0;
          fStack_2bf0 = (float)uStack_3570 * local_2ee0;
          fStack_2bec = uStack_3570._4_4_ * local_2ee0;
          fStack_2be8 = (float)uStack_3568 * local_2ee0;
          uVar37 = local_3460;
          uVar38 = uStack_3458;
          uVar39 = uStack_3450;
          uVar40 = uStack_3448;
          local_2c20._0_4_ = (float)local_3460;
          local_2c20._4_4_ = (float)((ulong)local_3460 >> 0x20);
          uStack_2c18._0_4_ = (float)uStack_3458;
          uStack_2c18._4_4_ = (float)((ulong)uStack_3458 >> 0x20);
          uStack_2c10._0_4_ = (float)uStack_3450;
          uStack_2c10._4_4_ = (float)((ulong)uStack_3450 >> 0x20);
          uStack_2c08._0_4_ = (float)uStack_3448;
          uStack_2c08._4_4_ = (float)((ulong)uStack_3448 >> 0x20);
          local_3460 = CONCAT44(fStack_2bfc + local_2c20._4_4_,local_2c00 + (float)local_2c20);
          uStack_3458 = CONCAT44(fStack_2bf4 + uStack_2c18._4_4_,fStack_2bf8 + (float)uStack_2c18);
          uStack_3450 = CONCAT44(fStack_2bec + uStack_2c10._4_4_,fStack_2bf0 + (float)uStack_2c10);
          uStack_3448 = CONCAT44(uStack_3568._4_4_ + uStack_2c08._4_4_,
                                 fStack_2be8 + (float)uStack_2c08);
          local_3468 = local_3468 + 4;
          local_33c0 = local_33c0 + 0x10;
          local_3580 = uVar21;
          uStack_3578 = uVar22;
          uStack_3570 = uVar23;
          uStack_3568 = uVar24;
          local_3560 = uVar17;
          uStack_3558 = uVar18;
          uStack_3550 = uVar19;
          uStack_3548 = uVar20;
          local_3540 = uVar13;
          uStack_3538 = uVar14;
          uStack_3530 = uVar15;
          uStack_3528 = uVar16;
          local_3520 = uVar9;
          uStack_3518 = uVar10;
          uStack_3510 = uVar11;
          uStack_3508 = uVar12;
          fStack_2edc = local_2ee0;
          fStack_2ed8 = local_2ee0;
          fStack_2ed4 = local_2ee0;
          fStack_2ed0 = local_2ee0;
          fStack_2ecc = local_2ee0;
          fStack_2ec8 = local_2ee0;
          fStack_2ec4 = local_2ee0;
          local_2eac = local_2ee0;
          fStack_2e9c = local_2ea0;
          fStack_2e98 = local_2ea0;
          fStack_2e94 = local_2ea0;
          fStack_2e90 = local_2ea0;
          fStack_2e8c = local_2ea0;
          fStack_2e88 = local_2ea0;
          fStack_2e84 = local_2ea0;
          local_2e6c = local_2ea0;
          fStack_2e5c = local_2e60;
          fStack_2e58 = local_2e60;
          fStack_2e54 = local_2e60;
          fStack_2e50 = local_2e60;
          fStack_2e4c = local_2e60;
          fStack_2e48 = local_2e60;
          fStack_2e44 = local_2e60;
          local_2e2c = local_2e60;
          fStack_2e1c = local_2e20;
          fStack_2e18 = local_2e20;
          fStack_2e14 = local_2e20;
          fStack_2e10 = local_2e20;
          fStack_2e0c = local_2e20;
          fStack_2e08 = local_2e20;
          fStack_2e04 = local_2e20;
          local_2df4 = local_2e20;
          local_2ce0 = uVar25;
          uStack_2cd8 = uVar26;
          uStack_2cd0 = uVar27;
          uStack_2cc8 = uVar28;
          local_2ca0 = uVar29;
          uStack_2c98 = uVar30;
          uStack_2c90 = uVar31;
          uStack_2c88 = uVar32;
          local_2c60 = uVar33;
          uStack_2c58 = uVar34;
          uStack_2c50 = uVar35;
          uStack_2c48 = uVar36;
          local_2c20 = uVar37;
          uStack_2c18 = uVar38;
          uStack_2c10 = uVar39;
          uStack_2c08 = uVar40;
          local_1f00 = local_34a0;
          uStack_1ef8 = uStack_3498;
          uStack_1ef0 = uStack_3490;
          uStack_1ee8 = uStack_3488;
          fStack_1ec4 = fStack_2ca4;
          local_1ec0 = local_34c0;
          uStack_1eb8 = uStack_34b8;
          uStack_1eb0 = uStack_34b0;
          uStack_1ea8 = uStack_34a8;
          fStack_1e84 = fStack_2c64;
          local_1e80 = local_34e0;
          uStack_1e78 = uStack_34d8;
          uStack_1e70 = uStack_34d0;
          uStack_1e68 = uStack_34c8;
          fStack_1e44 = fStack_2c24;
          local_1e40 = local_3500;
          uStack_1e38 = uStack_34f8;
          uStack_1e30 = uStack_34f0;
          uStack_1e28 = uStack_34e8;
          fStack_1e04 = fStack_2be4;
        }
        for (; local_346c < local_32ec; local_346c = local_346c + 1) {
          local_2ee8 = local_3468;
          local_2f20 = *local_3468;
          local_35a0 = CONCAT44(local_2f20,local_2f20);
          uStack_3598 = CONCAT44(local_2f20,local_2f20);
          uStack_3590 = CONCAT44(local_2f20,local_2f20);
          uStack_3588 = CONCAT44(local_2f20,local_2f20);
          local_30f0 = local_33c0;
          uVar9 = *local_33c0;
          uVar10 = local_33c0[1];
          uVar11 = local_33c0[2];
          uVar12 = local_33c0[3];
          local_2d60 = &local_35c0;
          local_2d68 = &local_35a0;
          local_2d70 = &local_3400;
          local_35c0._0_4_ = (float)uVar9;
          local_1de0 = (float)local_35c0;
          local_35c0._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_1ddc = local_35c0._4_4_;
          uStack_35b8._0_4_ = (float)uVar10;
          fStack_1dd8 = (float)uStack_35b8;
          uStack_35b8._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_1dd4 = uStack_35b8._4_4_;
          uStack_35b0._0_4_ = (float)uVar11;
          fStack_1dd0 = (float)uStack_35b0;
          uStack_35b0._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_1dcc = uStack_35b0._4_4_;
          uStack_35a8._0_4_ = (float)uVar12;
          fStack_1dc8 = (float)uStack_35a8;
          uStack_35a8._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_2ba4 = uStack_35a8._4_4_;
          local_2bc0 = (float)local_35c0 * local_2f20;
          fStack_2bbc = local_35c0._4_4_ * local_2f20;
          fStack_2bb8 = (float)uStack_35b8 * local_2f20;
          fStack_2bb4 = uStack_35b8._4_4_ * local_2f20;
          fStack_2bb0 = (float)uStack_35b0 * local_2f20;
          fStack_2bac = uStack_35b0._4_4_ * local_2f20;
          fStack_2ba8 = (float)uStack_35a8 * local_2f20;
          uVar13 = local_3400;
          uVar14 = uStack_33f8;
          uVar15 = uStack_33f0;
          uVar16 = uStack_33e8;
          local_2be0._0_4_ = (float)local_3400;
          local_2be0._4_4_ = (float)((ulong)local_3400 >> 0x20);
          uStack_2bd8._0_4_ = (float)uStack_33f8;
          uStack_2bd8._4_4_ = (float)((ulong)uStack_33f8 >> 0x20);
          uStack_2bd0._0_4_ = (float)uStack_33f0;
          uStack_2bd0._4_4_ = (float)((ulong)uStack_33f0 >> 0x20);
          uStack_2bc8._0_4_ = (float)uStack_33e8;
          uStack_2bc8._4_4_ = (float)((ulong)uStack_33e8 >> 0x20);
          local_3400 = CONCAT44(fStack_2bbc + local_2be0._4_4_,local_2bc0 + (float)local_2be0);
          uStack_33f8 = CONCAT44(fStack_2bb4 + uStack_2bd8._4_4_,fStack_2bb8 + (float)uStack_2bd8);
          uStack_33f0 = CONCAT44(fStack_2bac + uStack_2bd0._4_4_,fStack_2bb0 + (float)uStack_2bd0);
          uStack_33e8 = CONCAT44(uStack_35a8._4_4_ + uStack_2bc8._4_4_,
                                 fStack_2ba8 + (float)uStack_2bc8);
          local_3468 = local_3468 + 1;
          local_33c0 = local_33c0 + 4;
          local_35c0 = uVar9;
          uStack_35b8 = uVar10;
          uStack_35b0 = uVar11;
          uStack_35a8 = uVar12;
          fStack_2f1c = local_2f20;
          fStack_2f18 = local_2f20;
          fStack_2f14 = local_2f20;
          fStack_2f10 = local_2f20;
          fStack_2f0c = local_2f20;
          fStack_2f08 = local_2f20;
          fStack_2f04 = local_2f20;
          local_2eec = local_2f20;
          local_2be0 = uVar13;
          uStack_2bd8 = uVar14;
          uStack_2bd0 = uVar15;
          uStack_2bc8 = uVar16;
          local_1e00 = local_35a0;
          uStack_1df8 = uStack_3598;
          uStack_1df0 = uStack_3590;
          uStack_1de8 = uStack_3588;
          fStack_1dc4 = fStack_2ba4;
        }
        local_2ce8 = weight_hr;
        local_35c8 = (float *)weight_hr->data;
        local_346c = 0;
        while( true ) {
          local_29e0._0_4_ = (float)local_3420;
          local_29e0._4_4_ = (float)((ulong)local_3420 >> 0x20);
          uStack_29d8._0_4_ = (float)uStack_3418;
          uStack_29d8._4_4_ = (float)((ulong)uStack_3418 >> 0x20);
          uStack_29d0._0_4_ = (float)uStack_3410;
          uStack_29d0._4_4_ = (float)((ulong)uStack_3410 >> 0x20);
          uStack_29c8._0_4_ = (float)uStack_3408;
          uStack_29c8._4_4_ = (float)((ulong)uStack_3408 >> 0x20);
          local_2a00._0_4_ = (float)local_3440;
          local_2a00._4_4_ = (float)((ulong)local_3440 >> 0x20);
          uStack_29f8._0_4_ = (float)uStack_3438;
          uStack_29f8._4_4_ = (float)((ulong)uStack_3438 >> 0x20);
          uStack_29f0._0_4_ = (float)uStack_3430;
          uStack_29f0._4_4_ = (float)((ulong)uStack_3430 >> 0x20);
          uStack_29e8._0_4_ = (float)uStack_3428;
          uStack_29e8._4_4_ = (float)((ulong)uStack_3428 >> 0x20);
          local_2a20._0_4_ = (float)local_3460;
          local_2a20._4_4_ = (float)((ulong)local_3460 >> 0x20);
          uStack_2a18._0_4_ = (float)uStack_3458;
          uStack_2a18._4_4_ = (float)((ulong)uStack_3458 >> 0x20);
          uStack_2a10._0_4_ = (float)uStack_3450;
          uStack_2a10._4_4_ = (float)((ulong)uStack_3450 >> 0x20);
          uStack_2a08._0_4_ = (float)uStack_3448;
          uStack_2a08._4_4_ = (float)((ulong)uStack_3448 >> 0x20);
          if (local_32f4 <= local_346c + 3) break;
          local_2f28 = local_35c8;
          local_2f60 = *local_35c8;
          local_3600 = CONCAT44(local_2f60,local_2f60);
          uStack_35f8 = CONCAT44(local_2f60,local_2f60);
          uStack_35f0 = CONCAT44(local_2f60,local_2f60);
          uStack_35e8 = CONCAT44(local_2f60,local_2f60);
          local_2f68 = local_35c8 + 1;
          local_2fa0 = *local_2f68;
          local_3620 = CONCAT44(local_2fa0,local_2fa0);
          uStack_3618 = CONCAT44(local_2fa0,local_2fa0);
          uStack_3610 = CONCAT44(local_2fa0,local_2fa0);
          uStack_3608 = CONCAT44(local_2fa0,local_2fa0);
          local_2fa8 = local_35c8 + 2;
          local_2fe0 = *local_2fa8;
          local_3640 = CONCAT44(local_2fe0,local_2fe0);
          uStack_3638 = CONCAT44(local_2fe0,local_2fe0);
          uStack_3630 = CONCAT44(local_2fe0,local_2fe0);
          uStack_3628 = CONCAT44(local_2fe0,local_2fe0);
          local_2fe8 = local_35c8 + 3;
          local_3020 = *local_2fe8;
          local_3660 = CONCAT44(local_3020,local_3020);
          uStack_3658 = CONCAT44(local_3020,local_3020);
          uStack_3650 = CONCAT44(local_3020,local_3020);
          uStack_3648 = CONCAT44(local_3020,local_3020);
          local_30f8 = local_33c8;
          uVar9 = *local_33c8;
          uVar10 = local_33c8[1];
          uVar11 = local_33c8[2];
          uVar12 = local_33c8[3];
          local_3100 = local_33c8 + 4;
          uVar13 = *local_3100;
          uVar14 = local_33c8[5];
          uVar15 = local_33c8[6];
          uVar16 = local_33c8[7];
          local_3108 = local_33c8 + 8;
          uVar17 = *local_3108;
          uVar18 = local_33c8[9];
          uVar19 = local_33c8[10];
          uVar20 = local_33c8[0xb];
          local_3110 = local_33c8 + 0xc;
          uVar21 = *local_3110;
          uVar22 = local_33c8[0xd];
          uVar23 = local_33c8[0xe];
          uVar24 = local_33c8[0xf];
          local_2d78 = &local_3680;
          local_2d80 = &local_3600;
          local_2d88 = &local_3400;
          local_3680._0_4_ = (float)uVar9;
          local_1da0 = (float)local_3680;
          local_3680._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_1d9c = local_3680._4_4_;
          uStack_3678._0_4_ = (float)uVar10;
          fStack_1d98 = (float)uStack_3678;
          uStack_3678._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_1d94 = uStack_3678._4_4_;
          uStack_3670._0_4_ = (float)uVar11;
          fStack_1d90 = (float)uStack_3670;
          uStack_3670._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_1d8c = uStack_3670._4_4_;
          uStack_3668._0_4_ = (float)uVar12;
          fStack_1d88 = (float)uStack_3668;
          uStack_3668._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_2b64 = uStack_3668._4_4_;
          local_2b80 = (float)local_3680 * local_2f60;
          fStack_2b7c = local_3680._4_4_ * local_2f60;
          fStack_2b78 = (float)uStack_3678 * local_2f60;
          fStack_2b74 = uStack_3678._4_4_ * local_2f60;
          fStack_2b70 = (float)uStack_3670 * local_2f60;
          fStack_2b6c = uStack_3670._4_4_ * local_2f60;
          fStack_2b68 = (float)uStack_3668 * local_2f60;
          uVar25 = local_3400;
          uVar26 = uStack_33f8;
          uVar27 = uStack_33f0;
          uVar28 = uStack_33e8;
          local_2ba0._0_4_ = (float)local_3400;
          local_2ba0._4_4_ = (float)((ulong)local_3400 >> 0x20);
          uStack_2b98._0_4_ = (float)uStack_33f8;
          uStack_2b98._4_4_ = (float)((ulong)uStack_33f8 >> 0x20);
          uStack_2b90._0_4_ = (float)uStack_33f0;
          uStack_2b90._4_4_ = (float)((ulong)uStack_33f0 >> 0x20);
          uStack_2b88._0_4_ = (float)uStack_33e8;
          uStack_2b88._4_4_ = (float)((ulong)uStack_33e8 >> 0x20);
          local_3400 = CONCAT44(fStack_2b7c + local_2ba0._4_4_,local_2b80 + (float)local_2ba0);
          uStack_33f8 = CONCAT44(fStack_2b74 + uStack_2b98._4_4_,fStack_2b78 + (float)uStack_2b98);
          uStack_33f0 = CONCAT44(fStack_2b6c + uStack_2b90._4_4_,fStack_2b70 + (float)uStack_2b90);
          uStack_33e8 = CONCAT44(uStack_3668._4_4_ + uStack_2b88._4_4_,
                                 fStack_2b68 + (float)uStack_2b88);
          local_2d90 = &local_36a0;
          local_2d98 = &local_3620;
          local_2da0 = &local_3420;
          local_36a0._0_4_ = (float)uVar13;
          local_1d60 = (float)local_36a0;
          local_36a0._4_4_ = (float)((ulong)uVar13 >> 0x20);
          fStack_1d5c = local_36a0._4_4_;
          uStack_3698._0_4_ = (float)uVar14;
          fStack_1d58 = (float)uStack_3698;
          uStack_3698._4_4_ = (float)((ulong)uVar14 >> 0x20);
          fStack_1d54 = uStack_3698._4_4_;
          uStack_3690._0_4_ = (float)uVar15;
          fStack_1d50 = (float)uStack_3690;
          uStack_3690._4_4_ = (float)((ulong)uVar15 >> 0x20);
          fStack_1d4c = uStack_3690._4_4_;
          uStack_3688._0_4_ = (float)uVar16;
          fStack_1d48 = (float)uStack_3688;
          uStack_3688._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_2b24 = uStack_3688._4_4_;
          local_2b40 = (float)local_36a0 * local_2fa0;
          fStack_2b3c = local_36a0._4_4_ * local_2fa0;
          fStack_2b38 = (float)uStack_3698 * local_2fa0;
          fStack_2b34 = uStack_3698._4_4_ * local_2fa0;
          fStack_2b30 = (float)uStack_3690 * local_2fa0;
          fStack_2b2c = uStack_3690._4_4_ * local_2fa0;
          fStack_2b28 = (float)uStack_3688 * local_2fa0;
          local_2b60 = local_3420;
          uStack_2b58 = uStack_3418;
          uStack_2b50 = uStack_3410;
          uStack_2b48 = uStack_3408;
          local_3420 = CONCAT44(fStack_2b3c + local_29e0._4_4_,local_2b40 + (float)local_29e0);
          uStack_3418 = CONCAT44(fStack_2b34 + uStack_29d8._4_4_,fStack_2b38 + (float)uStack_29d8);
          uStack_3410 = CONCAT44(fStack_2b2c + uStack_29d0._4_4_,fStack_2b30 + (float)uStack_29d0);
          uStack_3408 = CONCAT44(uStack_3688._4_4_ + uStack_29c8._4_4_,
                                 fStack_2b28 + (float)uStack_29c8);
          local_2da8 = &local_36c0;
          local_2db0 = &local_3640;
          local_2db8 = &local_3440;
          local_36c0._0_4_ = (float)uVar17;
          local_1d20 = (float)local_36c0;
          local_36c0._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_1d1c = local_36c0._4_4_;
          uStack_36b8._0_4_ = (float)uVar18;
          fStack_1d18 = (float)uStack_36b8;
          uStack_36b8._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_1d14 = uStack_36b8._4_4_;
          uStack_36b0._0_4_ = (float)uVar19;
          fStack_1d10 = (float)uStack_36b0;
          uStack_36b0._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_1d0c = uStack_36b0._4_4_;
          uStack_36a8._0_4_ = (float)uVar20;
          fStack_1d08 = (float)uStack_36a8;
          uStack_36a8._4_4_ = (float)((ulong)uVar20 >> 0x20);
          fStack_2ae4 = uStack_36a8._4_4_;
          local_2b00 = (float)local_36c0 * local_2fe0;
          fStack_2afc = local_36c0._4_4_ * local_2fe0;
          fStack_2af8 = (float)uStack_36b8 * local_2fe0;
          fStack_2af4 = uStack_36b8._4_4_ * local_2fe0;
          fStack_2af0 = (float)uStack_36b0 * local_2fe0;
          fStack_2aec = uStack_36b0._4_4_ * local_2fe0;
          fStack_2ae8 = (float)uStack_36a8 * local_2fe0;
          local_2b20 = local_3440;
          uStack_2b18 = uStack_3438;
          uStack_2b10 = uStack_3430;
          uStack_2b08 = uStack_3428;
          local_3440 = CONCAT44(fStack_2afc + local_2a00._4_4_,local_2b00 + (float)local_2a00);
          uStack_3438 = CONCAT44(fStack_2af4 + uStack_29f8._4_4_,fStack_2af8 + (float)uStack_29f8);
          uStack_3430 = CONCAT44(fStack_2aec + uStack_29f0._4_4_,fStack_2af0 + (float)uStack_29f0);
          uStack_3428 = CONCAT44(uStack_36a8._4_4_ + uStack_29e8._4_4_,
                                 fStack_2ae8 + (float)uStack_29e8);
          local_2dc0 = &local_36e0;
          local_2dc8 = &local_3660;
          local_2dd0 = &local_3460;
          local_36e0._0_4_ = (float)uVar21;
          local_1ce0 = (float)local_36e0;
          local_36e0._4_4_ = (float)((ulong)uVar21 >> 0x20);
          fStack_1cdc = local_36e0._4_4_;
          uStack_36d8._0_4_ = (float)uVar22;
          fStack_1cd8 = (float)uStack_36d8;
          uStack_36d8._4_4_ = (float)((ulong)uVar22 >> 0x20);
          fStack_1cd4 = uStack_36d8._4_4_;
          uStack_36d0._0_4_ = (float)uVar23;
          fStack_1cd0 = (float)uStack_36d0;
          uStack_36d0._4_4_ = (float)((ulong)uVar23 >> 0x20);
          fStack_1ccc = uStack_36d0._4_4_;
          uStack_36c8._0_4_ = (float)uVar24;
          fStack_1cc8 = (float)uStack_36c8;
          uStack_36c8._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_2aa4 = uStack_36c8._4_4_;
          local_2ac0 = (float)local_36e0 * local_3020;
          fStack_2abc = local_36e0._4_4_ * local_3020;
          fStack_2ab8 = (float)uStack_36d8 * local_3020;
          fStack_2ab4 = uStack_36d8._4_4_ * local_3020;
          fStack_2ab0 = (float)uStack_36d0 * local_3020;
          fStack_2aac = uStack_36d0._4_4_ * local_3020;
          fStack_2aa8 = (float)uStack_36c8 * local_3020;
          local_2ae0 = local_3460;
          uStack_2ad8 = uStack_3458;
          uStack_2ad0 = uStack_3450;
          uStack_2ac8 = uStack_3448;
          local_3460 = CONCAT44(fStack_2abc + local_2a20._4_4_,local_2ac0 + (float)local_2a20);
          uStack_3458 = CONCAT44(fStack_2ab4 + uStack_2a18._4_4_,fStack_2ab8 + (float)uStack_2a18);
          uStack_3450 = CONCAT44(fStack_2aac + uStack_2a10._4_4_,fStack_2ab0 + (float)uStack_2a10);
          uStack_3448 = CONCAT44(uStack_36c8._4_4_ + uStack_2a08._4_4_,
                                 fStack_2aa8 + (float)uStack_2a08);
          local_35c8 = local_35c8 + 4;
          local_33c8 = local_33c8 + 0x10;
          local_346c = local_346c + 4;
          local_36e0 = uVar21;
          uStack_36d8 = uVar22;
          uStack_36d0 = uVar23;
          uStack_36c8 = uVar24;
          local_36c0 = uVar17;
          uStack_36b8 = uVar18;
          uStack_36b0 = uVar19;
          uStack_36a8 = uVar20;
          local_36a0 = uVar13;
          uStack_3698 = uVar14;
          uStack_3690 = uVar15;
          uStack_3688 = uVar16;
          local_3680 = uVar9;
          uStack_3678 = uVar10;
          uStack_3670 = uVar11;
          uStack_3668 = uVar12;
          fStack_301c = local_3020;
          fStack_3018 = local_3020;
          fStack_3014 = local_3020;
          fStack_3010 = local_3020;
          fStack_300c = local_3020;
          fStack_3008 = local_3020;
          fStack_3004 = local_3020;
          local_2fec = local_3020;
          fStack_2fdc = local_2fe0;
          fStack_2fd8 = local_2fe0;
          fStack_2fd4 = local_2fe0;
          fStack_2fd0 = local_2fe0;
          fStack_2fcc = local_2fe0;
          fStack_2fc8 = local_2fe0;
          fStack_2fc4 = local_2fe0;
          local_2fac = local_2fe0;
          fStack_2f9c = local_2fa0;
          fStack_2f98 = local_2fa0;
          fStack_2f94 = local_2fa0;
          fStack_2f90 = local_2fa0;
          fStack_2f8c = local_2fa0;
          fStack_2f88 = local_2fa0;
          fStack_2f84 = local_2fa0;
          local_2f6c = local_2fa0;
          fStack_2f5c = local_2f60;
          fStack_2f58 = local_2f60;
          fStack_2f54 = local_2f60;
          fStack_2f50 = local_2f60;
          fStack_2f4c = local_2f60;
          fStack_2f48 = local_2f60;
          fStack_2f44 = local_2f60;
          local_2f2c = local_2f60;
          local_2ba0 = uVar25;
          uStack_2b98 = uVar26;
          uStack_2b90 = uVar27;
          uStack_2b88 = uVar28;
          local_1dc0 = local_3600;
          uStack_1db8 = uStack_35f8;
          uStack_1db0 = uStack_35f0;
          uStack_1da8 = uStack_35e8;
          fStack_1d84 = fStack_2b64;
          local_1d80 = local_3620;
          uStack_1d78 = uStack_3618;
          uStack_1d70 = uStack_3610;
          uStack_1d68 = uStack_3608;
          fStack_1d44 = fStack_2b24;
          local_1d40 = local_3640;
          uStack_1d38 = uStack_3638;
          uStack_1d30 = uStack_3630;
          uStack_1d28 = uStack_3628;
          fStack_1d04 = fStack_2ae4;
          local_1d00 = local_3660;
          uStack_1cf8 = uStack_3658;
          uStack_1cf0 = uStack_3650;
          uStack_1ce8 = uStack_3648;
          fStack_1cc4 = fStack_2aa4;
        }
        while( true ) {
          local_29c0._0_4_ = (float)local_3400;
          local_29c0._4_4_ = (float)((ulong)local_3400 >> 0x20);
          uStack_29b8._0_4_ = (float)uStack_33f8;
          uStack_29b8._4_4_ = (float)((ulong)uStack_33f8 >> 0x20);
          uStack_29b0._0_4_ = (float)uStack_33f0;
          uStack_29b0._4_4_ = (float)((ulong)uStack_33f0 >> 0x20);
          uStack_29a8._0_4_ = (float)uStack_33e8;
          uStack_29a8._4_4_ = (float)((ulong)uStack_33e8 >> 0x20);
          if (local_32f4 <= local_346c) break;
          local_3028 = local_35c8;
          local_3060 = *local_35c8;
          local_3700 = CONCAT44(local_3060,local_3060);
          uStack_36f8 = CONCAT44(local_3060,local_3060);
          uStack_36f0 = CONCAT44(local_3060,local_3060);
          uStack_36e8 = CONCAT44(local_3060,local_3060);
          local_3118 = local_33c8;
          uVar9 = *local_33c8;
          uVar10 = local_33c8[1];
          uVar11 = local_33c8[2];
          uVar12 = local_33c8[3];
          local_2dd8 = &local_3720;
          local_2de0 = &local_3700;
          local_2de8 = &local_3400;
          local_3720._0_4_ = (float)uVar9;
          local_1ca0 = (float)local_3720;
          local_3720._4_4_ = (float)((ulong)uVar9 >> 0x20);
          fStack_1c9c = local_3720._4_4_;
          uStack_3718._0_4_ = (float)uVar10;
          fStack_1c98 = (float)uStack_3718;
          uStack_3718._4_4_ = (float)((ulong)uVar10 >> 0x20);
          fStack_1c94 = uStack_3718._4_4_;
          uStack_3710._0_4_ = (float)uVar11;
          fStack_1c90 = (float)uStack_3710;
          uStack_3710._4_4_ = (float)((ulong)uVar11 >> 0x20);
          fStack_1c8c = uStack_3710._4_4_;
          uStack_3708._0_4_ = (float)uVar12;
          fStack_1c88 = (float)uStack_3708;
          uStack_3708._4_4_ = (float)((ulong)uVar12 >> 0x20);
          fStack_2a64 = uStack_3708._4_4_;
          local_2a80 = (float)local_3720 * local_3060;
          fStack_2a7c = local_3720._4_4_ * local_3060;
          fStack_2a78 = (float)uStack_3718 * local_3060;
          fStack_2a74 = uStack_3718._4_4_ * local_3060;
          fStack_2a70 = (float)uStack_3710 * local_3060;
          fStack_2a6c = uStack_3710._4_4_ * local_3060;
          fStack_2a68 = (float)uStack_3708 * local_3060;
          local_2aa0 = local_3400;
          uStack_2a98 = uStack_33f8;
          uStack_2a90 = uStack_33f0;
          uStack_2a88 = uStack_33e8;
          local_3400 = CONCAT44(fStack_2a7c + local_29c0._4_4_,local_2a80 + (float)local_29c0);
          uStack_33f8 = CONCAT44(fStack_2a74 + uStack_29b8._4_4_,fStack_2a78 + (float)uStack_29b8);
          uStack_33f0 = CONCAT44(fStack_2a6c + uStack_29b0._4_4_,fStack_2a70 + (float)uStack_29b0);
          uStack_33e8 = CONCAT44(uStack_3708._4_4_ + uStack_29a8._4_4_,
                                 fStack_2a68 + (float)uStack_29a8);
          local_35c8 = local_35c8 + 1;
          local_33c8 = local_33c8 + 4;
          local_346c = local_346c + 1;
          local_3720 = uVar9;
          uStack_3718 = uVar10;
          uStack_3710 = uVar11;
          uStack_3708 = uVar12;
          fStack_305c = local_3060;
          fStack_3058 = local_3060;
          fStack_3054 = local_3060;
          fStack_3050 = local_3060;
          fStack_304c = local_3060;
          fStack_3048 = local_3060;
          fStack_3044 = local_3060;
          local_302c = local_3060;
          local_1cc0 = local_3700;
          uStack_1cb8 = uStack_36f8;
          uStack_1cb0 = uStack_36f0;
          uStack_1ca8 = uStack_36e8;
          fStack_1c84 = fStack_2a64;
        }
        local_31d0 = &local_3340;
        local_3728 = (undefined1 (*) [32])
                     ((long)local_3340 + (long)local_3314 * (long)local_33b0 * local_3330);
        uVar9 = local_3400;
        uVar10 = uStack_33f8;
        uVar11 = uStack_33f0;
        uVar12 = uStack_33e8;
        local_2a40._4_4_ = local_29c0._4_4_ + local_29e0._4_4_;
        local_2a40._0_4_ = (float)local_29c0 + (float)local_29e0;
        local_2a40._12_4_ = uStack_29b8._4_4_ + uStack_29d8._4_4_;
        local_2a40._8_4_ = (float)uStack_29b8 + (float)uStack_29d8;
        local_2a40._20_4_ = uStack_29b0._4_4_ + uStack_29d0._4_4_;
        local_2a40._16_4_ = (float)uStack_29b0 + (float)uStack_29d0;
        local_2a40._28_4_ = uStack_29a8._4_4_ + uStack_29c8._4_4_;
        local_2a40._24_4_ = (float)uStack_29a8 + (float)uStack_29c8;
        uVar13 = local_3440;
        uVar14 = uStack_3438;
        uVar15 = uStack_3430;
        uVar16 = uStack_3428;
        local_3440 = CONCAT44(local_2a00._4_4_ + local_2a20._4_4_,
                              (float)local_2a00 + (float)local_2a20);
        uStack_3438 = CONCAT44(uStack_29f8._4_4_ + uStack_2a18._4_4_,
                               (float)uStack_29f8 + (float)uStack_2a18);
        uStack_3430 = CONCAT44(uStack_29f0._4_4_ + uStack_2a10._4_4_,
                               (float)uStack_29f0 + (float)uStack_2a10);
        uStack_3428 = CONCAT44(uStack_29e8._4_4_ + uStack_2a08._4_4_,
                               (float)uStack_29e8 + (float)uStack_2a08);
        local_3400 = CONCAT44(local_29c0._4_4_ + local_29e0._4_4_ +
                              local_2a00._4_4_ + local_2a20._4_4_,
                              (float)local_29c0 + (float)local_29e0 +
                              (float)local_2a00 + (float)local_2a20);
        uStack_33f8 = CONCAT44(uStack_29b8._4_4_ + uStack_29d8._4_4_ +
                               uStack_29f8._4_4_ + uStack_2a18._4_4_,
                               (float)uStack_29b8 + (float)uStack_29d8 +
                               (float)uStack_29f8 + (float)uStack_2a18);
        uStack_33f0 = CONCAT44(uStack_29b0._4_4_ + uStack_29d0._4_4_ +
                               uStack_29f0._4_4_ + uStack_2a10._4_4_,
                               (float)uStack_29b0 + (float)uStack_29d0 +
                               (float)uStack_29f0 + (float)uStack_2a10);
        uStack_33e8 = CONCAT44(uStack_29a8._4_4_ + uStack_29c8._4_4_ +
                               uStack_29e8._4_4_ + uStack_2a08._4_4_,
                               (float)uStack_29a8 + (float)uStack_29c8 +
                               (float)uStack_29e8 + (float)uStack_2a08);
        auVar41._8_8_ = uStack_33f8;
        auVar41._0_8_ = local_3400;
        auVar41._16_8_ = uStack_33f0;
        auVar41._24_8_ = uStack_33e8;
        *local_3728 = auVar41;
        local_31d4 = local_33b0;
        local_30c8 = local_33b8;
        local_30c0 = ZEXT832(0) << 0x20;
        local_30a0 = ZEXT832(0) << 0x20;
        local_3080 = ZEXT832(0) << 0x20;
        local_2a60 = local_3440;
        uStack_2a58 = uStack_3438;
        uStack_2a50 = uStack_3430;
        uStack_2a48 = uStack_3428;
        local_2a20 = local_3460;
        uStack_2a18 = uStack_3458;
        uStack_2a10 = uStack_3450;
        uStack_2a08 = uStack_3448;
        local_2a00 = uVar13;
        uStack_29f8 = uVar14;
        uStack_29f0 = uVar15;
        uStack_29e8 = uVar16;
        local_29e0 = local_3420;
        uStack_29d8 = uStack_3418;
        uStack_29d0 = uStack_3410;
        uStack_29c8 = uStack_3408;
        local_29c0 = uVar9;
        uStack_29b8 = uVar10;
        uStack_29b0 = uVar11;
        uStack_29a8 = uVar12;
        local_29a0 = local_3400;
        uStack_2998 = uStack_33f8;
        uStack_2990 = uStack_33f0;
        uStack_2988 = uStack_33e8;
        local_2968 = local_3728;
      }
      for (; local_372c < local_32f8; local_372c = local_372c + 1) {
        local_3738 = (undefined8 *)(*local_32e0 + (long)(local_372c << 2) * 4);
        local_3254 = local_372c / 2 + local_372c % 2;
        local_3740 = (undefined8 *)
                     (*local_32d8 +
                     (long)*(int *)((long)local_32d8 + 0x2c) * (long)local_3254 * local_32d8[2]);
        local_3264 = local_372c / 2 + local_372c % 2;
        local_3748 = (undefined8 *)
                     (*local_32e8 +
                     (long)*(int *)((long)local_32e8 + 0x2c) * (long)local_3264 * local_32e8[2]);
        local_3760 = *local_3738;
        uStack_3758 = local_3738[1];
        local_28c0._8_8_ = SUB168(ZEXT816(0),4);
        local_3770 = 0;
        uStack_3768 = local_28c0._8_8_;
        local_28d0._8_8_ = SUB168(ZEXT816(0),4);
        local_3780 = 0;
        uStack_3778 = local_28d0._8_8_;
        local_28e0._8_8_ = SUB168(ZEXT816(0),4);
        local_3790 = 0;
        uStack_3788 = local_28e0._8_8_;
        local_3274 = local_3aa4;
        local_3798 = (float *)(*local_32c0 +
                              (long)*(int *)((long)local_32c0 + 0x2c) * (long)local_3aa4 *
                              local_32c0[2]);
        for (local_379c = 0; local_379c + 3 < local_32ec; local_379c = local_379c + 4) {
          local_2778 = local_3798;
          local_2790 = *local_3798;
          local_37b0 = CONCAT44(local_2790,local_2790);
          uStack_37a8 = CONCAT44(local_2790,local_2790);
          local_2798 = local_3798 + 1;
          local_27b0 = *local_2798;
          local_37c0 = CONCAT44(local_27b0,local_27b0);
          uStack_37b8 = CONCAT44(local_27b0,local_27b0);
          local_27b8 = local_3798 + 2;
          local_27d0 = *local_27b8;
          local_37d0 = CONCAT44(local_27d0,local_27d0);
          uStack_37c8 = CONCAT44(local_27d0,local_27d0);
          local_27d8 = local_3798 + 3;
          local_27f0 = *local_27d8;
          local_37e0 = CONCAT44(local_27f0,local_27f0);
          uStack_37d8 = CONCAT44(local_27f0,local_27f0);
          local_28f0 = local_3740;
          local_37f0 = *local_3740;
          uStack_37e8 = local_3740[1];
          local_28f8 = local_3740 + 2;
          local_3800 = *local_28f8;
          uStack_37f8 = local_3740[3];
          local_2900 = local_3740 + 4;
          local_3810 = *local_2900;
          uStack_3808 = local_3740[5];
          local_2908 = local_3740 + 6;
          local_3820 = *local_2908;
          uStack_3818 = local_3740[7];
          local_2688 = &local_37f0;
          local_2690 = &local_37b0;
          local_2698 = &local_3760;
          local_2090._0_4_ = (float)local_37f0;
          local_2090._4_4_ = (float)((ulong)local_37f0 >> 0x20);
          uStack_2088._0_4_ = (float)uStack_37e8;
          uStack_2088._4_4_ = (float)((ulong)uStack_37e8 >> 0x20);
          local_2670 = (float)local_2090 * local_2790;
          fStack_266c = local_2090._4_4_ * local_2790;
          fStack_2668 = (float)uStack_2088 * local_2790;
          fStack_2664 = uStack_2088._4_4_ * local_2790;
          uVar9 = local_3760;
          uVar10 = uStack_3758;
          local_2680._0_4_ = (float)local_3760;
          local_2680._4_4_ = (float)((ulong)local_3760 >> 0x20);
          uStack_2678._0_4_ = (float)uStack_3758;
          uStack_2678._4_4_ = (float)((ulong)uStack_3758 >> 0x20);
          local_3760 = CONCAT44(fStack_266c + local_2680._4_4_,local_2670 + (float)local_2680);
          uStack_3758 = CONCAT44(fStack_2664 + uStack_2678._4_4_,fStack_2668 + (float)uStack_2678);
          local_26a0 = &local_3800;
          local_26a8 = &local_37c0;
          local_26b0 = &local_3770;
          local_2070._0_4_ = (float)local_3800;
          local_2070._4_4_ = (float)((ulong)local_3800 >> 0x20);
          uStack_2068._0_4_ = (float)uStack_37f8;
          uStack_2068._4_4_ = (float)((ulong)uStack_37f8 >> 0x20);
          local_2650 = (float)local_2070 * local_27b0;
          fStack_264c = local_2070._4_4_ * local_27b0;
          fStack_2648 = (float)uStack_2068 * local_27b0;
          fStack_2644 = uStack_2068._4_4_ * local_27b0;
          uVar11 = local_3770;
          uVar12 = uStack_3768;
          local_2660._0_4_ = (float)local_3770;
          local_2660._4_4_ = (float)((ulong)local_3770 >> 0x20);
          uStack_2658._0_4_ = (float)uStack_3768;
          uStack_2658._4_4_ = (float)((ulong)uStack_3768 >> 0x20);
          local_3770 = CONCAT44(fStack_264c + local_2660._4_4_,local_2650 + (float)local_2660);
          uStack_3768 = CONCAT44(fStack_2644 + uStack_2658._4_4_,fStack_2648 + (float)uStack_2658);
          local_26b8 = &local_3810;
          local_26c0 = &local_37d0;
          local_26c8 = &local_3780;
          local_2050._0_4_ = (float)local_3810;
          local_2050._4_4_ = (float)((ulong)local_3810 >> 0x20);
          uStack_2048._0_4_ = (float)uStack_3808;
          uStack_2048._4_4_ = (float)((ulong)uStack_3808 >> 0x20);
          local_2630 = (float)local_2050 * local_27d0;
          fStack_262c = local_2050._4_4_ * local_27d0;
          fStack_2628 = (float)uStack_2048 * local_27d0;
          fStack_2624 = uStack_2048._4_4_ * local_27d0;
          uVar13 = local_3780;
          uVar14 = uStack_3778;
          local_2640._0_4_ = (float)local_3780;
          local_2640._4_4_ = (float)((ulong)local_3780 >> 0x20);
          uStack_2638._0_4_ = (float)uStack_3778;
          uStack_2638._4_4_ = (float)((ulong)uStack_3778 >> 0x20);
          local_3780 = CONCAT44(fStack_262c + local_2640._4_4_,local_2630 + (float)local_2640);
          uStack_3778 = CONCAT44(fStack_2624 + uStack_2638._4_4_,fStack_2628 + (float)uStack_2638);
          local_26d0 = &local_3820;
          local_26d8 = &local_37e0;
          local_26e0 = &local_3790;
          local_2030._0_4_ = (float)local_3820;
          local_2030._4_4_ = (float)((ulong)local_3820 >> 0x20);
          uStack_2028._0_4_ = (float)uStack_3818;
          uStack_2028._4_4_ = (float)((ulong)uStack_3818 >> 0x20);
          local_2610 = (float)local_2030 * local_27f0;
          fStack_260c = local_2030._4_4_ * local_27f0;
          fStack_2608 = (float)uStack_2028 * local_27f0;
          fStack_2604 = uStack_2028._4_4_ * local_27f0;
          uVar15 = local_3790;
          uVar16 = uStack_3788;
          local_2620._0_4_ = (float)local_3790;
          local_2620._4_4_ = (float)((ulong)local_3790 >> 0x20);
          uStack_2618._0_4_ = (float)uStack_3788;
          uStack_2618._4_4_ = (float)((ulong)uStack_3788 >> 0x20);
          local_3790 = CONCAT44(fStack_260c + local_2620._4_4_,local_2610 + (float)local_2620);
          uStack_3788 = CONCAT44(fStack_2604 + uStack_2618._4_4_,fStack_2608 + (float)uStack_2618);
          local_3798 = local_3798 + 4;
          local_3740 = local_3740 + 8;
          fStack_27ec = local_27f0;
          fStack_27e8 = local_27f0;
          fStack_27e4 = local_27f0;
          local_27dc = local_27f0;
          fStack_27cc = local_27d0;
          fStack_27c8 = local_27d0;
          fStack_27c4 = local_27d0;
          local_27bc = local_27d0;
          fStack_27ac = local_27b0;
          fStack_27a8 = local_27b0;
          fStack_27a4 = local_27b0;
          local_279c = local_27b0;
          fStack_278c = local_2790;
          fStack_2788 = local_2790;
          fStack_2784 = local_2790;
          local_277c = local_2790;
          local_2680 = uVar9;
          uStack_2678 = uVar10;
          local_2660 = uVar11;
          uStack_2658 = uVar12;
          local_2640 = uVar13;
          uStack_2638 = uVar14;
          local_2620 = uVar15;
          uStack_2618 = uVar16;
          local_20a0 = local_37b0;
          uStack_2098 = uStack_37a8;
          local_2090 = local_37f0;
          uStack_2088 = uStack_37e8;
          local_2080 = local_37c0;
          uStack_2078 = uStack_37b8;
          local_2070 = local_3800;
          uStack_2068 = uStack_37f8;
          local_2060 = local_37d0;
          uStack_2058 = uStack_37c8;
          local_2050 = local_3810;
          uStack_2048 = uStack_3808;
          local_2040 = local_37e0;
          uStack_2038 = uStack_37d8;
          local_2030 = local_3820;
          uStack_2028 = uStack_3818;
        }
        for (; local_379c < local_32ec; local_379c = local_379c + 1) {
          local_27f8 = local_3798;
          local_2810 = *local_3798;
          local_3830 = CONCAT44(local_2810,local_2810);
          uStack_3828 = CONCAT44(local_2810,local_2810);
          local_2910 = local_3740;
          local_3840 = *local_3740;
          uStack_3838 = local_3740[1];
          local_26e8 = &local_3840;
          local_26f0 = &local_3830;
          local_26f8 = &local_3760;
          local_2010._0_4_ = (float)local_3840;
          local_2010._4_4_ = (float)((ulong)local_3840 >> 0x20);
          uStack_2008._0_4_ = (float)uStack_3838;
          uStack_2008._4_4_ = (float)((ulong)uStack_3838 >> 0x20);
          local_25f0 = (float)local_2010 * local_2810;
          fStack_25ec = local_2010._4_4_ * local_2810;
          fStack_25e8 = (float)uStack_2008 * local_2810;
          fStack_25e4 = uStack_2008._4_4_ * local_2810;
          uVar9 = local_3760;
          uVar10 = uStack_3758;
          local_2600._0_4_ = (float)local_3760;
          local_2600._4_4_ = (float)((ulong)local_3760 >> 0x20);
          uStack_25f8._0_4_ = (float)uStack_3758;
          uStack_25f8._4_4_ = (float)((ulong)uStack_3758 >> 0x20);
          local_3760 = CONCAT44(fStack_25ec + local_2600._4_4_,local_25f0 + (float)local_2600);
          uStack_3758 = CONCAT44(fStack_25e4 + uStack_25f8._4_4_,fStack_25e8 + (float)uStack_25f8);
          local_3798 = local_3798 + 1;
          local_3740 = local_3740 + 2;
          fStack_280c = local_2810;
          fStack_2808 = local_2810;
          fStack_2804 = local_2810;
          local_27fc = local_2810;
          local_2600 = uVar9;
          uStack_25f8 = uVar10;
          local_2020 = local_3830;
          uStack_2018 = uStack_3828;
          local_2010 = local_3840;
          uStack_2008 = uStack_3838;
        }
        local_2cf0 = weight_hr;
        local_3848 = (float *)weight_hr->data;
        local_379c = 0;
        while( true ) {
          local_24e0._0_4_ = (float)local_3770;
          local_24e0._4_4_ = (float)((ulong)local_3770 >> 0x20);
          uStack_24d8._0_4_ = (float)uStack_3768;
          uStack_24d8._4_4_ = (float)((ulong)uStack_3768 >> 0x20);
          local_24f0._0_4_ = (float)local_3780;
          local_24f0._4_4_ = (float)((ulong)local_3780 >> 0x20);
          uStack_24e8._0_4_ = (float)uStack_3778;
          uStack_24e8._4_4_ = (float)((ulong)uStack_3778 >> 0x20);
          local_2500._0_4_ = (float)local_3790;
          local_2500._4_4_ = (float)((ulong)local_3790 >> 0x20);
          uStack_24f8._0_4_ = (float)uStack_3788;
          uStack_24f8._4_4_ = (float)((ulong)uStack_3788 >> 0x20);
          if (local_32f4 <= local_379c + 3) break;
          local_2818 = local_3848;
          local_2830 = *local_3848;
          local_3860 = CONCAT44(local_2830,local_2830);
          uStack_3858 = CONCAT44(local_2830,local_2830);
          local_2838 = local_3848 + 1;
          local_2850 = *local_2838;
          local_3870 = CONCAT44(local_2850,local_2850);
          uStack_3868 = CONCAT44(local_2850,local_2850);
          local_2858 = local_3848 + 2;
          local_2870 = *local_2858;
          local_3880 = CONCAT44(local_2870,local_2870);
          uStack_3878 = CONCAT44(local_2870,local_2870);
          local_2878 = local_3848 + 3;
          local_2890 = *local_2878;
          local_3890 = CONCAT44(local_2890,local_2890);
          uStack_3888 = CONCAT44(local_2890,local_2890);
          local_2918 = local_3748;
          local_38a0 = *local_3748;
          uStack_3898 = local_3748[1];
          local_2920 = local_3748 + 2;
          local_38b0 = *local_2920;
          uStack_38a8 = local_3748[3];
          local_2928 = local_3748 + 4;
          local_38c0 = *local_2928;
          uStack_38b8 = local_3748[5];
          local_2930 = local_3748 + 6;
          local_38d0 = *local_2930;
          uStack_38c8 = local_3748[7];
          local_2700 = &local_38a0;
          local_2708 = &local_3860;
          local_2710 = &local_3760;
          local_1ff0._0_4_ = (float)local_38a0;
          local_1ff0._4_4_ = (float)((ulong)local_38a0 >> 0x20);
          uStack_1fe8._0_4_ = (float)uStack_3898;
          uStack_1fe8._4_4_ = (float)((ulong)uStack_3898 >> 0x20);
          local_25d0 = (float)local_1ff0 * local_2830;
          fStack_25cc = local_1ff0._4_4_ * local_2830;
          fStack_25c8 = (float)uStack_1fe8 * local_2830;
          fStack_25c4 = uStack_1fe8._4_4_ * local_2830;
          uVar9 = local_3760;
          uVar10 = uStack_3758;
          local_25e0._0_4_ = (float)local_3760;
          local_25e0._4_4_ = (float)((ulong)local_3760 >> 0x20);
          uStack_25d8._0_4_ = (float)uStack_3758;
          uStack_25d8._4_4_ = (float)((ulong)uStack_3758 >> 0x20);
          local_3760 = CONCAT44(fStack_25cc + local_25e0._4_4_,local_25d0 + (float)local_25e0);
          uStack_3758 = CONCAT44(fStack_25c4 + uStack_25d8._4_4_,fStack_25c8 + (float)uStack_25d8);
          local_2718 = &local_38b0;
          local_2720 = &local_3870;
          local_2728 = &local_3770;
          local_1fd0._0_4_ = (float)local_38b0;
          local_1fd0._4_4_ = (float)((ulong)local_38b0 >> 0x20);
          uStack_1fc8._0_4_ = (float)uStack_38a8;
          uStack_1fc8._4_4_ = (float)((ulong)uStack_38a8 >> 0x20);
          local_25b0 = (float)local_1fd0 * local_2850;
          fStack_25ac = local_1fd0._4_4_ * local_2850;
          fStack_25a8 = (float)uStack_1fc8 * local_2850;
          fStack_25a4 = uStack_1fc8._4_4_ * local_2850;
          local_25c0 = local_3770;
          uStack_25b8 = uStack_3768;
          local_3770 = CONCAT44(fStack_25ac + local_24e0._4_4_,local_25b0 + (float)local_24e0);
          uStack_3768 = CONCAT44(fStack_25a4 + uStack_24d8._4_4_,fStack_25a8 + (float)uStack_24d8);
          local_2730 = &local_38c0;
          local_2738 = &local_3880;
          local_2740 = &local_3780;
          local_1fb0._0_4_ = (float)local_38c0;
          local_1fb0._4_4_ = (float)((ulong)local_38c0 >> 0x20);
          uStack_1fa8._0_4_ = (float)uStack_38b8;
          uStack_1fa8._4_4_ = (float)((ulong)uStack_38b8 >> 0x20);
          local_2590 = (float)local_1fb0 * local_2870;
          fStack_258c = local_1fb0._4_4_ * local_2870;
          fStack_2588 = (float)uStack_1fa8 * local_2870;
          fStack_2584 = uStack_1fa8._4_4_ * local_2870;
          local_25a0 = local_3780;
          uStack_2598 = uStack_3778;
          local_3780 = CONCAT44(fStack_258c + local_24f0._4_4_,local_2590 + (float)local_24f0);
          uStack_3778 = CONCAT44(fStack_2584 + uStack_24e8._4_4_,fStack_2588 + (float)uStack_24e8);
          local_2748 = &local_38d0;
          local_2750 = &local_3890;
          local_2758 = &local_3790;
          local_1f90._0_4_ = (float)local_38d0;
          local_1f90._4_4_ = (float)((ulong)local_38d0 >> 0x20);
          uStack_1f88._0_4_ = (float)uStack_38c8;
          uStack_1f88._4_4_ = (float)((ulong)uStack_38c8 >> 0x20);
          local_2570 = (float)local_1f90 * local_2890;
          fStack_256c = local_1f90._4_4_ * local_2890;
          fStack_2568 = (float)uStack_1f88 * local_2890;
          fStack_2564 = uStack_1f88._4_4_ * local_2890;
          local_2580 = local_3790;
          uStack_2578 = uStack_3788;
          local_3790 = CONCAT44(fStack_256c + local_2500._4_4_,local_2570 + (float)local_2500);
          uStack_3788 = CONCAT44(fStack_2564 + uStack_24f8._4_4_,fStack_2568 + (float)uStack_24f8);
          local_3848 = local_3848 + 4;
          local_3748 = local_3748 + 8;
          local_379c = local_379c + 4;
          fStack_288c = local_2890;
          fStack_2888 = local_2890;
          fStack_2884 = local_2890;
          local_287c = local_2890;
          fStack_286c = local_2870;
          fStack_2868 = local_2870;
          fStack_2864 = local_2870;
          local_285c = local_2870;
          fStack_284c = local_2850;
          fStack_2848 = local_2850;
          fStack_2844 = local_2850;
          local_283c = local_2850;
          fStack_282c = local_2830;
          fStack_2828 = local_2830;
          fStack_2824 = local_2830;
          local_281c = local_2830;
          local_25e0 = uVar9;
          uStack_25d8 = uVar10;
          local_2000 = local_3860;
          uStack_1ff8 = uStack_3858;
          local_1ff0 = local_38a0;
          uStack_1fe8 = uStack_3898;
          local_1fe0 = local_3870;
          uStack_1fd8 = uStack_3868;
          local_1fd0 = local_38b0;
          uStack_1fc8 = uStack_38a8;
          local_1fc0 = local_3880;
          uStack_1fb8 = uStack_3878;
          local_1fb0 = local_38c0;
          uStack_1fa8 = uStack_38b8;
          local_1fa0 = local_3890;
          uStack_1f98 = uStack_3888;
          local_1f90 = local_38d0;
          uStack_1f88 = uStack_38c8;
        }
        while( true ) {
          local_24d0._0_4_ = (float)local_3760;
          local_24d0._4_4_ = (float)((ulong)local_3760 >> 0x20);
          uStack_24c8._0_4_ = (float)uStack_3758;
          uStack_24c8._4_4_ = (float)((ulong)uStack_3758 >> 0x20);
          if (local_32f4 <= local_379c) break;
          local_2898 = local_3848;
          local_28b0 = *local_3848;
          local_38e0 = CONCAT44(local_28b0,local_28b0);
          uStack_38d8 = CONCAT44(local_28b0,local_28b0);
          local_2938 = local_3748;
          local_38f0 = *local_3748;
          uStack_38e8 = local_3748[1];
          local_2760 = &local_38f0;
          local_2768 = &local_38e0;
          local_2770 = &local_3760;
          local_1f70._0_4_ = (float)local_38f0;
          local_1f70._4_4_ = (float)((ulong)local_38f0 >> 0x20);
          uStack_1f68._0_4_ = (float)uStack_38e8;
          uStack_1f68._4_4_ = (float)((ulong)uStack_38e8 >> 0x20);
          local_2550 = (float)local_1f70 * local_28b0;
          fStack_254c = local_1f70._4_4_ * local_28b0;
          fStack_2548 = (float)uStack_1f68 * local_28b0;
          fStack_2544 = uStack_1f68._4_4_ * local_28b0;
          local_2560 = local_3760;
          uStack_2558 = uStack_3758;
          local_3760 = CONCAT44(fStack_254c + local_24d0._4_4_,local_2550 + (float)local_24d0);
          uStack_3758 = CONCAT44(fStack_2544 + uStack_24c8._4_4_,fStack_2548 + (float)uStack_24c8);
          local_3848 = local_3848 + 1;
          local_3748 = local_3748 + 2;
          local_379c = local_379c + 1;
          fStack_28ac = local_28b0;
          fStack_28a8 = local_28b0;
          fStack_28a4 = local_28b0;
          local_289c = local_28b0;
          local_1f80 = local_38e0;
          uStack_1f78 = uStack_38d8;
          local_1f70 = local_38f0;
          uStack_1f68 = uStack_38e8;
        }
        local_31e4 = local_372c;
        local_31e0 = &local_3340;
        local_2430 = (undefined1 (*) [16])
                     ((long)local_3340 + (long)local_3314 * (long)local_372c * local_3330);
        uVar9 = local_3760;
        uVar10 = uStack_3758;
        local_2510._4_4_ = local_24d0._4_4_ + local_24e0._4_4_;
        local_2510._0_4_ = (float)local_24d0 + (float)local_24e0;
        local_2510._12_4_ = uStack_24c8._4_4_ + uStack_24d8._4_4_;
        local_2510._8_4_ = (float)uStack_24c8 + (float)uStack_24d8;
        uVar11 = local_3780;
        uVar12 = uStack_3778;
        local_3780 = CONCAT44(local_24f0._4_4_ + local_2500._4_4_,
                              (float)local_24f0 + (float)local_2500);
        uStack_3778 = CONCAT44(uStack_24e8._4_4_ + uStack_24f8._4_4_,
                               (float)uStack_24e8 + (float)uStack_24f8);
        local_3760 = CONCAT44(local_24d0._4_4_ + local_24e0._4_4_ +
                              local_24f0._4_4_ + local_2500._4_4_,
                              (float)local_24d0 + (float)local_24e0 +
                              (float)local_24f0 + (float)local_2500);
        uStack_3758 = CONCAT44(uStack_24c8._4_4_ + uStack_24d8._4_4_ +
                               uStack_24e8._4_4_ + uStack_24f8._4_4_,
                               (float)uStack_24c8 + (float)uStack_24d8 +
                               (float)uStack_24e8 + (float)uStack_24f8);
        auVar4._8_8_ = uStack_3758;
        auVar4._0_8_ = local_3760;
        *local_2430 = auVar4;
        local_28e8 = local_3738;
        local_28e0 = ZEXT816(0) << 0x20;
        local_28d0 = ZEXT816(0) << 0x20;
        local_28c0 = ZEXT816(0) << 0x20;
        local_2520 = local_3780;
        uStack_2518 = uStack_3778;
        local_2500 = local_3790;
        uStack_24f8 = uStack_3788;
        local_24f0 = uVar11;
        uStack_24e8 = uVar12;
        local_24e0 = local_3770;
        uStack_24d8 = uStack_3768;
        local_24d0 = uVar9;
        uStack_24c8 = uVar10;
        local_2440 = local_3760;
        uStack_2438 = uStack_3758;
      }
      local_31f0 = local_32c8;
      local_31f4 = local_3aa4;
      lVar118 = *local_32c8 +
                (long)*(int *)((long)local_32c8 + 0x2c) * (long)local_3aa4 * local_32c8[2];
      local_2418 = hidden_state;
      pvVar1 = hidden_state->data;
      local_2420 = weight_hr;
      pvVar2 = weight_hr->data;
      local_2428 = &local_3398;
      local_33a4 = local_32f8 >> 2;
      local_3a14 = local_33a4 << 2;
      for (local_391c = 0; local_33a8 = local_3a14, local_391c < local_33a4;
          local_391c = local_391c + 1) {
        local_3204 = local_391c << 2;
        local_3200 = &local_3340;
        local_2940 = (undefined1 (*) [16])
                     ((long)local_3340 + (long)local_3314 * (long)local_3204 * local_3330);
        local_23e0 = *(undefined8 *)*local_2940;
        uStack_23d8 = *(undefined8 *)(*local_2940 + 8);
        local_2948 = local_2940 + 1;
        local_23f0 = *(undefined8 *)*local_2948;
        uStack_23e8 = *(undefined8 *)(local_2940[1] + 8);
        local_2950 = local_2940 + 2;
        local_2400 = *(undefined8 *)*local_2950;
        uStack_23f8 = *(undefined8 *)(local_2940[2] + 8);
        local_2958 = local_2940 + 3;
        local_2410 = *(undefined8 *)*local_2958;
        uStack_2408 = *(undefined8 *)(local_2940[3] + 8);
        auVar7 = vunpcklps_avx(*local_2940,*local_2948);
        local_4270 = auVar7._0_8_;
        uStack_4268 = auVar7._8_8_;
        auVar8 = vunpcklps_avx(*local_2950,*local_2958);
        local_4280 = auVar8._0_8_;
        uStack_4278 = auVar8._8_8_;
        auVar4 = vunpckhps_avx(*local_2940,*local_2948);
        local_4290 = auVar4._0_8_;
        uStack_4288 = auVar4._8_8_;
        auVar5 = vunpckhps_avx(*local_2950,*local_2958);
        local_42a0 = auVar5._0_8_;
        uStack_4298 = auVar5._8_8_;
        local_2360 = local_4270;
        uStack_2358 = uStack_4268;
        local_2370 = local_4280;
        uStack_2368 = uStack_4278;
        auVar6 = vunpcklpd_avx(auVar7,auVar8);
        local_42b0 = auVar6._0_8_;
        uStack_42a8 = auVar6._8_8_;
        local_2320 = local_4280;
        uStack_2318 = uStack_4278;
        local_2330 = local_4270;
        uStack_2328 = uStack_4268;
        auVar7 = vunpckhpd_avx(auVar7,auVar8);
        local_42c0 = auVar7._0_8_;
        uStack_42b8 = auVar7._8_8_;
        local_2380 = local_4290;
        uStack_2378 = uStack_4288;
        local_2390 = local_42a0;
        uStack_2388 = uStack_4298;
        auVar8 = vunpcklpd_avx(auVar4,auVar5);
        local_42d0 = auVar8._0_8_;
        uStack_42c8 = auVar8._8_8_;
        local_2340 = local_42a0;
        uStack_2338 = uStack_4298;
        local_2350 = local_4290;
        uStack_2348 = uStack_4288;
        auVar3 = vunpckhpd_avx(auVar4,auVar5);
        local_42e0 = auVar3._0_8_;
        uStack_42d8 = auVar3._8_8_;
        local_2260 = local_42b0;
        uStack_2258 = uStack_42a8;
        local_1b94 = 0x3f800000;
        local_1bb0 = 0x3f800000;
        uStack_1bac = 0x3f800000;
        uStack_1ba8 = 0x3f800000;
        uStack_1ba4 = 0x3f800000;
        local_2270 = 0x3f8000003f800000;
        uStack_2268 = 0x3f8000003f800000;
        local_13b0 = ZEXT816(0) << 0x20;
        local_2250._8_8_ = SUB168(ZEXT816(0),4);
        local_940 = 0;
        uStack_938 = local_2250._8_8_;
        local_950 = local_42b0;
        uStack_948 = uStack_42a8;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = local_2250._8_8_;
        auVar4 = vsubps_avx(auVar100 << 0x40,auVar6);
        local_1400 = 0x3f8000003f800000;
        uStack_13f8 = 0x3f8000003f800000;
        local_13c0._0_8_ = auVar4._0_8_;
        local_13c0._8_8_ = auVar4._8_8_;
        local_8a0 = local_13c0._0_8_;
        uStack_898 = local_13c0._8_8_;
        local_8b0 = 0x42b0c0a542b0c0a5;
        uStack_8a8 = 0x42b0c0a542b0c0a5;
        auVar57._8_8_ = 0x42b0c0a542b0c0a5;
        auVar57._0_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar57);
        local_13c0._0_8_ = auVar4._0_8_;
        local_13c0._8_8_ = auVar4._8_8_;
        local_800 = local_13c0._0_8_;
        uStack_7f8 = local_13c0._8_8_;
        local_810 = 0xc2b0c0a5c2b0c0a5;
        uStack_808 = 0xc2b0c0a5c2b0c0a5;
        auVar62._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar6 = vmaxps_avx(auVar4,auVar62);
        local_13c0._0_8_ = auVar6._0_8_;
        local_13c0._8_8_ = auVar6._8_8_;
        local_1100 = local_13c0._0_8_;
        uVar39 = local_1100;
        uStack_10f8 = local_13c0._8_8_;
        uVar40 = uStack_10f8;
        local_1110 = 0x3fb8aa3b3fb8aa3b;
        uStack_1108 = 0x3fb8aa3b3fb8aa3b;
        local_1100._0_4_ = auVar6._0_4_;
        local_1100._4_4_ = auVar6._4_4_;
        uStack_10f8._0_4_ = auVar6._8_4_;
        uStack_10f8._4_4_ = auVar6._12_4_;
        local_13e0._4_4_ = local_1100._4_4_ * 1.442695;
        local_13e0._0_4_ = (float)local_1100 * 1.442695;
        uStack_13d8._0_4_ = (float)uStack_10f8 * 1.442695;
        uStack_13d8._4_4_ = uStack_10f8._4_4_ * 1.442695;
        local_1220 = local_13e0;
        uStack_1218 = uStack_13d8;
        local_1230 = 0x3f0000003f000000;
        uStack_1228 = 0x3f0000003f000000;
        local_13e0._0_4_ = (float)local_1100 * 1.442695 + 0.5;
        local_13e0._4_4_ = local_1100._4_4_ * 1.442695 + 0.5;
        fVar122 = (float)uStack_10f8 * 1.442695 + 0.5;
        fVar123 = uStack_10f8._4_4_ * 1.442695 + 0.5;
        uStack_13d8._0_4_ = fVar122;
        uStack_13d8._4_4_ = fVar123;
        local_760 = local_13e0;
        uStack_758 = uStack_13d8;
        local_13f0._4_4_ = (int)(float)local_13e0._4_4_;
        local_13f0._0_4_ = (int)(float)local_13e0._0_4_;
        local_13f0._8_4_ = (int)fVar122;
        local_13f0._12_4_ = (int)fVar123;
        local_6f0 = local_13f0._0_8_;
        uStack_6e8 = local_13f0._8_8_;
        auVar67._8_8_ = local_13f0._8_8_;
        auVar67._0_8_ = local_13f0._0_8_;
        auVar5 = vcvtdq2ps_avx(auVar67);
        local_13d0 = auVar5._0_8_;
        uStack_13c8 = auVar5._8_8_;
        local_670 = local_13d0;
        uStack_668 = uStack_13c8;
        local_680 = local_13e0;
        uStack_678 = uStack_13d8;
        auVar72._8_8_ = uStack_13d8;
        auVar72._0_8_ = local_13e0;
        auVar4 = vcmpps_avx(auVar72,auVar5,1);
        local_1410._0_8_ = auVar4._0_8_;
        local_1410._8_8_ = auVar4._8_8_;
        local_5d0 = local_1410._0_8_;
        uStack_5c8 = local_1410._8_8_;
        local_5e0 = 0x3f8000003f800000;
        uStack_5d8 = 0x3f8000003f800000;
        auVar77._8_8_ = 0x3f8000003f800000;
        auVar77._0_8_ = 0x3f8000003f800000;
        local_1410 = vpand_avx(auVar4,auVar77);
        local_a20 = local_13d0;
        uStack_a18 = uStack_13c8;
        local_a30 = local_1410._0_8_;
        uStack_a28 = local_1410._8_8_;
        _local_13e0 = vsubps_avx(auVar5,local_1410);
        local_388 = local_13e0;
        local_390 = ::_ps_cephes_exp_C1;
        local_398 = local_13c0;
        local_350 = local_13c0._0_8_;
        uStack_348 = local_13c0._8_8_;
        local_380[0] = 0.6933594;
        local_380[1] = 0.6933594;
        afStack_378[0] = 0.6933594;
        afStack_378[1] = 0.6933594;
        local_370._0_4_ = local_13e0._0_4_;
        local_370._4_4_ = local_13e0._4_4_;
        uStack_368._0_4_ = local_13e0._8_4_;
        uStack_368._4_4_ = local_13e0._12_4_;
        local_360 = (float)local_370 * 0.6933594;
        fStack_35c = local_370._4_4_ * 0.6933594;
        fStack_358 = (float)uStack_368 * 0.6933594;
        fStack_354 = uStack_368._4_4_ * 0.6933594;
        auVar85._4_4_ = fStack_35c;
        auVar85._0_4_ = local_360;
        auVar85._8_4_ = fStack_358;
        auVar85._12_4_ = fStack_354;
        auVar4 = vsubps_avx(auVar6,auVar85);
        local_3e8 = local_13e0;
        local_3f0 = ::_ps_cephes_exp_C2;
        local_3f8 = local_13c0;
        local_13c0._0_8_ = auVar4._0_8_;
        local_3b0 = local_13c0._0_8_;
        local_13c0._8_8_ = auVar4._8_8_;
        uStack_3a8 = local_13c0._8_8_;
        local_3d0 = local_13e0;
        uStack_3c8 = uStack_13d8;
        local_3e0[0] = -0.00021219444;
        local_3e0[1] = -0.00021219444;
        afStack_3d8[0] = -0.00021219444;
        afStack_3d8[1] = -0.00021219444;
        local_3c0 = (float)local_370 * -0.00021219444;
        fStack_3bc = local_370._4_4_ * -0.00021219444;
        fStack_3b8 = (float)uStack_368 * -0.00021219444;
        fStack_3b4 = uStack_368._4_4_ * -0.00021219444;
        auVar84._4_4_ = fStack_3bc;
        auVar84._0_4_ = local_3c0;
        auVar84._8_4_ = fStack_3b8;
        auVar84._12_4_ = fStack_3b4;
        local_13c0 = vsubps_avx(auVar4,auVar84);
        local_4320 = local_13c0._0_8_;
        uStack_4318 = local_13c0._8_8_;
        local_1120 = local_4320;
        uVar37 = local_1120;
        uStack_1118 = uStack_4318;
        uVar38 = uStack_1118;
        local_1130 = local_4320;
        uStack_1128 = uStack_4318;
        local_1120._0_4_ = local_13c0._0_4_;
        local_1120._4_4_ = local_13c0._4_4_;
        uStack_1118._0_4_ = local_13c0._8_4_;
        uStack_1118._4_4_ = local_13c0._12_4_;
        local_13d0 = CONCAT44(local_1120._4_4_ * local_1120._4_4_,
                              (float)local_1120 * (float)local_1120);
        uStack_13c8._0_4_ = (float)uStack_1118 * (float)uStack_1118;
        uStack_13c8._4_4_ = uStack_1118._4_4_ * uStack_1118._4_4_;
        local_1390 = &local_1420;
        local_13a0 = local_13c0;
        local_1328 = ::_ps_cephes_exp_p1;
        local_1200 = 0x3950696739506967;
        uStack_11f8 = 0x3950696739506967;
        local_1210 = local_4320;
        uStack_1208 = uStack_4318;
        local_1300 = (float)local_1120 * 0.00019875691;
        fStack_12fc = local_1120._4_4_ * 0.00019875691;
        fStack_12f8 = (float)uStack_1118 * 0.00019875691;
        fStack_12f4 = uStack_1118._4_4_ * 0.00019875691;
        local_1310[0] = 0.0013981999;
        local_1310[1] = 0.0013981999;
        afStack_1308[0] = 0.0013981999;
        afStack_1308[1] = 0.0013981999;
        local_1420 = CONCAT44(fStack_12fc + 0.0013981999,local_1300 + 0.0013981999);
        uStack_1418 = CONCAT44(fStack_12f4 + 0.0013981999,fStack_12f8 + 0.0013981999);
        local_1340 = ::_ps_cephes_exp_p2;
        local_11e0 = local_1420;
        uStack_11d8 = uStack_1418;
        local_11f0 = local_4320;
        uStack_11e8 = uStack_4318;
        local_12e0 = (local_1300 + 0.0013981999) * (float)local_1120;
        fStack_12dc = (fStack_12fc + 0.0013981999) * local_1120._4_4_;
        fStack_12d8 = (fStack_12f8 + 0.0013981999) * (float)uStack_1118;
        fStack_12d4 = (fStack_12f4 + 0.0013981999) * uStack_1118._4_4_;
        local_12f0[0] = 0.008333452;
        local_12f0[1] = 0.008333452;
        afStack_12e8[0] = 0.008333452;
        afStack_12e8[1] = 0.008333452;
        local_1420 = CONCAT44(fStack_12dc + 0.008333452,local_12e0 + 0.008333452);
        uStack_1418 = CONCAT44(fStack_12d4 + 0.008333452,fStack_12d8 + 0.008333452);
        local_1358 = ::_ps_cephes_exp_p3;
        local_11c0 = local_1420;
        uStack_11b8 = uStack_1418;
        local_11d0 = local_4320;
        uStack_11c8 = uStack_4318;
        local_12c0 = (local_12e0 + 0.008333452) * (float)local_1120;
        fStack_12bc = (fStack_12dc + 0.008333452) * local_1120._4_4_;
        fStack_12b8 = (fStack_12d8 + 0.008333452) * (float)uStack_1118;
        fStack_12b4 = (fStack_12d4 + 0.008333452) * uStack_1118._4_4_;
        local_12d0[0] = 0.041665796;
        local_12d0[1] = 0.041665796;
        afStack_12c8[0] = 0.041665796;
        afStack_12c8[1] = 0.041665796;
        local_1420 = CONCAT44(fStack_12bc + 0.041665796,local_12c0 + 0.041665796);
        uStack_1418 = CONCAT44(fStack_12b4 + 0.041665796,fStack_12b8 + 0.041665796);
        local_1370 = ::_ps_cephes_exp_p4;
        local_11a0 = local_1420;
        uStack_1198 = uStack_1418;
        local_11b0 = local_4320;
        uStack_11a8 = uStack_4318;
        local_12a0 = (local_12c0 + 0.041665796) * (float)local_1120;
        fStack_129c = (fStack_12bc + 0.041665796) * local_1120._4_4_;
        fStack_1298 = (fStack_12b8 + 0.041665796) * (float)uStack_1118;
        fStack_1294 = (fStack_12b4 + 0.041665796) * uStack_1118._4_4_;
        local_12b0[0] = 0.16666666;
        local_12b0[1] = 0.16666666;
        afStack_12a8[0] = 0.16666666;
        afStack_12a8[1] = 0.16666666;
        local_1420 = CONCAT44(fStack_129c + 0.16666666,local_12a0 + 0.16666666);
        uStack_1418 = CONCAT44(fStack_1294 + 0.16666666,fStack_1298 + 0.16666666);
        local_1388 = ::_ps_cephes_exp_p5;
        local_1180 = local_1420;
        uStack_1178 = uStack_1418;
        local_1190 = local_4320;
        uStack_1188 = uStack_4318;
        local_1280 = (local_12a0 + 0.16666666) * (float)local_1120;
        fStack_127c = (fStack_129c + 0.16666666) * local_1120._4_4_;
        fStack_1278 = (fStack_1298 + 0.16666666) * (float)uStack_1118;
        fStack_1274 = (fStack_1294 + 0.16666666) * uStack_1118._4_4_;
        local_1290[0] = 0.5;
        local_1290[1] = 0.5;
        afStack_1288[0] = 0.5;
        afStack_1288[1] = 0.5;
        local_1420 = CONCAT44(fStack_127c + 0.5,local_1280 + 0.5);
        uStack_1418 = CONCAT44(fStack_1274 + 0.5,fStack_1278 + 0.5);
        local_1398 = &local_13d0;
        local_1160 = local_1420;
        uStack_1158 = uStack_1418;
        local_1170 = local_13d0;
        uStack_1168 = uStack_13c8;
        local_1260 = (local_1280 + 0.5) * (float)local_1120 * (float)local_1120;
        fStack_125c = (fStack_127c + 0.5) * local_1120._4_4_ * local_1120._4_4_;
        fStack_1258 = (fStack_1278 + 0.5) * (float)uStack_1118 * (float)uStack_1118;
        fStack_1254 = (fStack_1274 + 0.5) * uStack_1118._4_4_ * uStack_1118._4_4_;
        local_1270 = local_4320;
        uStack_1268 = uStack_4318;
        local_1420 = CONCAT44(fStack_125c + local_1120._4_4_,local_1260 + (float)local_1120);
        uStack_1418 = CONCAT44(fStack_1254 + uStack_1118._4_4_,fStack_1258 + (float)uStack_1118);
        local_1240 = local_1420;
        uStack_1238 = uStack_1418;
        local_1250 = 0x3f8000003f800000;
        uStack_1248 = 0x3f8000003f800000;
        local_1b10 = local_1260 + (float)local_1120 + 1.0;
        fStack_1b0c = fStack_125c + local_1120._4_4_ + 1.0;
        fStack_1b08 = fStack_1258 + (float)uStack_1118 + 1.0;
        fStack_1b04 = fStack_1254 + uStack_1118._4_4_ + 1.0;
        local_1420 = CONCAT44(fStack_1b0c,local_1b10);
        uStack_1418 = CONCAT44(fStack_1b04,fStack_1b08);
        local_770 = local_13e0;
        uStack_768 = uStack_13d8;
        local_13f0._4_4_ = (int)local_370._4_4_;
        local_13f0._0_4_ = (int)(float)local_370;
        local_13f0._8_4_ = (int)(float)uStack_368;
        local_13f0._12_4_ = (int)uStack_368._4_4_;
        local_170 = local_13f0._0_8_;
        uStack_168 = local_13f0._8_8_;
        local_180 = 0x7f0000007f;
        uStack_178 = 0x7f0000007f;
        auVar95._8_8_ = local_13f0._8_8_;
        auVar95._0_8_ = local_13f0._0_8_;
        auVar94._8_8_ = 0x7f0000007f;
        auVar94._0_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx(auVar95,auVar94);
        local_13f0._0_8_ = auVar4._0_8_;
        local_13f0._8_8_ = auVar4._8_8_;
        local_d0 = local_13f0._0_8_;
        uStack_c8 = local_13f0._8_8_;
        local_d4 = 0x17;
        local_13f0 = vpslld_avx(auVar4,ZEXT416(0x17));
        local_60 = local_13f0._0_8_;
        uStack_58 = local_13f0._8_8_;
        local_1430 = local_13f0._0_8_;
        uStack_1428 = local_13f0._8_8_;
        local_1140 = local_1420;
        uStack_1138 = uStack_1418;
        local_1150 = local_13f0._0_8_;
        uVar35 = local_1150;
        uStack_1148 = local_13f0._8_8_;
        uVar36 = uStack_1148;
        local_1150._0_4_ = local_13f0._0_4_;
        local_1150._4_4_ = local_13f0._4_4_;
        uStack_1148._0_4_ = local_13f0._8_4_;
        uStack_1148._4_4_ = local_13f0._12_4_;
        local_1b10 = local_1b10 * (float)local_1150;
        fStack_1b0c = fStack_1b0c * local_1150._4_4_;
        fStack_1b08 = fStack_1b08 * (float)uStack_1148;
        fStack_1b04 = fStack_1b04 * uStack_1148._4_4_;
        local_1420 = CONCAT44(fStack_1b0c,local_1b10);
        uStack_1418 = CONCAT44(fStack_1b04,fStack_1b08);
        local_2240 = local_1420;
        uStack_2238 = uStack_1418;
        local_1b10 = local_1b10 + 1.0;
        fStack_1b0c = fStack_1b0c + 1.0;
        fStack_1b08 = fStack_1b08 + 1.0;
        fStack_1b04 = fStack_1b04 + 1.0;
        auVar45._8_8_ = 0x3f8000003f800000;
        auVar45._0_8_ = 0x3f8000003f800000;
        auVar44._4_4_ = fStack_1b0c;
        auVar44._0_4_ = local_1b10;
        auVar44._8_4_ = fStack_1b08;
        auVar44._12_4_ = fStack_1b04;
        auVar6 = vdivps_avx(auVar45,auVar44);
        local_4340 = auVar6._0_8_;
        uStack_4338 = auVar6._8_8_;
        local_22b0 = local_42c0;
        uStack_22a8 = uStack_42b8;
        local_1b74 = 0x3f800000;
        local_1b90 = 0x3f800000;
        uStack_1b8c = 0x3f800000;
        uStack_1b88 = 0x3f800000;
        uStack_1b84 = 0x3f800000;
        local_22c0 = 0x3f8000003f800000;
        uStack_22b8 = 0x3f8000003f800000;
        local_1070 = ZEXT816(0) << 0x20;
        local_22a0._8_8_ = SUB168(ZEXT816(0),4);
        local_920 = 0;
        uStack_918 = local_22a0._8_8_;
        local_930 = local_42c0;
        uStack_928 = uStack_42b8;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = local_22a0._8_8_;
        auVar4 = vsubps_avx(auVar101 << 0x40,auVar7);
        local_10c0 = 0x3f8000003f800000;
        uStack_10b8 = 0x3f8000003f800000;
        local_1080._0_8_ = auVar4._0_8_;
        local_1080._8_8_ = auVar4._8_8_;
        local_8c0 = local_1080._0_8_;
        uStack_8b8 = local_1080._8_8_;
        local_8d0 = 0x42b0c0a542b0c0a5;
        uStack_8c8 = 0x42b0c0a542b0c0a5;
        auVar56._8_8_ = 0x42b0c0a542b0c0a5;
        auVar56._0_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar56);
        local_1080._0_8_ = auVar4._0_8_;
        local_1080._8_8_ = auVar4._8_8_;
        local_820 = local_1080._0_8_;
        uStack_818 = local_1080._8_8_;
        local_830 = 0xc2b0c0a5c2b0c0a5;
        uStack_828 = 0xc2b0c0a5c2b0c0a5;
        auVar61._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar7 = vmaxps_avx(auVar4,auVar61);
        local_1080._0_8_ = auVar7._0_8_;
        local_1080._8_8_ = auVar7._8_8_;
        local_dc0 = local_1080._0_8_;
        uVar110 = local_dc0;
        uStack_db8 = local_1080._8_8_;
        uVar111 = uStack_db8;
        local_dd0 = 0x3fb8aa3b3fb8aa3b;
        uStack_dc8 = 0x3fb8aa3b3fb8aa3b;
        local_dc0._0_4_ = auVar7._0_4_;
        local_dc0._4_4_ = auVar7._4_4_;
        uStack_db8._0_4_ = auVar7._8_4_;
        uStack_db8._4_4_ = auVar7._12_4_;
        local_10a0._4_4_ = local_dc0._4_4_ * 1.442695;
        local_10a0._0_4_ = (float)local_dc0 * 1.442695;
        uStack_1098._0_4_ = (float)uStack_db8 * 1.442695;
        uStack_1098._4_4_ = uStack_db8._4_4_ * 1.442695;
        local_ee0 = local_10a0;
        uStack_ed8 = uStack_1098;
        local_ef0 = 0x3f0000003f000000;
        uStack_ee8 = 0x3f0000003f000000;
        local_10a0._0_4_ = (float)local_dc0 * 1.442695 + 0.5;
        local_10a0._4_4_ = local_dc0._4_4_ * 1.442695 + 0.5;
        fVar122 = (float)uStack_db8 * 1.442695 + 0.5;
        fVar123 = uStack_db8._4_4_ * 1.442695 + 0.5;
        uStack_1098._0_4_ = fVar122;
        uStack_1098._4_4_ = fVar123;
        local_780 = local_10a0;
        uStack_778 = uStack_1098;
        local_10b0._4_4_ = (int)(float)local_10a0._4_4_;
        local_10b0._0_4_ = (int)(float)local_10a0._0_4_;
        local_10b0._8_4_ = (int)fVar122;
        local_10b0._12_4_ = (int)fVar123;
        local_700 = local_10b0._0_8_;
        uStack_6f8 = local_10b0._8_8_;
        auVar66._8_8_ = local_10b0._8_8_;
        auVar66._0_8_ = local_10b0._0_8_;
        auVar5 = vcvtdq2ps_avx(auVar66);
        local_1090 = auVar5._0_8_;
        uStack_1088 = auVar5._8_8_;
        local_690 = local_1090;
        uStack_688 = uStack_1088;
        local_6a0 = local_10a0;
        uStack_698 = uStack_1098;
        auVar71._8_8_ = uStack_1098;
        auVar71._0_8_ = local_10a0;
        auVar4 = vcmpps_avx(auVar71,auVar5,1);
        local_10d0._0_8_ = auVar4._0_8_;
        local_10d0._8_8_ = auVar4._8_8_;
        local_5f0 = local_10d0._0_8_;
        uStack_5e8 = local_10d0._8_8_;
        local_600 = 0x3f8000003f800000;
        uStack_5f8 = 0x3f8000003f800000;
        auVar76._8_8_ = 0x3f8000003f800000;
        auVar76._0_8_ = 0x3f8000003f800000;
        local_10d0 = vpand_avx(auVar4,auVar76);
        local_a40 = local_1090;
        uStack_a38 = uStack_1088;
        local_a50 = local_10d0._0_8_;
        uStack_a48 = local_10d0._8_8_;
        _local_10a0 = vsubps_avx(auVar5,local_10d0);
        local_448 = local_10a0;
        local_450 = ::_ps_cephes_exp_C1;
        local_458 = local_1080;
        local_410 = local_1080._0_8_;
        uStack_408 = local_1080._8_8_;
        local_440[0] = 0.6933594;
        local_440[1] = 0.6933594;
        afStack_438[0] = 0.6933594;
        afStack_438[1] = 0.6933594;
        local_430._0_4_ = local_10a0._0_4_;
        local_430._4_4_ = local_10a0._4_4_;
        uStack_428._0_4_ = local_10a0._8_4_;
        uStack_428._4_4_ = local_10a0._12_4_;
        local_420 = (float)local_430 * 0.6933594;
        fStack_41c = local_430._4_4_ * 0.6933594;
        fStack_418 = (float)uStack_428 * 0.6933594;
        fStack_414 = uStack_428._4_4_ * 0.6933594;
        auVar83._4_4_ = fStack_41c;
        auVar83._0_4_ = local_420;
        auVar83._8_4_ = fStack_418;
        auVar83._12_4_ = fStack_414;
        auVar4 = vsubps_avx(auVar7,auVar83);
        local_4a8 = local_10a0;
        local_4b0 = ::_ps_cephes_exp_C2;
        local_4b8 = local_1080;
        local_1080._0_8_ = auVar4._0_8_;
        local_470 = local_1080._0_8_;
        local_1080._8_8_ = auVar4._8_8_;
        uStack_468 = local_1080._8_8_;
        local_490 = local_10a0;
        uStack_488 = uStack_1098;
        local_4a0[0] = -0.00021219444;
        local_4a0[1] = -0.00021219444;
        afStack_498[0] = -0.00021219444;
        afStack_498[1] = -0.00021219444;
        local_480 = (float)local_430 * -0.00021219444;
        fStack_47c = local_430._4_4_ * -0.00021219444;
        fStack_478 = (float)uStack_428 * -0.00021219444;
        fStack_474 = uStack_428._4_4_ * -0.00021219444;
        auVar82._4_4_ = fStack_47c;
        auVar82._0_4_ = local_480;
        auVar82._8_4_ = fStack_478;
        auVar82._12_4_ = fStack_474;
        local_1080 = vsubps_avx(auVar4,auVar82);
        local_4380 = local_1080._0_8_;
        uStack_4378 = local_1080._8_8_;
        local_de0 = local_4380;
        uVar108 = local_de0;
        uStack_dd8 = uStack_4378;
        uVar109 = uStack_dd8;
        local_df0 = local_4380;
        uStack_de8 = uStack_4378;
        local_de0._0_4_ = local_1080._0_4_;
        local_de0._4_4_ = local_1080._4_4_;
        uStack_dd8._0_4_ = local_1080._8_4_;
        uStack_dd8._4_4_ = local_1080._12_4_;
        local_1090 = CONCAT44(local_de0._4_4_ * local_de0._4_4_,(float)local_de0 * (float)local_de0)
        ;
        uStack_1088._0_4_ = (float)uStack_dd8 * (float)uStack_dd8;
        uStack_1088._4_4_ = uStack_dd8._4_4_ * uStack_dd8._4_4_;
        local_1050 = &local_10e0;
        local_1060 = local_1080;
        local_fe8 = ::_ps_cephes_exp_p1;
        local_ec0 = 0x3950696739506967;
        uStack_eb8 = 0x3950696739506967;
        local_ed0 = local_4380;
        uStack_ec8 = uStack_4378;
        local_fc0 = (float)local_de0 * 0.00019875691;
        fStack_fbc = local_de0._4_4_ * 0.00019875691;
        fStack_fb8 = (float)uStack_dd8 * 0.00019875691;
        fStack_fb4 = uStack_dd8._4_4_ * 0.00019875691;
        local_fd0[0] = 0.0013981999;
        local_fd0[1] = 0.0013981999;
        afStack_fc8[0] = 0.0013981999;
        afStack_fc8[1] = 0.0013981999;
        local_10e0 = CONCAT44(fStack_fbc + 0.0013981999,local_fc0 + 0.0013981999);
        uStack_10d8 = CONCAT44(fStack_fb4 + 0.0013981999,fStack_fb8 + 0.0013981999);
        local_1000 = ::_ps_cephes_exp_p2;
        local_ea0 = local_10e0;
        uStack_e98 = uStack_10d8;
        local_eb0 = local_4380;
        uStack_ea8 = uStack_4378;
        local_fa0 = (local_fc0 + 0.0013981999) * (float)local_de0;
        fStack_f9c = (fStack_fbc + 0.0013981999) * local_de0._4_4_;
        fStack_f98 = (fStack_fb8 + 0.0013981999) * (float)uStack_dd8;
        fStack_f94 = (fStack_fb4 + 0.0013981999) * uStack_dd8._4_4_;
        local_fb0[0] = 0.008333452;
        local_fb0[1] = 0.008333452;
        afStack_fa8[0] = 0.008333452;
        afStack_fa8[1] = 0.008333452;
        local_10e0 = CONCAT44(fStack_f9c + 0.008333452,local_fa0 + 0.008333452);
        uStack_10d8 = CONCAT44(fStack_f94 + 0.008333452,fStack_f98 + 0.008333452);
        local_1018 = ::_ps_cephes_exp_p3;
        local_e80 = local_10e0;
        uStack_e78 = uStack_10d8;
        local_e90 = local_4380;
        uStack_e88 = uStack_4378;
        local_f80 = (local_fa0 + 0.008333452) * (float)local_de0;
        fStack_f7c = (fStack_f9c + 0.008333452) * local_de0._4_4_;
        fStack_f78 = (fStack_f98 + 0.008333452) * (float)uStack_dd8;
        fStack_f74 = (fStack_f94 + 0.008333452) * uStack_dd8._4_4_;
        local_f90[0] = 0.041665796;
        local_f90[1] = 0.041665796;
        afStack_f88[0] = 0.041665796;
        afStack_f88[1] = 0.041665796;
        local_10e0 = CONCAT44(fStack_f7c + 0.041665796,local_f80 + 0.041665796);
        uStack_10d8 = CONCAT44(fStack_f74 + 0.041665796,fStack_f78 + 0.041665796);
        local_1030 = ::_ps_cephes_exp_p4;
        local_e60 = local_10e0;
        uStack_e58 = uStack_10d8;
        local_e70 = local_4380;
        uStack_e68 = uStack_4378;
        local_f60 = (local_f80 + 0.041665796) * (float)local_de0;
        fStack_f5c = (fStack_f7c + 0.041665796) * local_de0._4_4_;
        fStack_f58 = (fStack_f78 + 0.041665796) * (float)uStack_dd8;
        fStack_f54 = (fStack_f74 + 0.041665796) * uStack_dd8._4_4_;
        local_f70[0] = 0.16666666;
        local_f70[1] = 0.16666666;
        afStack_f68[0] = 0.16666666;
        afStack_f68[1] = 0.16666666;
        local_10e0 = CONCAT44(fStack_f5c + 0.16666666,local_f60 + 0.16666666);
        uStack_10d8 = CONCAT44(fStack_f54 + 0.16666666,fStack_f58 + 0.16666666);
        local_1048 = ::_ps_cephes_exp_p5;
        local_e40 = local_10e0;
        uStack_e38 = uStack_10d8;
        local_e50 = local_4380;
        uStack_e48 = uStack_4378;
        local_f40 = (local_f60 + 0.16666666) * (float)local_de0;
        fStack_f3c = (fStack_f5c + 0.16666666) * local_de0._4_4_;
        fStack_f38 = (fStack_f58 + 0.16666666) * (float)uStack_dd8;
        fStack_f34 = (fStack_f54 + 0.16666666) * uStack_dd8._4_4_;
        local_f50[0] = 0.5;
        local_f50[1] = 0.5;
        afStack_f48[0] = 0.5;
        afStack_f48[1] = 0.5;
        local_10e0 = CONCAT44(fStack_f3c + 0.5,local_f40 + 0.5);
        uStack_10d8 = CONCAT44(fStack_f34 + 0.5,fStack_f38 + 0.5);
        local_1058 = &local_1090;
        local_e20 = local_10e0;
        uStack_e18 = uStack_10d8;
        local_e30 = local_1090;
        uStack_e28 = uStack_1088;
        local_f20 = (local_f40 + 0.5) * (float)local_de0 * (float)local_de0;
        fStack_f1c = (fStack_f3c + 0.5) * local_de0._4_4_ * local_de0._4_4_;
        fStack_f18 = (fStack_f38 + 0.5) * (float)uStack_dd8 * (float)uStack_dd8;
        fStack_f14 = (fStack_f34 + 0.5) * uStack_dd8._4_4_ * uStack_dd8._4_4_;
        local_f30 = local_4380;
        uStack_f28 = uStack_4378;
        local_10e0 = CONCAT44(fStack_f1c + local_de0._4_4_,local_f20 + (float)local_de0);
        uStack_10d8 = CONCAT44(fStack_f14 + uStack_dd8._4_4_,fStack_f18 + (float)uStack_dd8);
        local_f00 = local_10e0;
        uStack_ef8 = uStack_10d8;
        local_f10 = 0x3f8000003f800000;
        uStack_f08 = 0x3f8000003f800000;
        local_1af0 = local_f20 + (float)local_de0 + 1.0;
        fStack_1aec = fStack_f1c + local_de0._4_4_ + 1.0;
        fStack_1ae8 = fStack_f18 + (float)uStack_dd8 + 1.0;
        fStack_1ae4 = fStack_f14 + uStack_dd8._4_4_ + 1.0;
        local_10e0 = CONCAT44(fStack_1aec,local_1af0);
        uStack_10d8 = CONCAT44(fStack_1ae4,fStack_1ae8);
        local_790 = local_10a0;
        uStack_788 = uStack_1098;
        local_10b0._4_4_ = (int)local_430._4_4_;
        local_10b0._0_4_ = (int)(float)local_430;
        local_10b0._8_4_ = (int)(float)uStack_428;
        local_10b0._12_4_ = (int)uStack_428._4_4_;
        local_190 = local_10b0._0_8_;
        uStack_188 = local_10b0._8_8_;
        local_1a0 = 0x7f0000007f;
        uStack_198 = 0x7f0000007f;
        auVar93._8_8_ = local_10b0._8_8_;
        auVar93._0_8_ = local_10b0._0_8_;
        auVar92._8_8_ = 0x7f0000007f;
        auVar92._0_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx(auVar93,auVar92);
        local_10b0._0_8_ = auVar4._0_8_;
        local_10b0._8_8_ = auVar4._8_8_;
        local_f0 = local_10b0._0_8_;
        uStack_e8 = local_10b0._8_8_;
        local_f4 = 0x17;
        local_10b0 = vpslld_avx(auVar4,ZEXT416(0x17));
        local_70 = local_10b0._0_8_;
        uStack_68 = local_10b0._8_8_;
        local_10f0 = local_10b0._0_8_;
        uStack_10e8 = local_10b0._8_8_;
        local_e00 = local_10e0;
        uStack_df8 = uStack_10d8;
        local_e10 = local_10b0._0_8_;
        uVar106 = local_e10;
        uStack_e08 = local_10b0._8_8_;
        uVar107 = uStack_e08;
        local_e10._0_4_ = local_10b0._0_4_;
        local_e10._4_4_ = local_10b0._4_4_;
        uStack_e08._0_4_ = local_10b0._8_4_;
        uStack_e08._4_4_ = local_10b0._12_4_;
        local_1af0 = local_1af0 * (float)local_e10;
        fStack_1aec = fStack_1aec * local_e10._4_4_;
        fStack_1ae8 = fStack_1ae8 * (float)uStack_e08;
        fStack_1ae4 = fStack_1ae4 * uStack_e08._4_4_;
        local_10e0 = CONCAT44(fStack_1aec,local_1af0);
        uStack_10d8 = CONCAT44(fStack_1ae4,fStack_1ae8);
        local_2290 = local_10e0;
        uStack_2288 = uStack_10d8;
        local_1af0 = local_1af0 + 1.0;
        fStack_1aec = fStack_1aec + 1.0;
        fStack_1ae8 = fStack_1ae8 + 1.0;
        fStack_1ae4 = fStack_1ae4 + 1.0;
        auVar47._8_8_ = 0x3f8000003f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar46._4_4_ = fStack_1aec;
        auVar46._0_4_ = local_1af0;
        auVar46._8_4_ = fStack_1ae8;
        auVar46._12_4_ = fStack_1ae4;
        auVar7 = vdivps_avx(auVar47,auVar46);
        local_43a0 = auVar7._0_8_;
        uStack_4398 = auVar7._8_8_;
        local_2300 = local_42d0;
        uStack_22f8 = uStack_42c8;
        local_1b54 = 0x3f800000;
        local_1b70 = 0x3f800000;
        uStack_1b6c = 0x3f800000;
        uStack_1b68 = 0x3f800000;
        uStack_1b64 = 0x3f800000;
        local_2310 = 0x3f8000003f800000;
        uStack_2308 = 0x3f8000003f800000;
        local_d30 = ZEXT816(0) << 0x20;
        local_22f0._8_8_ = SUB168(ZEXT816(0),4);
        local_900 = 0;
        uStack_8f8 = local_22f0._8_8_;
        local_910 = local_42d0;
        uStack_908 = uStack_42c8;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = local_22f0._8_8_;
        auVar4 = vsubps_avx(auVar102 << 0x40,auVar8);
        local_d80 = 0x3f8000003f800000;
        uStack_d78 = 0x3f8000003f800000;
        local_d40._0_8_ = auVar4._0_8_;
        local_d40._8_8_ = auVar4._8_8_;
        local_8e0 = local_d40._0_8_;
        uStack_8d8 = local_d40._8_8_;
        local_8f0 = 0x42b0c0a542b0c0a5;
        uStack_8e8 = 0x42b0c0a542b0c0a5;
        auVar55._8_8_ = 0x42b0c0a542b0c0a5;
        auVar55._0_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar55);
        local_d40._0_8_ = auVar4._0_8_;
        local_d40._8_8_ = auVar4._8_8_;
        local_840 = local_d40._0_8_;
        uStack_838 = local_d40._8_8_;
        local_850 = 0xc2b0c0a5c2b0c0a5;
        uStack_848 = 0xc2b0c0a5c2b0c0a5;
        auVar60._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar60._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar8 = vmaxps_avx(auVar4,auVar60);
        local_d40._0_8_ = auVar8._0_8_;
        local_d40._8_8_ = auVar8._8_8_;
        local_a80 = local_d40._0_8_;
        uVar116 = local_a80;
        uStack_a78 = local_d40._8_8_;
        uVar117 = uStack_a78;
        local_a90 = 0x3fb8aa3b3fb8aa3b;
        uStack_a88 = 0x3fb8aa3b3fb8aa3b;
        local_a80._0_4_ = auVar8._0_4_;
        local_a80._4_4_ = auVar8._4_4_;
        uStack_a78._0_4_ = auVar8._8_4_;
        uStack_a78._4_4_ = auVar8._12_4_;
        local_d60._4_4_ = local_a80._4_4_ * 1.442695;
        local_d60._0_4_ = (float)local_a80 * 1.442695;
        uStack_d58._0_4_ = (float)uStack_a78 * 1.442695;
        uStack_d58._4_4_ = uStack_a78._4_4_ * 1.442695;
        local_ba0 = local_d60;
        uStack_b98 = uStack_d58;
        local_bb0 = 0x3f0000003f000000;
        uStack_ba8 = 0x3f0000003f000000;
        local_d60._0_4_ = (float)local_a80 * 1.442695 + 0.5;
        local_d60._4_4_ = local_a80._4_4_ * 1.442695 + 0.5;
        fVar122 = (float)uStack_a78 * 1.442695 + 0.5;
        fVar123 = uStack_a78._4_4_ * 1.442695 + 0.5;
        uStack_d58._0_4_ = fVar122;
        uStack_d58._4_4_ = fVar123;
        local_7a0 = local_d60;
        uStack_798 = uStack_d58;
        local_d70._4_4_ = (int)(float)local_d60._4_4_;
        local_d70._0_4_ = (int)(float)local_d60._0_4_;
        local_d70._8_4_ = (int)fVar122;
        local_d70._12_4_ = (int)fVar123;
        local_710 = local_d70._0_8_;
        uStack_708 = local_d70._8_8_;
        auVar65._8_8_ = local_d70._8_8_;
        auVar65._0_8_ = local_d70._0_8_;
        auVar5 = vcvtdq2ps_avx(auVar65);
        local_d50 = auVar5._0_8_;
        uStack_d48 = auVar5._8_8_;
        local_6b0 = local_d50;
        uStack_6a8 = uStack_d48;
        local_6c0 = local_d60;
        uStack_6b8 = uStack_d58;
        auVar70._8_8_ = uStack_d58;
        auVar70._0_8_ = local_d60;
        auVar4 = vcmpps_avx(auVar70,auVar5,1);
        local_d90._0_8_ = auVar4._0_8_;
        local_d90._8_8_ = auVar4._8_8_;
        local_610 = local_d90._0_8_;
        uStack_608 = local_d90._8_8_;
        local_620 = 0x3f8000003f800000;
        uStack_618 = 0x3f8000003f800000;
        auVar75._8_8_ = 0x3f8000003f800000;
        auVar75._0_8_ = 0x3f8000003f800000;
        local_d90 = vpand_avx(auVar4,auVar75);
        local_a60 = local_d50;
        uStack_a58 = uStack_d48;
        local_a70 = local_d90._0_8_;
        uStack_a68 = local_d90._8_8_;
        _local_d60 = vsubps_avx(auVar5,local_d90);
        local_508 = local_d60;
        local_510 = ::_ps_cephes_exp_C1;
        local_518 = local_d40;
        local_4d0 = local_d40._0_8_;
        uStack_4c8 = local_d40._8_8_;
        local_500[0] = 0.6933594;
        local_500[1] = 0.6933594;
        afStack_4f8[0] = 0.6933594;
        afStack_4f8[1] = 0.6933594;
        local_4f0._0_4_ = local_d60._0_4_;
        local_4f0._4_4_ = local_d60._4_4_;
        uStack_4e8._0_4_ = local_d60._8_4_;
        uStack_4e8._4_4_ = local_d60._12_4_;
        local_4e0 = (float)local_4f0 * 0.6933594;
        fStack_4dc = local_4f0._4_4_ * 0.6933594;
        fStack_4d8 = (float)uStack_4e8 * 0.6933594;
        fStack_4d4 = uStack_4e8._4_4_ * 0.6933594;
        auVar81._4_4_ = fStack_4dc;
        auVar81._0_4_ = local_4e0;
        auVar81._8_4_ = fStack_4d8;
        auVar81._12_4_ = fStack_4d4;
        auVar4 = vsubps_avx(auVar8,auVar81);
        local_568 = local_d60;
        local_570 = ::_ps_cephes_exp_C2;
        local_578 = local_d40;
        local_d40._0_8_ = auVar4._0_8_;
        local_530 = local_d40._0_8_;
        local_d40._8_8_ = auVar4._8_8_;
        uStack_528 = local_d40._8_8_;
        local_550 = local_d60;
        uStack_548 = uStack_d58;
        local_560[0] = -0.00021219444;
        local_560[1] = -0.00021219444;
        afStack_558[0] = -0.00021219444;
        afStack_558[1] = -0.00021219444;
        local_540 = (float)local_4f0 * -0.00021219444;
        fStack_53c = local_4f0._4_4_ * -0.00021219444;
        fStack_538 = (float)uStack_4e8 * -0.00021219444;
        fStack_534 = uStack_4e8._4_4_ * -0.00021219444;
        auVar80._4_4_ = fStack_53c;
        auVar80._0_4_ = local_540;
        auVar80._8_4_ = fStack_538;
        auVar80._12_4_ = fStack_534;
        local_d40 = vsubps_avx(auVar4,auVar80);
        local_43e0 = local_d40._0_8_;
        uStack_43d8 = local_d40._8_8_;
        local_aa0 = local_43e0;
        uVar114 = local_aa0;
        uStack_a98 = uStack_43d8;
        uVar115 = uStack_a98;
        local_ab0 = local_43e0;
        uStack_aa8 = uStack_43d8;
        local_aa0._0_4_ = local_d40._0_4_;
        local_aa0._4_4_ = local_d40._4_4_;
        uStack_a98._0_4_ = local_d40._8_4_;
        uStack_a98._4_4_ = local_d40._12_4_;
        local_d50 = CONCAT44(local_aa0._4_4_ * local_aa0._4_4_,(float)local_aa0 * (float)local_aa0);
        uStack_d48._0_4_ = (float)uStack_a98 * (float)uStack_a98;
        uStack_d48._4_4_ = uStack_a98._4_4_ * uStack_a98._4_4_;
        local_d10 = &local_da0;
        local_d20 = local_d40;
        local_ca8 = ::_ps_cephes_exp_p1;
        local_b80 = 0x3950696739506967;
        uStack_b78 = 0x3950696739506967;
        local_b90 = local_43e0;
        uStack_b88 = uStack_43d8;
        local_c80 = (float)local_aa0 * 0.00019875691;
        fStack_c7c = local_aa0._4_4_ * 0.00019875691;
        fStack_c78 = (float)uStack_a98 * 0.00019875691;
        fStack_c74 = uStack_a98._4_4_ * 0.00019875691;
        local_c90[0] = 0.0013981999;
        local_c90[1] = 0.0013981999;
        afStack_c88[0] = 0.0013981999;
        afStack_c88[1] = 0.0013981999;
        local_da0 = CONCAT44(fStack_c7c + 0.0013981999,local_c80 + 0.0013981999);
        uStack_d98 = CONCAT44(fStack_c74 + 0.0013981999,fStack_c78 + 0.0013981999);
        local_cc0 = ::_ps_cephes_exp_p2;
        local_b60 = local_da0;
        uStack_b58 = uStack_d98;
        local_b70 = local_43e0;
        uStack_b68 = uStack_43d8;
        local_c60 = (local_c80 + 0.0013981999) * (float)local_aa0;
        fStack_c5c = (fStack_c7c + 0.0013981999) * local_aa0._4_4_;
        fStack_c58 = (fStack_c78 + 0.0013981999) * (float)uStack_a98;
        fStack_c54 = (fStack_c74 + 0.0013981999) * uStack_a98._4_4_;
        local_c70[0] = 0.008333452;
        local_c70[1] = 0.008333452;
        afStack_c68[0] = 0.008333452;
        afStack_c68[1] = 0.008333452;
        local_da0 = CONCAT44(fStack_c5c + 0.008333452,local_c60 + 0.008333452);
        uStack_d98 = CONCAT44(fStack_c54 + 0.008333452,fStack_c58 + 0.008333452);
        local_cd8 = ::_ps_cephes_exp_p3;
        local_b40 = local_da0;
        uStack_b38 = uStack_d98;
        local_b50 = local_43e0;
        uStack_b48 = uStack_43d8;
        local_c40 = (local_c60 + 0.008333452) * (float)local_aa0;
        fStack_c3c = (fStack_c5c + 0.008333452) * local_aa0._4_4_;
        fStack_c38 = (fStack_c58 + 0.008333452) * (float)uStack_a98;
        fStack_c34 = (fStack_c54 + 0.008333452) * uStack_a98._4_4_;
        local_c50[0] = 0.041665796;
        local_c50[1] = 0.041665796;
        afStack_c48[0] = 0.041665796;
        afStack_c48[1] = 0.041665796;
        local_da0 = CONCAT44(fStack_c3c + 0.041665796,local_c40 + 0.041665796);
        uStack_d98 = CONCAT44(fStack_c34 + 0.041665796,fStack_c38 + 0.041665796);
        local_cf0 = ::_ps_cephes_exp_p4;
        local_b20 = local_da0;
        uStack_b18 = uStack_d98;
        local_b30 = local_43e0;
        uStack_b28 = uStack_43d8;
        local_c20 = (local_c40 + 0.041665796) * (float)local_aa0;
        fStack_c1c = (fStack_c3c + 0.041665796) * local_aa0._4_4_;
        fStack_c18 = (fStack_c38 + 0.041665796) * (float)uStack_a98;
        fStack_c14 = (fStack_c34 + 0.041665796) * uStack_a98._4_4_;
        local_c30[0] = 0.16666666;
        local_c30[1] = 0.16666666;
        afStack_c28[0] = 0.16666666;
        afStack_c28[1] = 0.16666666;
        local_da0 = CONCAT44(fStack_c1c + 0.16666666,local_c20 + 0.16666666);
        uStack_d98 = CONCAT44(fStack_c14 + 0.16666666,fStack_c18 + 0.16666666);
        local_d08 = ::_ps_cephes_exp_p5;
        local_b00 = local_da0;
        uStack_af8 = uStack_d98;
        local_b10 = local_43e0;
        uStack_b08 = uStack_43d8;
        local_c00 = (local_c20 + 0.16666666) * (float)local_aa0;
        fStack_bfc = (fStack_c1c + 0.16666666) * local_aa0._4_4_;
        fStack_bf8 = (fStack_c18 + 0.16666666) * (float)uStack_a98;
        fStack_bf4 = (fStack_c14 + 0.16666666) * uStack_a98._4_4_;
        local_c10[0] = 0.5;
        local_c10[1] = 0.5;
        afStack_c08[0] = 0.5;
        afStack_c08[1] = 0.5;
        local_da0 = CONCAT44(fStack_bfc + 0.5,local_c00 + 0.5);
        uStack_d98 = CONCAT44(fStack_bf4 + 0.5,fStack_bf8 + 0.5);
        local_d18 = &local_d50;
        local_ae0 = local_da0;
        uStack_ad8 = uStack_d98;
        local_af0 = local_d50;
        uStack_ae8 = uStack_d48;
        local_be0 = (local_c00 + 0.5) * (float)local_aa0 * (float)local_aa0;
        fStack_bdc = (fStack_bfc + 0.5) * local_aa0._4_4_ * local_aa0._4_4_;
        fStack_bd8 = (fStack_bf8 + 0.5) * (float)uStack_a98 * (float)uStack_a98;
        fStack_bd4 = (fStack_bf4 + 0.5) * uStack_a98._4_4_ * uStack_a98._4_4_;
        local_bf0 = local_43e0;
        uStack_be8 = uStack_43d8;
        local_da0 = CONCAT44(fStack_bdc + local_aa0._4_4_,local_be0 + (float)local_aa0);
        uStack_d98 = CONCAT44(fStack_bd4 + uStack_a98._4_4_,fStack_bd8 + (float)uStack_a98);
        local_bc0 = local_da0;
        uStack_bb8 = uStack_d98;
        local_bd0 = 0x3f8000003f800000;
        uStack_bc8 = 0x3f8000003f800000;
        local_1ad0 = local_be0 + (float)local_aa0 + 1.0;
        fStack_1acc = fStack_bdc + local_aa0._4_4_ + 1.0;
        fStack_1ac8 = fStack_bd8 + (float)uStack_a98 + 1.0;
        fStack_1ac4 = fStack_bd4 + uStack_a98._4_4_ + 1.0;
        local_da0 = CONCAT44(fStack_1acc,local_1ad0);
        uStack_d98 = CONCAT44(fStack_1ac4,fStack_1ac8);
        local_7b0 = local_d60;
        uStack_7a8 = uStack_d58;
        local_d70._4_4_ = (int)local_4f0._4_4_;
        local_d70._0_4_ = (int)(float)local_4f0;
        local_d70._8_4_ = (int)(float)uStack_4e8;
        local_d70._12_4_ = (int)uStack_4e8._4_4_;
        local_1b0 = local_d70._0_8_;
        uStack_1a8 = local_d70._8_8_;
        local_1c0 = 0x7f0000007f;
        uStack_1b8 = 0x7f0000007f;
        auVar91._8_8_ = local_d70._8_8_;
        auVar91._0_8_ = local_d70._0_8_;
        auVar90._8_8_ = 0x7f0000007f;
        auVar90._0_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx(auVar91,auVar90);
        local_d70._0_8_ = auVar4._0_8_;
        local_d70._8_8_ = auVar4._8_8_;
        local_110 = local_d70._0_8_;
        uStack_108 = local_d70._8_8_;
        local_114 = 0x17;
        local_d70 = vpslld_avx(auVar4,ZEXT416(0x17));
        local_80 = local_d70._0_8_;
        uStack_78 = local_d70._8_8_;
        local_db0 = local_d70._0_8_;
        uStack_da8 = local_d70._8_8_;
        local_ac0 = local_da0;
        uStack_ab8 = uStack_d98;
        local_ad0 = local_d70._0_8_;
        uVar112 = local_ad0;
        uStack_ac8 = local_d70._8_8_;
        uVar113 = uStack_ac8;
        local_ad0._0_4_ = local_d70._0_4_;
        local_ad0._4_4_ = local_d70._4_4_;
        uStack_ac8._0_4_ = local_d70._8_4_;
        uStack_ac8._4_4_ = local_d70._12_4_;
        local_1ad0 = local_1ad0 * (float)local_ad0;
        fStack_1acc = fStack_1acc * local_ad0._4_4_;
        fStack_1ac8 = fStack_1ac8 * (float)uStack_ac8;
        fStack_1ac4 = fStack_1ac4 * uStack_ac8._4_4_;
        local_da0 = CONCAT44(fStack_1acc,local_1ad0);
        uStack_d98 = CONCAT44(fStack_1ac4,fStack_1ac8);
        local_22e0 = local_da0;
        uStack_22d8 = uStack_d98;
        local_1ad0 = local_1ad0 + 1.0;
        fStack_1acc = fStack_1acc + 1.0;
        fStack_1ac8 = fStack_1ac8 + 1.0;
        fStack_1ac4 = fStack_1ac4 + 1.0;
        auVar49._8_8_ = 0x3f8000003f800000;
        auVar49._0_8_ = 0x3f8000003f800000;
        auVar48._4_4_ = fStack_1acc;
        auVar48._0_4_ = local_1ad0;
        auVar48._8_4_ = fStack_1ac8;
        auVar48._12_4_ = fStack_1ac4;
        _local_1f50 = vdivps_avx(auVar49,auVar48);
        local_2180 = local_42e0;
        uStack_2178 = uStack_42d8;
        local_1c14 = 0x3f800000;
        local_1c30 = 0x3f800000;
        uStack_1c2c = 0x3f800000;
        uStack_1c28 = 0x3f800000;
        uStack_1c24 = 0x3f800000;
        local_2190 = 0x3f8000003f800000;
        uStack_2188 = 0x3f8000003f800000;
        local_1c34 = 0x40000000;
        local_1c50 = 0x40000000;
        uStack_1c4c = 0x40000000;
        uStack_1c48 = 0x40000000;
        uStack_1c44 = 0x40000000;
        local_21a0 = 0x4000000040000000;
        uStack_2198 = 0x4000000040000000;
        local_20f0 = local_42e0;
        uVar13 = local_20f0;
        uStack_20e8 = uStack_42d8;
        uVar14 = uStack_20e8;
        local_20f0._0_4_ = auVar3._0_4_;
        local_20f0._4_4_ = auVar3._4_4_;
        uStack_20e8._0_4_ = auVar3._8_4_;
        uStack_20e8._4_4_ = auVar3._12_4_;
        local_2160 = (float)local_20f0 * 2.0;
        fStack_215c = local_20f0._4_4_ * 2.0;
        fStack_2158 = (float)uStack_20e8 * 2.0;
        fStack_2154 = uStack_20e8._4_4_ * 2.0;
        local_1c54 = 0x3f800000;
        local_1c70 = 0x3f800000;
        uStack_1c6c = 0x3f800000;
        uStack_1c68 = 0x3f800000;
        uStack_1c64 = 0x3f800000;
        local_2170 = 0x3f8000003f800000;
        uStack_2168 = 0x3f8000003f800000;
        local_1a30 = ZEXT816(0) << 0x20;
        local_2150._8_8_ = SUB168(ZEXT816(0),4);
        local_9b0 = CONCAT44(fStack_215c,local_2160);
        uStack_9a8 = CONCAT44(fStack_2154,fStack_2158);
        local_9a0 = 0;
        uStack_998 = local_2150._8_8_;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = local_2150._8_8_;
        auVar51._8_8_ = uStack_9a8;
        auVar51._0_8_ = local_9b0;
        auVar4 = vsubps_avx(auVar103 << 0x40,auVar51);
        local_1a80 = 0x3f8000003f800000;
        uStack_1a78 = 0x3f8000003f800000;
        local_1a40._0_8_ = auVar4._0_8_;
        local_1a40._8_8_ = auVar4._8_8_;
        local_860 = local_1a40._0_8_;
        uStack_858 = local_1a40._8_8_;
        local_870 = 0x42b0c0a542b0c0a5;
        uStack_868 = 0x42b0c0a542b0c0a5;
        auVar59._8_8_ = 0x42b0c0a542b0c0a5;
        auVar59._0_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar59);
        local_1a40._0_8_ = auVar4._0_8_;
        local_1a40._8_8_ = auVar4._8_8_;
        local_7c0 = local_1a40._0_8_;
        uStack_7b8 = local_1a40._8_8_;
        local_7d0 = 0xc2b0c0a5c2b0c0a5;
        uStack_7c8 = 0xc2b0c0a5c2b0c0a5;
        auVar64._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar64._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar8 = vmaxps_avx(auVar4,auVar64);
        local_1a40._0_8_ = auVar8._0_8_;
        local_1a40._8_8_ = auVar8._8_8_;
        local_1780 = local_1a40._0_8_;
        uVar27 = local_1780;
        uStack_1778 = local_1a40._8_8_;
        uVar28 = uStack_1778;
        local_1790 = 0x3fb8aa3b3fb8aa3b;
        uStack_1788 = 0x3fb8aa3b3fb8aa3b;
        local_1780._0_4_ = auVar8._0_4_;
        local_1780._4_4_ = auVar8._4_4_;
        uStack_1778._0_4_ = auVar8._8_4_;
        uStack_1778._4_4_ = auVar8._12_4_;
        local_1a60._4_4_ = local_1780._4_4_ * 1.442695;
        local_1a60._0_4_ = (float)local_1780 * 1.442695;
        uStack_1a58._0_4_ = (float)uStack_1778 * 1.442695;
        uStack_1a58._4_4_ = uStack_1778._4_4_ * 1.442695;
        local_18a0 = local_1a60;
        uStack_1898 = uStack_1a58;
        local_18b0 = 0x3f0000003f000000;
        uStack_18a8 = 0x3f0000003f000000;
        local_1a60._0_4_ = (float)local_1780 * 1.442695 + 0.5;
        local_1a60._4_4_ = local_1780._4_4_ * 1.442695 + 0.5;
        fVar122 = (float)uStack_1778 * 1.442695 + 0.5;
        fVar123 = uStack_1778._4_4_ * 1.442695 + 0.5;
        uStack_1a58._0_4_ = fVar122;
        uStack_1a58._4_4_ = fVar123;
        local_720 = local_1a60;
        uStack_718 = uStack_1a58;
        local_1a70._4_4_ = (int)(float)local_1a60._4_4_;
        local_1a70._0_4_ = (int)(float)local_1a60._0_4_;
        local_1a70._8_4_ = (int)fVar122;
        local_1a70._12_4_ = (int)fVar123;
        local_6d0 = local_1a70._0_8_;
        uStack_6c8 = local_1a70._8_8_;
        auVar69._8_8_ = local_1a70._8_8_;
        auVar69._0_8_ = local_1a70._0_8_;
        auVar5 = vcvtdq2ps_avx(auVar69);
        local_1a50 = auVar5._0_8_;
        uStack_1a48 = auVar5._8_8_;
        local_630 = local_1a50;
        uStack_628 = uStack_1a48;
        local_640 = local_1a60;
        uStack_638 = uStack_1a58;
        auVar74._8_8_ = uStack_1a58;
        auVar74._0_8_ = local_1a60;
        auVar4 = vcmpps_avx(auVar74,auVar5,1);
        local_1a90._0_8_ = auVar4._0_8_;
        local_1a90._8_8_ = auVar4._8_8_;
        local_590 = local_1a90._0_8_;
        uStack_588 = local_1a90._8_8_;
        local_5a0 = 0x3f8000003f800000;
        uStack_598 = 0x3f8000003f800000;
        auVar79._8_8_ = 0x3f8000003f800000;
        auVar79._0_8_ = 0x3f8000003f800000;
        local_1a90 = vpand_avx(auVar4,auVar79);
        local_9e0 = local_1a50;
        uStack_9d8 = uStack_1a48;
        local_9f0 = local_1a90._0_8_;
        uStack_9e8 = local_1a90._8_8_;
        _local_1a60 = vsubps_avx(auVar5,local_1a90);
        local_208 = local_1a60;
        local_210 = ::_ps_cephes_exp_C1;
        local_218 = local_1a40;
        local_1d0 = local_1a40._0_8_;
        uStack_1c8 = local_1a40._8_8_;
        local_200[0] = 0.6933594;
        local_200[1] = 0.6933594;
        afStack_1f8[0] = 0.6933594;
        afStack_1f8[1] = 0.6933594;
        local_1f0._0_4_ = local_1a60._0_4_;
        local_1f0._4_4_ = local_1a60._4_4_;
        uStack_1e8._0_4_ = local_1a60._8_4_;
        uStack_1e8._4_4_ = local_1a60._12_4_;
        local_1e0 = (float)local_1f0 * 0.6933594;
        fStack_1dc = local_1f0._4_4_ * 0.6933594;
        fStack_1d8 = (float)uStack_1e8 * 0.6933594;
        fStack_1d4 = uStack_1e8._4_4_ * 0.6933594;
        auVar89._4_4_ = fStack_1dc;
        auVar89._0_4_ = local_1e0;
        auVar89._8_4_ = fStack_1d8;
        auVar89._12_4_ = fStack_1d4;
        auVar4 = vsubps_avx(auVar8,auVar89);
        local_268 = local_1a60;
        local_270 = ::_ps_cephes_exp_C2;
        local_278 = local_1a40;
        local_1a40._0_8_ = auVar4._0_8_;
        local_230 = local_1a40._0_8_;
        local_1a40._8_8_ = auVar4._8_8_;
        uStack_228 = local_1a40._8_8_;
        local_250 = local_1a60;
        uStack_248 = uStack_1a58;
        local_260[0] = -0.00021219444;
        local_260[1] = -0.00021219444;
        afStack_258[0] = -0.00021219444;
        afStack_258[1] = -0.00021219444;
        local_240 = (float)local_1f0 * -0.00021219444;
        fStack_23c = local_1f0._4_4_ * -0.00021219444;
        fStack_238 = (float)uStack_1e8 * -0.00021219444;
        fStack_234 = uStack_1e8._4_4_ * -0.00021219444;
        auVar88._4_4_ = fStack_23c;
        auVar88._0_4_ = local_240;
        auVar88._8_4_ = fStack_238;
        auVar88._12_4_ = fStack_234;
        local_1a40 = vsubps_avx(auVar4,auVar88);
        local_4440 = local_1a40._0_8_;
        uStack_4438 = local_1a40._8_8_;
        local_17a0 = local_4440;
        uVar25 = local_17a0;
        uStack_1798 = uStack_4438;
        uVar26 = uStack_1798;
        local_17b0 = local_4440;
        uStack_17a8 = uStack_4438;
        local_17a0._0_4_ = local_1a40._0_4_;
        local_17a0._4_4_ = local_1a40._4_4_;
        uStack_1798._0_4_ = local_1a40._8_4_;
        uStack_1798._4_4_ = local_1a40._12_4_;
        local_1a50 = CONCAT44(local_17a0._4_4_ * local_17a0._4_4_,
                              (float)local_17a0 * (float)local_17a0);
        uStack_1a48._0_4_ = (float)uStack_1798 * (float)uStack_1798;
        uStack_1a48._4_4_ = uStack_1798._4_4_ * uStack_1798._4_4_;
        local_1a10 = &local_1aa0;
        local_1a20 = local_1a40;
        local_19a8 = ::_ps_cephes_exp_p1;
        local_1880 = 0x3950696739506967;
        uStack_1878 = 0x3950696739506967;
        local_1890 = local_4440;
        uStack_1888 = uStack_4438;
        local_1980 = (float)local_17a0 * 0.00019875691;
        fStack_197c = local_17a0._4_4_ * 0.00019875691;
        fStack_1978 = (float)uStack_1798 * 0.00019875691;
        fStack_1974 = uStack_1798._4_4_ * 0.00019875691;
        local_1990[0] = 0.0013981999;
        local_1990[1] = 0.0013981999;
        afStack_1988[0] = 0.0013981999;
        afStack_1988[1] = 0.0013981999;
        local_1aa0 = CONCAT44(fStack_197c + 0.0013981999,local_1980 + 0.0013981999);
        uStack_1a98 = CONCAT44(fStack_1974 + 0.0013981999,fStack_1978 + 0.0013981999);
        local_19c0 = ::_ps_cephes_exp_p2;
        local_1860 = local_1aa0;
        uStack_1858 = uStack_1a98;
        local_1870 = local_4440;
        uStack_1868 = uStack_4438;
        local_1960 = (local_1980 + 0.0013981999) * (float)local_17a0;
        fStack_195c = (fStack_197c + 0.0013981999) * local_17a0._4_4_;
        fStack_1958 = (fStack_1978 + 0.0013981999) * (float)uStack_1798;
        fStack_1954 = (fStack_1974 + 0.0013981999) * uStack_1798._4_4_;
        local_1970[0] = 0.008333452;
        local_1970[1] = 0.008333452;
        afStack_1968[0] = 0.008333452;
        afStack_1968[1] = 0.008333452;
        local_1aa0 = CONCAT44(fStack_195c + 0.008333452,local_1960 + 0.008333452);
        uStack_1a98 = CONCAT44(fStack_1954 + 0.008333452,fStack_1958 + 0.008333452);
        local_19d8 = ::_ps_cephes_exp_p3;
        local_1840 = local_1aa0;
        uStack_1838 = uStack_1a98;
        local_1850 = local_4440;
        uStack_1848 = uStack_4438;
        local_1940 = (local_1960 + 0.008333452) * (float)local_17a0;
        fStack_193c = (fStack_195c + 0.008333452) * local_17a0._4_4_;
        fStack_1938 = (fStack_1958 + 0.008333452) * (float)uStack_1798;
        fStack_1934 = (fStack_1954 + 0.008333452) * uStack_1798._4_4_;
        local_1950[0] = 0.041665796;
        local_1950[1] = 0.041665796;
        afStack_1948[0] = 0.041665796;
        afStack_1948[1] = 0.041665796;
        local_1aa0 = CONCAT44(fStack_193c + 0.041665796,local_1940 + 0.041665796);
        uStack_1a98 = CONCAT44(fStack_1934 + 0.041665796,fStack_1938 + 0.041665796);
        local_19f0 = ::_ps_cephes_exp_p4;
        local_1820 = local_1aa0;
        uStack_1818 = uStack_1a98;
        local_1830 = local_4440;
        uStack_1828 = uStack_4438;
        local_1920 = (local_1940 + 0.041665796) * (float)local_17a0;
        fStack_191c = (fStack_193c + 0.041665796) * local_17a0._4_4_;
        fStack_1918 = (fStack_1938 + 0.041665796) * (float)uStack_1798;
        fStack_1914 = (fStack_1934 + 0.041665796) * uStack_1798._4_4_;
        local_1930[0] = 0.16666666;
        local_1930[1] = 0.16666666;
        afStack_1928[0] = 0.16666666;
        afStack_1928[1] = 0.16666666;
        local_1aa0 = CONCAT44(fStack_191c + 0.16666666,local_1920 + 0.16666666);
        uStack_1a98 = CONCAT44(fStack_1914 + 0.16666666,fStack_1918 + 0.16666666);
        local_1a08 = ::_ps_cephes_exp_p5;
        local_1800 = local_1aa0;
        uStack_17f8 = uStack_1a98;
        local_1810 = local_4440;
        uStack_1808 = uStack_4438;
        local_1900 = (local_1920 + 0.16666666) * (float)local_17a0;
        fStack_18fc = (fStack_191c + 0.16666666) * local_17a0._4_4_;
        fStack_18f8 = (fStack_1918 + 0.16666666) * (float)uStack_1798;
        fStack_18f4 = (fStack_1914 + 0.16666666) * uStack_1798._4_4_;
        local_1910[0] = 0.5;
        local_1910[1] = 0.5;
        afStack_1908[0] = 0.5;
        afStack_1908[1] = 0.5;
        local_1aa0 = CONCAT44(fStack_18fc + 0.5,local_1900 + 0.5);
        uStack_1a98 = CONCAT44(fStack_18f4 + 0.5,fStack_18f8 + 0.5);
        local_1a18 = &local_1a50;
        local_17e0 = local_1aa0;
        uStack_17d8 = uStack_1a98;
        local_17f0 = local_1a50;
        uStack_17e8 = uStack_1a48;
        local_18e0 = (local_1900 + 0.5) * (float)local_17a0 * (float)local_17a0;
        fStack_18dc = (fStack_18fc + 0.5) * local_17a0._4_4_ * local_17a0._4_4_;
        fStack_18d8 = (fStack_18f8 + 0.5) * (float)uStack_1798 * (float)uStack_1798;
        fStack_18d4 = (fStack_18f4 + 0.5) * uStack_1798._4_4_ * uStack_1798._4_4_;
        local_18f0 = local_4440;
        uStack_18e8 = uStack_4438;
        local_1aa0 = CONCAT44(fStack_18dc + local_17a0._4_4_,local_18e0 + (float)local_17a0);
        uStack_1a98 = CONCAT44(fStack_18d4 + uStack_1798._4_4_,fStack_18d8 + (float)uStack_1798);
        local_18c0 = local_1aa0;
        uStack_18b8 = uStack_1a98;
        local_18d0 = 0x3f8000003f800000;
        uStack_18c8 = 0x3f8000003f800000;
        local_1b50 = local_18e0 + (float)local_17a0 + 1.0;
        fStack_1b4c = fStack_18dc + local_17a0._4_4_ + 1.0;
        fStack_1b48 = fStack_18d8 + (float)uStack_1798 + 1.0;
        fStack_1b44 = fStack_18d4 + uStack_1798._4_4_ + 1.0;
        local_1aa0 = CONCAT44(fStack_1b4c,local_1b50);
        uStack_1a98 = CONCAT44(fStack_1b44,fStack_1b48);
        local_730 = local_1a60;
        uStack_728 = uStack_1a58;
        local_1a70._4_4_ = (int)local_1f0._4_4_;
        local_1a70._0_4_ = (int)(float)local_1f0;
        local_1a70._8_4_ = (int)(float)uStack_1e8;
        local_1a70._12_4_ = (int)uStack_1e8._4_4_;
        local_130 = local_1a70._0_8_;
        uStack_128 = local_1a70._8_8_;
        local_140 = 0x7f0000007f;
        uStack_138 = 0x7f0000007f;
        auVar99._8_8_ = local_1a70._8_8_;
        auVar99._0_8_ = local_1a70._0_8_;
        auVar98._8_8_ = 0x7f0000007f;
        auVar98._0_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx(auVar99,auVar98);
        local_1a70._0_8_ = auVar4._0_8_;
        local_1a70._8_8_ = auVar4._8_8_;
        local_90 = local_1a70._0_8_;
        uStack_88 = local_1a70._8_8_;
        local_94 = 0x17;
        local_1a70 = vpslld_avx(auVar4,ZEXT416(0x17));
        local_40 = local_1a70._0_8_;
        uStack_38 = local_1a70._8_8_;
        local_1ab0 = local_1a70._0_8_;
        uStack_1aa8 = local_1a70._8_8_;
        local_17c0 = local_1aa0;
        uStack_17b8 = uStack_1a98;
        local_17d0 = local_1a70._0_8_;
        uVar23 = local_17d0;
        uStack_17c8 = local_1a70._8_8_;
        uVar24 = uStack_17c8;
        local_17d0._0_4_ = local_1a70._0_4_;
        local_17d0._4_4_ = local_1a70._4_4_;
        uStack_17c8._0_4_ = local_1a70._8_4_;
        uStack_17c8._4_4_ = local_1a70._12_4_;
        local_1b50 = local_1b50 * (float)local_17d0;
        fStack_1b4c = fStack_1b4c * local_17d0._4_4_;
        fStack_1b48 = fStack_1b48 * (float)uStack_17c8;
        fStack_1b44 = fStack_1b44 * uStack_17c8._4_4_;
        local_1aa0 = CONCAT44(fStack_1b4c,local_1b50);
        uStack_1a98 = CONCAT44(fStack_1b44,fStack_1b48);
        local_2140 = local_1aa0;
        uStack_2138 = uStack_1a98;
        local_1b50 = local_1b50 + 1.0;
        fStack_1b4c = fStack_1b4c + 1.0;
        fStack_1b48 = fStack_1b48 + 1.0;
        fStack_1b44 = fStack_1b44 + 1.0;
        auVar8._8_8_ = 0x3f8000003f800000;
        auVar8._0_8_ = 0x3f8000003f800000;
        auVar5._4_4_ = fStack_1b4c;
        auVar5._0_4_ = local_1b50;
        auVar5._8_4_ = fStack_1b48;
        auVar5._12_4_ = fStack_1b44;
        _local_2110 = vdivps_avx(auVar8,auVar5);
        local_9c0 = (float)local_2110._0_4_ * 2.0;
        fStack_9bc = (float)local_2110._4_4_ * 2.0;
        fStack_9b8 = fStack_2108 * 2.0;
        fStack_9b4 = fStack_2104 * 2.0;
        auVar50._4_4_ = fStack_9bc;
        auVar50._0_4_ = local_9c0;
        auVar50._8_4_ = fStack_9b8;
        auVar50._12_4_ = fStack_9b4;
        auVar3._8_8_ = 0x3f8000003f800000;
        auVar3._0_8_ = 0x3f8000003f800000;
        auVar4 = vsubps_avx(auVar50,auVar3);
        local_4460 = auVar4._0_8_;
        uStack_4458 = auVar4._8_8_;
        local_2960 = (undefined8 *)((long)pvVar1 + (long)local_3204 * 4);
        uVar9 = *local_2960;
        uVar10 = local_2960[1];
        local_1f10 = local_43a0;
        uVar21 = local_1f10;
        uStack_1f08 = uStack_4398;
        uVar22 = uStack_1f08;
        local_1f10._0_4_ = auVar7._0_4_;
        local_1f10._4_4_ = auVar7._4_4_;
        uStack_1f08._0_4_ = auVar7._8_4_;
        uStack_1f08._4_4_ = auVar7._12_4_;
        local_1f20._0_4_ = (float)uVar9;
        local_1f20._4_4_ = (float)((ulong)uVar9 >> 0x20);
        uStack_1f18._0_4_ = (float)uVar10;
        uStack_1f18._4_4_ = (float)((ulong)uVar10 >> 0x20);
        local_1f30 = local_4340;
        uVar19 = local_1f30;
        uStack_1f28 = uStack_4338;
        uVar20 = uStack_1f28;
        local_1f40 = local_4460;
        uVar17 = local_1f40;
        uStack_1f38 = uStack_4458;
        uVar18 = uStack_1f38;
        local_1f30._0_4_ = auVar6._0_4_;
        local_1f30._4_4_ = auVar6._4_4_;
        uStack_1f28._0_4_ = auVar6._8_4_;
        uStack_1f28._4_4_ = auVar6._12_4_;
        local_1f40._0_4_ = auVar4._0_4_;
        local_1f40._4_4_ = auVar4._4_4_;
        uStack_1f38._0_4_ = auVar4._8_4_;
        uStack_1f38._4_4_ = auVar4._12_4_;
        local_2540 = CONCAT44(local_1f30._4_4_ * local_1f40._4_4_,
                              (float)local_1f30 * (float)local_1f40);
        uStack_2538 = CONCAT44(uStack_1f28._4_4_ * uStack_1f38._4_4_,
                               (float)uStack_1f28 * (float)uStack_1f38);
        local_2530 = CONCAT44(local_1f10._4_4_ * local_1f20._4_4_,
                              (float)local_1f10 * (float)local_1f20);
        uStack_2528 = CONCAT44(uStack_1f08._4_4_ * uStack_1f18._4_4_,
                               (float)uStack_1f08 * (float)uStack_1f18);
        local_21e0 = (float)local_1f10 * (float)local_1f20 + (float)local_1f30 * (float)local_1f40;
        fStack_21dc = local_1f10._4_4_ * local_1f20._4_4_ + local_1f30._4_4_ * local_1f40._4_4_;
        fStack_21d8 = (float)uStack_1f08 * (float)uStack_1f18 +
                      (float)uStack_1f28 * (float)uStack_1f38;
        fStack_21d4 = uStack_1f08._4_4_ * uStack_1f18._4_4_ + uStack_1f28._4_4_ * uStack_1f38._4_4_;
        local_2460 = CONCAT44(fStack_21dc,local_21e0);
        uStack_2458 = CONCAT44(fStack_21d4,fStack_21d8);
        local_1bb4 = 0x3f800000;
        local_1bd0 = 0x3f800000;
        uStack_1bcc = 0x3f800000;
        uStack_1bc8 = 0x3f800000;
        uStack_1bc4 = 0x3f800000;
        local_2210 = 0x3f8000003f800000;
        uStack_2208 = 0x3f8000003f800000;
        local_1bd4 = 0x40000000;
        local_1bf0 = 0x40000000;
        uStack_1bec = 0x40000000;
        uStack_1be8 = 0x40000000;
        uStack_1be4 = 0x40000000;
        local_2220 = 0x4000000040000000;
        uStack_2218 = 0x4000000040000000;
        local_21e0 = local_21e0 * 2.0;
        fStack_21dc = fStack_21dc * 2.0;
        fStack_21d8 = fStack_21d8 * 2.0;
        fStack_21d4 = fStack_21d4 * 2.0;
        local_1bf4 = 0x3f800000;
        local_1c10 = 0x3f800000;
        uStack_1c0c = 0x3f800000;
        uStack_1c08 = 0x3f800000;
        uStack_1c04 = 0x3f800000;
        local_21f0 = 0x3f8000003f800000;
        uStack_21e8 = 0x3f8000003f800000;
        local_16f0 = ZEXT816(0) << 0x20;
        local_21d0._8_8_ = SUB168(ZEXT816(0),4);
        local_970 = CONCAT44(fStack_21dc,local_21e0);
        uStack_968 = CONCAT44(fStack_21d4,fStack_21d8);
        local_960 = 0;
        uStack_958 = local_21d0._8_8_;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = local_21d0._8_8_;
        auVar54._8_8_ = uStack_968;
        auVar54._0_8_ = local_970;
        auVar4 = vsubps_avx(auVar104 << 0x40,auVar54);
        local_1740 = 0x3f8000003f800000;
        uStack_1738 = 0x3f8000003f800000;
        local_1700._0_8_ = auVar4._0_8_;
        local_1700._8_8_ = auVar4._8_8_;
        local_880 = local_1700._0_8_;
        uStack_878 = local_1700._8_8_;
        local_890 = 0x42b0c0a542b0c0a5;
        uStack_888 = 0x42b0c0a542b0c0a5;
        auVar58._8_8_ = 0x42b0c0a542b0c0a5;
        auVar58._0_8_ = 0x42b0c0a542b0c0a5;
        auVar4 = vminps_avx(auVar4,auVar58);
        local_1700._0_8_ = auVar4._0_8_;
        local_1700._8_8_ = auVar4._8_8_;
        local_7e0 = local_1700._0_8_;
        uStack_7d8 = local_1700._8_8_;
        local_7f0 = 0xc2b0c0a5c2b0c0a5;
        uStack_7e8 = 0xc2b0c0a5c2b0c0a5;
        auVar63._8_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar63._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar6 = vmaxps_avx(auVar4,auVar63);
        local_1700._0_8_ = auVar6._0_8_;
        local_1700._8_8_ = auVar6._8_8_;
        local_1440 = local_1700._0_8_;
        uVar33 = local_1440;
        uStack_1438 = local_1700._8_8_;
        uVar34 = uStack_1438;
        local_1450 = 0x3fb8aa3b3fb8aa3b;
        uStack_1448 = 0x3fb8aa3b3fb8aa3b;
        local_1440._0_4_ = auVar6._0_4_;
        local_1440._4_4_ = auVar6._4_4_;
        uStack_1438._0_4_ = auVar6._8_4_;
        uStack_1438._4_4_ = auVar6._12_4_;
        local_1720._4_4_ = local_1440._4_4_ * 1.442695;
        local_1720._0_4_ = (float)local_1440 * 1.442695;
        uStack_1718._0_4_ = (float)uStack_1438 * 1.442695;
        uStack_1718._4_4_ = uStack_1438._4_4_ * 1.442695;
        local_1560 = local_1720;
        uStack_1558 = uStack_1718;
        local_1570 = 0x3f0000003f000000;
        uStack_1568 = 0x3f0000003f000000;
        local_1720._0_4_ = (float)local_1440 * 1.442695 + 0.5;
        local_1720._4_4_ = local_1440._4_4_ * 1.442695 + 0.5;
        fVar122 = (float)uStack_1438 * 1.442695 + 0.5;
        fVar123 = uStack_1438._4_4_ * 1.442695 + 0.5;
        uStack_1718._0_4_ = fVar122;
        uStack_1718._4_4_ = fVar123;
        local_740 = local_1720;
        uStack_738 = uStack_1718;
        local_1730._4_4_ = (int)(float)local_1720._4_4_;
        local_1730._0_4_ = (int)(float)local_1720._0_4_;
        local_1730._8_4_ = (int)fVar122;
        local_1730._12_4_ = (int)fVar123;
        local_6e0 = local_1730._0_8_;
        uStack_6d8 = local_1730._8_8_;
        auVar68._8_8_ = local_1730._8_8_;
        auVar68._0_8_ = local_1730._0_8_;
        auVar5 = vcvtdq2ps_avx(auVar68);
        local_1710 = auVar5._0_8_;
        uStack_1708 = auVar5._8_8_;
        local_650 = local_1710;
        uStack_648 = uStack_1708;
        local_660 = local_1720;
        uStack_658 = uStack_1718;
        auVar73._8_8_ = uStack_1718;
        auVar73._0_8_ = local_1720;
        auVar4 = vcmpps_avx(auVar73,auVar5,1);
        local_1750._0_8_ = auVar4._0_8_;
        local_1750._8_8_ = auVar4._8_8_;
        local_5b0 = local_1750._0_8_;
        uStack_5a8 = local_1750._8_8_;
        local_5c0 = 0x3f8000003f800000;
        uStack_5b8 = 0x3f8000003f800000;
        auVar78._8_8_ = 0x3f8000003f800000;
        auVar78._0_8_ = 0x3f8000003f800000;
        local_1750 = vpand_avx(auVar4,auVar78);
        local_a00 = local_1710;
        uStack_9f8 = uStack_1708;
        local_a10 = local_1750._0_8_;
        uStack_a08 = local_1750._8_8_;
        _local_1720 = vsubps_avx(auVar5,local_1750);
        local_2c8 = local_1720;
        local_2d0 = ::_ps_cephes_exp_C1;
        local_2d8 = local_1700;
        local_290 = local_1700._0_8_;
        uStack_288 = local_1700._8_8_;
        local_2c0[0] = 0.6933594;
        local_2c0[1] = 0.6933594;
        afStack_2b8[0] = 0.6933594;
        afStack_2b8[1] = 0.6933594;
        local_2b0._0_4_ = local_1720._0_4_;
        local_2b0._4_4_ = local_1720._4_4_;
        uStack_2a8._0_4_ = local_1720._8_4_;
        uStack_2a8._4_4_ = local_1720._12_4_;
        local_2a0 = (float)local_2b0 * 0.6933594;
        fStack_29c = local_2b0._4_4_ * 0.6933594;
        fStack_298 = (float)uStack_2a8 * 0.6933594;
        fStack_294 = uStack_2a8._4_4_ * 0.6933594;
        auVar87._4_4_ = fStack_29c;
        auVar87._0_4_ = local_2a0;
        auVar87._8_4_ = fStack_298;
        auVar87._12_4_ = fStack_294;
        auVar4 = vsubps_avx(auVar6,auVar87);
        local_328 = local_1720;
        local_330 = ::_ps_cephes_exp_C2;
        local_338 = local_1700;
        local_1700._0_8_ = auVar4._0_8_;
        local_2f0 = local_1700._0_8_;
        local_1700._8_8_ = auVar4._8_8_;
        uStack_2e8 = local_1700._8_8_;
        local_310 = local_1720;
        uStack_308 = uStack_1718;
        local_320[0] = -0.00021219444;
        local_320[1] = -0.00021219444;
        afStack_318[0] = -0.00021219444;
        afStack_318[1] = -0.00021219444;
        local_300 = (float)local_2b0 * -0.00021219444;
        fStack_2fc = local_2b0._4_4_ * -0.00021219444;
        fStack_2f8 = (float)uStack_2a8 * -0.00021219444;
        fStack_2f4 = uStack_2a8._4_4_ * -0.00021219444;
        auVar86._4_4_ = fStack_2fc;
        auVar86._0_4_ = local_300;
        auVar86._8_4_ = fStack_2f8;
        auVar86._12_4_ = fStack_2f4;
        local_1700 = vsubps_avx(auVar4,auVar86);
        local_4500 = local_1700._0_8_;
        uStack_44f8 = local_1700._8_8_;
        local_1460 = local_4500;
        uVar31 = local_1460;
        uStack_1458 = uStack_44f8;
        uVar32 = uStack_1458;
        local_1470 = local_4500;
        uStack_1468 = uStack_44f8;
        local_1460._0_4_ = local_1700._0_4_;
        local_1460._4_4_ = local_1700._4_4_;
        uStack_1458._0_4_ = local_1700._8_4_;
        uStack_1458._4_4_ = local_1700._12_4_;
        local_1710 = CONCAT44(local_1460._4_4_ * local_1460._4_4_,
                              (float)local_1460 * (float)local_1460);
        uStack_1708._0_4_ = (float)uStack_1458 * (float)uStack_1458;
        uStack_1708._4_4_ = uStack_1458._4_4_ * uStack_1458._4_4_;
        local_16d0 = &local_1760;
        local_16e0 = local_1700;
        local_1668 = ::_ps_cephes_exp_p1;
        local_1540 = 0x3950696739506967;
        uStack_1538 = 0x3950696739506967;
        local_1550 = local_4500;
        uStack_1548 = uStack_44f8;
        local_1640 = (float)local_1460 * 0.00019875691;
        fStack_163c = local_1460._4_4_ * 0.00019875691;
        fStack_1638 = (float)uStack_1458 * 0.00019875691;
        fStack_1634 = uStack_1458._4_4_ * 0.00019875691;
        local_1650[0] = 0.0013981999;
        local_1650[1] = 0.0013981999;
        afStack_1648[0] = 0.0013981999;
        afStack_1648[1] = 0.0013981999;
        local_1760 = CONCAT44(fStack_163c + 0.0013981999,local_1640 + 0.0013981999);
        uStack_1758 = CONCAT44(fStack_1634 + 0.0013981999,fStack_1638 + 0.0013981999);
        local_1680 = ::_ps_cephes_exp_p2;
        local_1520 = local_1760;
        uStack_1518 = uStack_1758;
        local_1530 = local_4500;
        uStack_1528 = uStack_44f8;
        local_1620 = (local_1640 + 0.0013981999) * (float)local_1460;
        fStack_161c = (fStack_163c + 0.0013981999) * local_1460._4_4_;
        fStack_1618 = (fStack_1638 + 0.0013981999) * (float)uStack_1458;
        fStack_1614 = (fStack_1634 + 0.0013981999) * uStack_1458._4_4_;
        local_1630[0] = 0.008333452;
        local_1630[1] = 0.008333452;
        afStack_1628[0] = 0.008333452;
        afStack_1628[1] = 0.008333452;
        local_1760 = CONCAT44(fStack_161c + 0.008333452,local_1620 + 0.008333452);
        uStack_1758 = CONCAT44(fStack_1614 + 0.008333452,fStack_1618 + 0.008333452);
        local_1698 = ::_ps_cephes_exp_p3;
        local_1500 = local_1760;
        uStack_14f8 = uStack_1758;
        local_1510 = local_4500;
        uStack_1508 = uStack_44f8;
        local_1600 = (local_1620 + 0.008333452) * (float)local_1460;
        fStack_15fc = (fStack_161c + 0.008333452) * local_1460._4_4_;
        fStack_15f8 = (fStack_1618 + 0.008333452) * (float)uStack_1458;
        fStack_15f4 = (fStack_1614 + 0.008333452) * uStack_1458._4_4_;
        local_1610[0] = 0.041665796;
        local_1610[1] = 0.041665796;
        afStack_1608[0] = 0.041665796;
        afStack_1608[1] = 0.041665796;
        local_1760 = CONCAT44(fStack_15fc + 0.041665796,local_1600 + 0.041665796);
        uStack_1758 = CONCAT44(fStack_15f4 + 0.041665796,fStack_15f8 + 0.041665796);
        local_16b0 = ::_ps_cephes_exp_p4;
        local_14e0 = local_1760;
        uStack_14d8 = uStack_1758;
        local_14f0 = local_4500;
        uStack_14e8 = uStack_44f8;
        local_15e0 = (local_1600 + 0.041665796) * (float)local_1460;
        fStack_15dc = (fStack_15fc + 0.041665796) * local_1460._4_4_;
        fStack_15d8 = (fStack_15f8 + 0.041665796) * (float)uStack_1458;
        fStack_15d4 = (fStack_15f4 + 0.041665796) * uStack_1458._4_4_;
        local_15f0[0] = 0.16666666;
        local_15f0[1] = 0.16666666;
        afStack_15e8[0] = 0.16666666;
        afStack_15e8[1] = 0.16666666;
        local_1760 = CONCAT44(fStack_15dc + 0.16666666,local_15e0 + 0.16666666);
        uStack_1758 = CONCAT44(fStack_15d4 + 0.16666666,fStack_15d8 + 0.16666666);
        local_16c8 = ::_ps_cephes_exp_p5;
        local_14c0 = local_1760;
        uStack_14b8 = uStack_1758;
        local_14d0 = local_4500;
        uStack_14c8 = uStack_44f8;
        local_15c0 = (local_15e0 + 0.16666666) * (float)local_1460;
        fStack_15bc = (fStack_15dc + 0.16666666) * local_1460._4_4_;
        fStack_15b8 = (fStack_15d8 + 0.16666666) * (float)uStack_1458;
        fStack_15b4 = (fStack_15d4 + 0.16666666) * uStack_1458._4_4_;
        local_15d0[0] = 0.5;
        local_15d0[1] = 0.5;
        afStack_15c8[0] = 0.5;
        afStack_15c8[1] = 0.5;
        local_1760 = CONCAT44(fStack_15bc + 0.5,local_15c0 + 0.5);
        uStack_1758 = CONCAT44(fStack_15b4 + 0.5,fStack_15b8 + 0.5);
        local_16d8 = &local_1710;
        local_14a0 = local_1760;
        uStack_1498 = uStack_1758;
        local_14b0 = local_1710;
        uStack_14a8 = uStack_1708;
        local_15a0 = (local_15c0 + 0.5) * (float)local_1460 * (float)local_1460;
        fStack_159c = (fStack_15bc + 0.5) * local_1460._4_4_ * local_1460._4_4_;
        fStack_1598 = (fStack_15b8 + 0.5) * (float)uStack_1458 * (float)uStack_1458;
        fStack_1594 = (fStack_15b4 + 0.5) * uStack_1458._4_4_ * uStack_1458._4_4_;
        local_15b0 = local_4500;
        uStack_15a8 = uStack_44f8;
        local_1760 = CONCAT44(fStack_159c + local_1460._4_4_,local_15a0 + (float)local_1460);
        uStack_1758 = CONCAT44(fStack_1594 + uStack_1458._4_4_,fStack_1598 + (float)uStack_1458);
        local_1580 = local_1760;
        uStack_1578 = uStack_1758;
        local_1590 = 0x3f8000003f800000;
        uStack_1588 = 0x3f8000003f800000;
        local_1b30 = local_15a0 + (float)local_1460 + 1.0;
        fStack_1b2c = fStack_159c + local_1460._4_4_ + 1.0;
        fStack_1b28 = fStack_1598 + (float)uStack_1458 + 1.0;
        fStack_1b24 = fStack_1594 + uStack_1458._4_4_ + 1.0;
        local_1760 = CONCAT44(fStack_1b2c,local_1b30);
        uStack_1758 = CONCAT44(fStack_1b24,fStack_1b28);
        local_750 = local_1720;
        uStack_748 = uStack_1718;
        local_1730._4_4_ = (int)local_2b0._4_4_;
        local_1730._0_4_ = (int)(float)local_2b0;
        local_1730._8_4_ = (int)(float)uStack_2a8;
        local_1730._12_4_ = (int)uStack_2a8._4_4_;
        local_150 = local_1730._0_8_;
        uStack_148 = local_1730._8_8_;
        local_160 = 0x7f0000007f;
        uStack_158 = 0x7f0000007f;
        auVar97._8_8_ = local_1730._8_8_;
        auVar97._0_8_ = local_1730._0_8_;
        auVar96._8_8_ = 0x7f0000007f;
        auVar96._0_8_ = 0x7f0000007f;
        auVar4 = vpaddd_avx(auVar97,auVar96);
        local_1730._0_8_ = auVar4._0_8_;
        local_1730._8_8_ = auVar4._8_8_;
        local_b0 = local_1730._0_8_;
        uStack_a8 = local_1730._8_8_;
        local_b4 = 0x17;
        local_1730 = vpslld_avx(auVar4,ZEXT416(0x17));
        local_50 = local_1730._0_8_;
        uStack_48 = local_1730._8_8_;
        local_1770 = local_1730._0_8_;
        uStack_1768 = local_1730._8_8_;
        local_1480 = local_1760;
        uStack_1478 = uStack_1758;
        local_1490 = local_1730._0_8_;
        uVar29 = local_1490;
        uStack_1488 = local_1730._8_8_;
        uVar30 = uStack_1488;
        local_1490._0_4_ = local_1730._0_4_;
        local_1490._4_4_ = local_1730._4_4_;
        uStack_1488._0_4_ = local_1730._8_4_;
        uStack_1488._4_4_ = local_1730._12_4_;
        local_1b30 = local_1b30 * (float)local_1490;
        fStack_1b2c = fStack_1b2c * local_1490._4_4_;
        fStack_1b28 = fStack_1b28 * (float)uStack_1488;
        fStack_1b24 = fStack_1b24 * uStack_1488._4_4_;
        local_1760 = CONCAT44(fStack_1b2c,local_1b30);
        uStack_1758 = CONCAT44(fStack_1b24,fStack_1b28);
        local_21c0 = local_1760;
        uStack_21b8 = uStack_1758;
        local_1b30 = local_1b30 + 1.0;
        fStack_1b2c = fStack_1b2c + 1.0;
        fStack_1b28 = fStack_1b28 + 1.0;
        fStack_1b24 = fStack_1b24 + 1.0;
        auVar7._8_8_ = 0x3f8000003f800000;
        auVar7._0_8_ = 0x3f8000003f800000;
        auVar6._4_4_ = fStack_1b2c;
        auVar6._0_4_ = local_1b30;
        auVar6._8_4_ = fStack_1b28;
        auVar6._12_4_ = fStack_1b24;
        _local_20d0 = vdivps_avx(auVar7,auVar6);
        local_980 = (float)local_20d0._0_4_ * 2.0;
        fStack_97c = (float)local_20d0._4_4_ * 2.0;
        fStack_978 = fStack_20c8 * 2.0;
        fStack_974 = fStack_20c4 * 2.0;
        auVar53._4_4_ = fStack_97c;
        auVar53._0_4_ = local_980;
        auVar53._8_4_ = fStack_978;
        auVar53._12_4_ = fStack_974;
        auVar52._8_8_ = 0x3f8000003f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar4 = vsubps_avx(auVar53,auVar52);
        local_4520 = auVar4._0_8_;
        uStack_4518 = auVar4._8_8_;
        local_1f60 = local_4520;
        uVar15 = local_1f60;
        uStack_1f58 = uStack_4518;
        uVar16 = uStack_1f58;
        local_1f60._0_4_ = auVar4._0_4_;
        local_1f60._4_4_ = auVar4._4_4_;
        uStack_1f58._0_4_ = auVar4._8_4_;
        uStack_1f58._4_4_ = auVar4._12_4_;
        uVar11 = CONCAT44((float)local_1f50._4_4_ * local_1f60._4_4_,
                          (float)local_1f50._0_4_ * (float)local_1f60);
        uVar12 = CONCAT44(fStack_1f44 * uStack_1f58._4_4_,fStack_1f48 * (float)uStack_1f58);
        local_2448 = (undefined8 *)((long)pvVar1 + (long)local_3204 * 4);
        *local_2448 = local_2460;
        local_2448[1] = uStack_2458;
        if (local_32f4 == local_32f8) {
          local_2468 = (undefined8 *)((long)pvVar2 + (long)local_3204 * 4);
          *local_2468 = uVar11;
          local_2468[1] = uVar12;
          local_2488 = (undefined1 (*) [16])(lVar118 + (long)local_3204 * 4);
          auVar43._8_8_ = uVar12;
          auVar43._0_8_ = uVar11;
          *local_2488 = auVar43;
          local_24a0 = uVar11;
          uStack_2498 = uVar12;
          local_2480 = uVar11;
          uStack_2478 = uVar12;
        }
        else {
          local_24a8 = (undefined1 (*) [16])((long)local_3398 + (long)local_3204 * 4);
          auVar42._8_8_ = uVar12;
          auVar42._0_8_ = uVar11;
          *local_24a8 = auVar42;
          local_24c0 = uVar11;
          uStack_24b8 = uVar12;
        }
        local_23d0 = local_2410;
        uStack_23c8 = uStack_2408;
        local_23c0 = local_2400;
        uStack_23b8 = uStack_23f8;
        local_23b0 = local_23f0;
        uStack_23a8 = uStack_23e8;
        local_23a0 = local_23e0;
        uStack_2398 = uStack_23d8;
        local_22f0 = local_d30;
        local_22d0 = local_2310;
        uStack_22c8 = uStack_2308;
        local_22a0 = local_1070;
        local_2280 = local_22c0;
        uStack_2278 = uStack_22b8;
        local_2250 = local_13b0;
        local_2230 = local_2270;
        uStack_2228 = uStack_2268;
        local_2200 = local_2460;
        uStack_21f8 = uStack_2458;
        local_21d0 = local_16f0;
        local_21b0 = local_21f0;
        uStack_21a8 = uStack_21e8;
        local_2150 = local_1a30;
        local_2130 = local_2170;
        uStack_2128 = uStack_2168;
        local_2120 = local_21a0;
        uStack_2118 = uStack_2198;
        local_2100 = local_21a0;
        uStack_20f8 = uStack_2198;
        local_20f0 = uVar13;
        uStack_20e8 = uVar14;
        local_20e0 = local_2220;
        uStack_20d8 = uStack_2218;
        local_20c0 = local_2220;
        uStack_20b8 = uStack_2218;
        local_20b0 = local_2460;
        uStack_20a8 = uStack_2458;
        local_1f60 = uVar15;
        uStack_1f58 = uVar16;
        local_1f40 = uVar17;
        uStack_1f38 = uVar18;
        local_1f30 = uVar19;
        uStack_1f28 = uVar20;
        local_1f20 = uVar9;
        uStack_1f18 = uVar10;
        local_1f10 = uVar21;
        uStack_1f08 = uVar22;
        local_1b40 = local_2170;
        uStack_1b38 = uStack_2168;
        local_1b20 = local_21f0;
        uStack_1b18 = uStack_21e8;
        local_1b00 = local_2270;
        uStack_1af8 = uStack_2268;
        local_1ae0 = local_22c0;
        uStack_1ad8 = uStack_22b8;
        local_1ac0 = local_2310;
        uStack_1ab8 = uStack_2308;
        local_1a00 = local_1a20;
        local_19f8 = local_1a10;
        local_19e8 = local_1a20;
        local_19e0 = local_1a10;
        local_19d0 = local_1a20;
        local_19c8 = local_1a10;
        local_19b8 = local_1a20;
        local_19b0 = local_1a10;
        local_19a0 = local_1a20;
        local_1998 = local_1a10;
        local_17d0 = uVar23;
        uStack_17c8 = uVar24;
        local_17a0 = uVar25;
        uStack_1798 = uVar26;
        local_1780 = uVar27;
        uStack_1778 = uVar28;
        local_16c0 = local_16e0;
        local_16b8 = local_16d0;
        local_16a8 = local_16e0;
        local_16a0 = local_16d0;
        local_1690 = local_16e0;
        local_1688 = local_16d0;
        local_1678 = local_16e0;
        local_1670 = local_16d0;
        local_1660 = local_16e0;
        local_1658 = local_16d0;
        local_1490 = uVar29;
        uStack_1488 = uVar30;
        local_1460 = uVar31;
        uStack_1458 = uVar32;
        local_1440 = uVar33;
        uStack_1438 = uVar34;
        local_1380 = local_13a0;
        local_1378 = local_1390;
        local_1368 = local_13a0;
        local_1360 = local_1390;
        local_1350 = local_13a0;
        local_1348 = local_1390;
        local_1338 = local_13a0;
        local_1330 = local_1390;
        local_1320 = local_13a0;
        local_1318 = local_1390;
        local_1150 = uVar35;
        uStack_1148 = uVar36;
        local_1120 = uVar37;
        uStack_1118 = uVar38;
        local_1100 = uVar39;
        uStack_10f8 = uVar40;
        local_1040 = local_1060;
        local_1038 = local_1050;
        local_1028 = local_1060;
        local_1020 = local_1050;
        local_1010 = local_1060;
        local_1008 = local_1050;
        local_ff8 = local_1060;
        local_ff0 = local_1050;
        local_fe0 = local_1060;
        local_fd8 = local_1050;
        local_e10 = uVar106;
        uStack_e08 = uVar107;
        local_de0 = uVar108;
        uStack_dd8 = uVar109;
        local_dc0 = uVar110;
        uStack_db8 = uVar111;
        local_d00 = local_d20;
        local_cf8 = local_d10;
        local_ce8 = local_d20;
        local_ce0 = local_d10;
        local_cd0 = local_d20;
        local_cc8 = local_d10;
        local_cb8 = local_d20;
        local_cb0 = local_d10;
        local_ca0 = local_d20;
        local_c98 = local_d10;
        local_ad0 = uVar112;
        uStack_ac8 = uVar113;
        local_aa0 = uVar114;
        uStack_a98 = uVar115;
        local_a80 = uVar116;
        uStack_a78 = uVar117;
        local_9d0 = local_2190;
        uStack_9c8 = uStack_2188;
        local_990 = local_2210;
        uStack_988 = uStack_2208;
        local_4f0 = local_d60;
        uStack_4e8 = uStack_d58;
        local_430 = local_10a0;
        uStack_428 = uStack_1098;
        local_370 = local_13e0;
        uStack_368 = uStack_13d8;
        local_2b0 = local_1720;
        uStack_2a8 = uStack_1718;
        local_1f0 = local_1a60;
        uStack_1e8 = uStack_1a58;
      }
      for (; local_3a14 < local_32f8; local_3a14 = local_3a14 + 1) {
        local_3210 = &local_3340;
        local_3214 = local_3a14;
        pfVar119 = (float *)((long)local_3340 + (long)local_3314 * (long)local_3a14 * local_3330);
        fVar122 = pfVar119[1];
        fVar123 = pfVar119[2];
        fVar121 = pfVar119[3];
        fVar120 = expf(-*pfVar119);
        fVar122 = expf(-fVar122);
        fVar123 = expf(-fVar123);
        fVar123 = 1.0 / (fVar123 + 1.0);
        fVar121 = tanhf(fVar121);
        fVar122 = (1.0 / (fVar122 + 1.0)) * *(float *)((long)pvVar1 + (long)local_3a14 * 4) +
                  (1.0 / (fVar120 + 1.0)) * fVar121;
        fVar121 = tanhf(fVar122);
        fVar123 = fVar123 * fVar121;
        *(float *)((long)pvVar1 + (long)local_3a14 * 4) = fVar122;
        if (local_32f4 == local_32f8) {
          *(float *)((long)pvVar2 + (long)local_3a14 * 4) = fVar123;
          *(float *)(lVar118 + (long)local_3a14 * 4) = fVar123;
        }
        else {
          *(float *)((long)pvVar105 + (long)local_3a14 * 4) = fVar123;
        }
      }
      if (local_32f4 != local_32f8) {
        for (local_3a40 = 0; local_3a40 < local_32f4; local_3a40 = local_3a40 + 1) {
          local_3284 = local_3a40;
          local_2cf8 = &local_3398;
          local_3a54 = 0.0;
          for (local_3a58 = 0; local_3a58 < local_32f8; local_3a58 = local_3a58 + 1) {
            local_3a54 = *(float *)((long)local_3398 + (long)local_3a58 * 4) *
                         *(float *)(*in_stack_00000008 +
                                    (long)*(int *)((long)in_stack_00000008 + 0x2c) *
                                    (long)local_3a40 * in_stack_00000008[2] + (long)local_3a58 * 4)
                         + local_3a54;
          }
          *(float *)(lVar118 + (long)local_3a40 * 4) = local_3a54;
          *(float *)((long)pvVar2 + (long)local_3a40 * 4) = local_3a54;
        }
      }
    }
    local_32b4 = 0;
  }
  else {
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffbacc,in_stack_ffffffffffffbac8),
                (int)((ulong)in_stack_ffffffffffffbac0 >> 0x20),in_stack_ffffffffffffbab8,
                in_stack_ffffffffffffbab0);
    local_3188 = &local_3398;
    if (local_3398 != (void *)0x0) {
      local_3130 = local_3188;
    }
    if (local_3398 != (void *)0x0 && local_3358 * local_3360 != 0) goto LAB_00fd0192;
    local_32b4 = -100;
  }
  local_3350 = 1;
  ppvVar124 = &local_3398;
  local_32a8 = ppvVar124;
  local_3190 = ppvVar124;
  if (local_3390 != (int *)0x0) {
    local_3194 = 0xffffffff;
    LOCK();
    local_3198 = *local_3390;
    *local_3390 = *local_3390 + -1;
    UNLOCK();
    if (local_3198 == 1) {
      if (local_3378 == (long *)0x0) {
        local_3158 = local_3398;
        if (local_3398 != (void *)0x0) {
          free(local_3398);
        }
      }
      else {
        (**(code **)(*local_3378 + 0x18))(local_3378,local_3398);
      }
    }
  }
  *ppvVar124 = (void *)0x0;
  ppvVar124[2] = (void *)0x0;
  *(undefined4 *)(ppvVar124 + 3) = 0;
  *(undefined4 *)(ppvVar124 + 5) = 0;
  *(undefined4 *)((long)ppvVar124 + 0x2c) = 0;
  *(undefined4 *)(ppvVar124 + 6) = 0;
  *(undefined4 *)((long)ppvVar124 + 0x34) = 0;
  *(undefined4 *)(ppvVar124 + 7) = 0;
  ppvVar124[8] = (void *)0x0;
  ppvVar124[1] = (void *)0x0;
LAB_00fd692a:
  ppvVar124 = &local_3340;
  if (local_3338 != (int *)0x0) {
    local_31b4 = 0xffffffff;
    LOCK();
    local_31b8 = *local_3338;
    *local_3338 = *local_3338 + -1;
    UNLOCK();
    if (local_31b8 == 1) {
      local_3298 = ppvVar124;
      local_31b0 = ppvVar124;
      if (local_3320 == (long *)0x0) {
        local_3148 = local_3340;
        if (local_3340 != (void *)0x0) {
          free(local_3340);
        }
      }
      else {
        (**(code **)(*local_3320 + 0x18))(local_3320,local_3340);
      }
    }
  }
  *ppvVar124 = (void *)0x0;
  ppvVar124[2] = (void *)0x0;
  *(undefined4 *)(ppvVar124 + 3) = 0;
  *(undefined4 *)(ppvVar124 + 5) = 0;
  *(undefined4 *)((long)ppvVar124 + 0x2c) = 0;
  *(undefined4 *)(ppvVar124 + 6) = 0;
  *(undefined4 *)((long)ppvVar124 + 0x34) = 0;
  *(undefined4 *)(ppvVar124 + 7) = 0;
  ppvVar124[8] = (void *)0x0;
  ppvVar124[1] = (void *)0x0;
  return local_32b4;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Mat& weight_hr, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;
    int hidden_size = cell_state.w;

    // 4 x hidden_size
    Mat gates(4, hidden_size, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    Mat tmp_hidden_state;
    if (num_output != hidden_size)
    {
        tmp_hidden_state.create(hidden_size, 4u, opt.workspace_allocator);
        if (tmp_hidden_state.empty())
            return -100;
    }

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

#if __AVX__
        int nn_hidden_size = hidden_size >> 1;
        int remain_hidden_size_start = nn_hidden_size << 1;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 2;

            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
            const float* weight_xc_IFOG = weight_xc.row(q / 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2);

            __m256 _IFOG = _mm256_loadu_ps(bias_c_IFOG);
            __m256 _sum1 = _mm256_setzero_ps();
            __m256 _sum2 = _mm256_setzero_ps();
            __m256 _sum3 = _mm256_setzero_ps();

            const float* x = bottom_blob.row(ti);

            int i = 0;
            for (; i + 3 < size; i += 4)
            {
                __m256 _xi0 = _mm256_broadcast_ss(x);
                __m256 _xi1 = _mm256_broadcast_ss(x + 1);
                __m256 _xi2 = _mm256_broadcast_ss(x + 2);
                __m256 _xi3 = _mm256_broadcast_ss(x + 3);
                __m256 _weight_xc_IFOG0 = _mm256_loadu_ps(weight_xc_IFOG);
                __m256 _weight_xc_IFOG1 = _mm256_loadu_ps(weight_xc_IFOG + 8);
                __m256 _weight_xc_IFOG2 = _mm256_loadu_ps(weight_xc_IFOG + 16);
                __m256 _weight_xc_IFOG3 = _mm256_loadu_ps(weight_xc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 32;
            }
            for (; i < size; i++)
            {
                __m256 _xi = _mm256_broadcast_ss(x);
                __m256 _weight_xc_IFOG = _mm256_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);

                x += 1;
                weight_xc_IFOG += 8;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
            for (; i + 3 < num_output; i += 4)
            {
                __m256 _h_cont0 = _mm256_broadcast_ss(hidden_ptr);
                __m256 _h_cont1 = _mm256_broadcast_ss(hidden_ptr + 1);
                __m256 _h_cont2 = _mm256_broadcast_ss(hidden_ptr + 2);
                __m256 _h_cont3 = _mm256_broadcast_ss(hidden_ptr + 3);
                __m256 _weight_hc_IFOG0 = _mm256_loadu_ps(weight_hc_IFOG);
                __m256 _weight_hc_IFOG1 = _mm256_loadu_ps(weight_hc_IFOG + 8);
                __m256 _weight_hc_IFOG2 = _mm256_loadu_ps(weight_hc_IFOG + 16);
                __m256 _weight_hc_IFOG3 = _mm256_loadu_ps(weight_hc_IFOG + 24);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm256_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm256_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 32;
            }
            for (; i < num_output; i++)
            {
                __m256 _h_cont = _mm256_broadcast_ss(hidden_ptr);
                __m256 _weight_hc_IFOG = _mm256_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm256_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);

                hidden_ptr += 1;
                weight_hc_IFOG += 8;
            }

            float* gates_data = gates.row(q);

            _IFOG = _mm256_add_ps(_IFOG, _sum1);
            _sum2 = _mm256_add_ps(_sum2, _sum3);
            _IFOG = _mm256_add_ps(_IFOG, _sum2);

            _mm256_storeu_ps(gates_data, _IFOG);
        }
#else
        int nn_hidden_size = 0;
        int remain_hidden_size_start = 0;
#endif // __AVX__

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* bias_c_IFOG = (const float*)bias_c + q * 4;

            // gate I F O G
#if __AVX__
            const float* weight_xc_IFOG = weight_xc.row(q / 2 + q % 2);
            const float* weight_hc_IFOG = weight_hc.row(q / 2 + q % 2);
#else
            const float* weight_xc_IFOG = weight_xc.row(q);
            const float* weight_hc_IFOG = weight_hc.row(q);
#endif

#if __SSE2__
            __m128 _IFOG = _mm_loadu_ps(bias_c_IFOG);
            __m128 _sum1 = _mm_setzero_ps();
            __m128 _sum2 = _mm_setzero_ps();
            __m128 _sum3 = _mm_setzero_ps();
#else  // __SSE2__
            float I = bias_c_IFOG[0];
            float F = bias_c_IFOG[1];
            float O = bias_c_IFOG[2];
            float G = bias_c_IFOG[3];
#endif // __SSE2__

            const float* x = bottom_blob.row(ti);

            int i = 0;
#if __SSE2__
            for (; i + 3 < size; i += 4)
            {
                __m128 _xi0 = _mm_load1_ps(x);
                __m128 _xi1 = _mm_load1_ps(x + 1);
                __m128 _xi2 = _mm_load1_ps(x + 2);
                __m128 _xi3 = _mm_load1_ps(x + 3);
                __m128 _weight_xc_IFOG0 = _mm_loadu_ps(weight_xc_IFOG);
                __m128 _weight_xc_IFOG1 = _mm_loadu_ps(weight_xc_IFOG + 4);
                __m128 _weight_xc_IFOG2 = _mm_loadu_ps(weight_xc_IFOG + 8);
                __m128 _weight_xc_IFOG3 = _mm_loadu_ps(weight_xc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG0, _xi0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_xc_IFOG1, _xi1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_xc_IFOG2, _xi2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_xc_IFOG3, _xi3, _sum3);

                x += 4;
                weight_xc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
#if __SSE2__
                __m128 _xi = _mm_load1_ps(x);
                __m128 _weight_xc_IFOG = _mm_loadu_ps(weight_xc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_xc_IFOG, _xi, _IFOG);
#else  // __SSE2__
                float xi = x[0];
                I += xi * weight_xc_IFOG[0];
                F += xi * weight_xc_IFOG[1];
                O += xi * weight_xc_IFOG[2];
                G += xi * weight_xc_IFOG[3];
#endif // __SSE2__

                x += 1;
                weight_xc_IFOG += 4;
            }

            const float* hidden_ptr = hidden_state;

            i = 0;
#if __SSE2__
            for (; i + 3 < num_output; i += 4)
            {
                __m128 _h_cont0 = _mm_load1_ps(hidden_ptr);
                __m128 _h_cont1 = _mm_load1_ps(hidden_ptr + 1);
                __m128 _h_cont2 = _mm_load1_ps(hidden_ptr + 2);
                __m128 _h_cont3 = _mm_load1_ps(hidden_ptr + 3);
                __m128 _weight_hc_IFOG0 = _mm_loadu_ps(weight_hc_IFOG);
                __m128 _weight_hc_IFOG1 = _mm_loadu_ps(weight_hc_IFOG + 4);
                __m128 _weight_hc_IFOG2 = _mm_loadu_ps(weight_hc_IFOG + 8);
                __m128 _weight_hc_IFOG3 = _mm_loadu_ps(weight_hc_IFOG + 12);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG0, _h_cont0, _IFOG);
                _sum1 = _mm_comp_fmadd_ps(_weight_hc_IFOG1, _h_cont1, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_weight_hc_IFOG2, _h_cont2, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_weight_hc_IFOG3, _h_cont3, _sum3);

                hidden_ptr += 4;
                weight_hc_IFOG += 16;
            }
#endif // __SSE2__
            for (; i < num_output; i++)
            {
#if __SSE2__
                __m128 _h_cont = _mm_load1_ps(hidden_ptr);
                __m128 _weight_hc_IFOG = _mm_loadu_ps(weight_hc_IFOG);
                _IFOG = _mm_comp_fmadd_ps(_weight_hc_IFOG, _h_cont, _IFOG);
#else  // __SSE2__
                float h_cont = hidden_ptr[0];
                I += h_cont * weight_hc_IFOG[0];
                F += h_cont * weight_hc_IFOG[1];
                O += h_cont * weight_hc_IFOG[2];
                G += h_cont * weight_hc_IFOG[3];
#endif // __SSE2__

                hidden_ptr += 1;
                weight_hc_IFOG += 4;
            }

            float* gates_data = gates.row(q);

#if __SSE2__
            _IFOG = _mm_add_ps(_IFOG, _sum1);
            _sum2 = _mm_add_ps(_sum2, _sum3);
            _IFOG = _mm_add_ps(_IFOG, _sum2);

            _mm_storeu_ps(gates_data, _IFOG);
#else  // __SSE2__
            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
#endif // __SSE2__
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);

        float* cell_ptr = cell_state;
        float* hidden_ptr = hidden_state;
        float* tmp_hidden_ptr = tmp_hidden_state;

#if __SSE2__
        nn_hidden_size = hidden_size >> 2;
        remain_hidden_size_start = nn_hidden_size << 2;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int qq = 0; qq < nn_hidden_size; qq++)
        {
            int q = qq * 4;

            const float* gates_data = gates.row(q);

            __m128 _IFOG_4x4_0 = _mm_loadu_ps(gates_data);
            __m128 _IFOG_4x4_1 = _mm_loadu_ps(gates_data + 4);
            __m128 _IFOG_4x4_2 = _mm_loadu_ps(gates_data + 8);
            __m128 _IFOG_4x4_3 = _mm_loadu_ps(gates_data + 12);

            _MM_TRANSPOSE4_PS(_IFOG_4x4_0, _IFOG_4x4_1, _IFOG_4x4_2, _IFOG_4x4_3);

            __m128 _I = sigmoid_sse(_IFOG_4x4_0);
            __m128 _F = sigmoid_sse(_IFOG_4x4_1);
            __m128 _O = sigmoid_sse(_IFOG_4x4_2);
            __m128 _G = tanh_sse(_IFOG_4x4_3);

            __m128 _cell2 = _mm_add_ps(_mm_mul_ps(_F, _mm_loadu_ps(cell_ptr + q)), _mm_mul_ps(_I, _G));
            __m128 _H = _mm_mul_ps(_O, tanh_sse(_cell2));

            _mm_storeu_ps(cell_ptr + q, _cell2);

            if (num_output == hidden_size)
            {
                _mm_storeu_ps(hidden_ptr + q, _H);
                _mm_storeu_ps(output_data + q, _H);
            }
            else
            {
                _mm_storeu_ps(tmp_hidden_ptr + q, _H);
            }
        }
#else  // __SSE2__
        remain_hidden_size_start = 0;
#endif // __SSE2__
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = remain_hidden_size_start; q < hidden_size; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + expf(-I));
            F = 1.f / (1.f + expf(-F));
            O = 1.f / (1.f + expf(-O));
            G = tanhf(G);

            float cell2 = F * cell_ptr[q] + I * G;
            float H = O * tanhf(cell2);

            cell_ptr[q] = cell2;
            if (num_output == hidden_size)
            {
                hidden_ptr[q] = H;
                output_data[q] = H;
            }
            else
            {
                tmp_hidden_ptr[q] = H;
            }
        }

        if (num_output != hidden_size)
        {
            // int nn_num_output = num_output >> 2;
            // int remain_num_output_start = nn_num_output << 2;
            // #pragma omp parallel for num_threads(opt.num_threads)
            // for (int qq = 0; qq < nn_num_output; qq++)
            // {
            //     int q = qq * 4;
            //
            // }
            int remain_num_output_start = 0;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = remain_num_output_start; q < num_output; q++)
            {
                const float* hr = weight_hr.row(q);
                const float* tmp_hidden_ptr = tmp_hidden_state;

                float H = 0;
                for (int i = 0; i < hidden_size; i++)
                {
                    H += tmp_hidden_ptr[i] * hr[i];
                }

                output_data[q] = H;
                hidden_ptr[q] = H;
            }
        }
    }

    return 0;
}